

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O1

SampledSpectrum __thiscall
pbrt::VolPathIntegrator::Li
          (VolPathIntegrator *this,RayDifferential *ray,SampledWavelengths *lambda,
          SamplerHandle *sampler,ScratchBuffer *scratchBuffer,VisibleSurface *visibleSurf)

{
  Tuple3<pbrt::Vector3,_float> *pTVar1;
  int *piVar2;
  int *piVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  TVar8;
  pointer pLVar9;
  uintptr_t uVar10;
  size_t sVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  short sVar108;
  LightSampleContext LVar109;
  LightSampleContext LVar110;
  LightSampleContext LVar111;
  LightSampleContext LVar112;
  Point3f p;
  undefined1 auVar113 [16];
  undefined1 auVar114 [24];
  undefined1 auVar115 [44];
  undefined1 auVar116 [48];
  undefined1 auVar117 [64];
  undefined1 auVar118 [40];
  undefined1 auVar119 [60];
  undefined1 auVar120 [64];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  Vector3f wiRender;
  Vector3f wi;
  undefined1 auVar125 [16];
  undefined4 uVar126;
  undefined4 uVar127;
  undefined4 uVar128;
  undefined4 uVar129;
  undefined4 uVar130;
  undefined4 uVar131;
  undefined1 auVar132 [16];
  undefined1 auVar133 [32];
  undefined1 auVar134 [64];
  undefined1 auVar135 [64];
  SamplerHandle *pSVar136;
  VolPathIntegrator *this_00;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  *pTVar137;
  undefined8 *puVar138;
  int i;
  int iVar139;
  BxDFFlags BVar140;
  undefined4 extraout_var;
  ulong uVar141;
  ulong uVar142;
  NormalizedFresnelBxDF *bxdf;
  byte bVar143;
  ulong uVar144;
  uint uVar145;
  int *piVar146;
  undefined1 auVar147 [8];
  DenselySampledSpectrum *this_01;
  TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
  TVar148;
  Interval IVar149;
  DebugMLTSampler *pDVar150;
  long lVar151;
  int iVar152;
  float *pfVar153;
  int *piVar154;
  ImageInfiniteLight *this_02;
  ExhaustiveLightSampler *pEVar155;
  DiffuseBxDF *this_03;
  LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *this_04;
  int *piVar156;
  uint uVar157;
  float *pfVar158;
  Ray *pRVar159;
  float *pfVar160;
  Ray *pRVar161;
  uint64_t oldstate;
  pointer pLVar162;
  uintptr_t iptr;
  long in_FS_OFFSET;
  bool bVar163;
  char cVar164;
  undefined1 auVar165 [16];
  undefined1 auVar167 [16];
  undefined1 auVar171 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 in_ZmmResult [64];
  undefined1 auVar175 [64];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar177 [64];
  undefined1 auVar178 [64];
  undefined1 auVar179 [64];
  undefined1 auVar181 [64];
  undefined1 auVar182 [64];
  undefined1 auVar184 [64];
  undefined1 auVar185 [64];
  undefined1 auVar172 [16];
  undefined1 auVar187 [64];
  undefined1 auVar189 [64];
  undefined1 auVar190 [64];
  Float FVar191;
  float fVar193;
  Tuple2<pbrt::Point2,_float> TVar195;
  undefined4 uVar194;
  float fVar252;
  SampledSpectrum ret;
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  float fVar192;
  float fVar251;
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 extraout_var_00 [12];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [32];
  undefined1 auVar233 [64];
  undefined8 uVar253;
  undefined1 auVar255 [56];
  undefined1 auVar234 [64];
  undefined1 auVar235 [64];
  undefined8 uVar254;
  undefined1 auVar236 [64];
  undefined1 auVar237 [64];
  undefined1 auVar231 [32];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  undefined1 auVar232 [32];
  undefined1 auVar241 [64];
  undefined1 auVar243 [64];
  undefined1 auVar244 [64];
  undefined1 auVar245 [64];
  undefined1 auVar246 [64];
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Dc_05;
  undefined4 extraout_XMM0_Dd_05;
  undefined1 auVar247 [64];
  float extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Dc_06;
  undefined4 extraout_XMM0_Dd_06;
  undefined1 auVar248 [64];
  undefined1 auVar249 [64];
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Dc_07;
  undefined4 extraout_XMM0_Dd_07;
  undefined1 auVar250 [64];
  anon_struct_4_0_00000001_for___align aVar256;
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [32];
  undefined1 auVar294 [64];
  undefined1 auVar295 [64];
  undefined1 auVar296 [64];
  undefined1 auVar297 [64];
  undefined8 uVar311;
  undefined1 auVar298 [64];
  undefined1 auVar299 [64];
  undefined1 auVar300 [64];
  undefined1 auVar302 [64];
  undefined1 auVar303 [64];
  undefined1 auVar304 [64];
  undefined1 auVar306 [64];
  undefined1 auVar307 [64];
  undefined1 auVar308 [64];
  undefined1 auVar309 [64];
  undefined1 auVar310 [64];
  Float m;
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [32];
  undefined1 auVar328 [32];
  undefined1 auVar329 [32];
  undefined1 auVar330 [32];
  Float t1;
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  float fVar348;
  float fVar349;
  float fVar350;
  undefined1 auVar346 [64];
  undefined1 auVar347 [64];
  Float t0;
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [32];
  undefined1 auVar355 [32];
  undefined1 auVar356 [32];
  undefined1 auVar357 [64];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [64];
  float fVar368;
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 in_ZMM8 [64];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 in_ZMM9 [64];
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 in_ZMM10 [64];
  undefined1 in_ZMM12 [64];
  undefined1 in_ZMM13 [64];
  undefined1 in_XMM14 [16];
  SampledSpectrum SVar382;
  Point3f p_00;
  Vector3f w;
  Vector3f woRender;
  Vector3f woRender_00;
  Vector3f woRender_01;
  bool specularBounce;
  bool anyNonSpecularBounces;
  bool terminated;
  bool scattered;
  BSSRDFHandle bssrdf;
  int depth;
  SampledSpectrum uniPathPDF;
  SampledSpectrum T_hat;
  int voxel [3];
  SampledSpectrum lightPathPDF;
  SampledSpectrum Le;
  SampledSpectrum albedo;
  LightSampleContext prevIntrContext;
  optional<pbrt::BSDFSample> bs;
  SampledSpectrum rrBeta;
  BSSRDFSample bssrdfSample;
  Float nextCrossingT [3];
  int voxelLimit [3];
  RNG rng;
  BSDF bsdf;
  optional<pbrt::ShapeIntersection> si;
  undefined1 auVar383 [12];
  bool local_82c;
  bool local_82b;
  bool local_82a;
  bool local_829;
  undefined1 local_828 [8];
  float fStack_820;
  float fStack_81c;
  float local_80c;
  undefined1 local_808 [36];
  float fStack_7e4;
  float fStack_7e0;
  float fStack_7dc;
  SamplerHandle *local_7d8;
  float local_7d0;
  float fStack_7cc;
  undefined1 local_7c8 [16];
  VolPathIntegrator *local_7b0;
  SampledSpectrum local_7a8;
  SampledWavelengths *local_790;
  SampledSpectrum local_788;
  float local_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  undefined1 local_768 [8];
  float fStack_760;
  float fStack_75c;
  undefined1 local_758 [16];
  undefined1 local_748 [8];
  float fStack_740;
  float fStack_73c;
  SampledSpectrum local_738;
  undefined1 local_728 [24];
  bool local_710;
  undefined1 local_708 [16];
  SampledSpectrum local_6f8;
  float local_6e0;
  float local_6dc;
  undefined1 local_6d8 [8];
  undefined1 auStack_6d0 [24];
  Float FStack_6b8;
  uintptr_t uStack_6b4;
  float fStack_6ac;
  SampledSpectrum *pSStack_6a8;
  float fStack_6a0;
  float fStack_69c;
  float fStack_698;
  float fStack_694;
  SamplerHandle *pSStack_690;
  Float FStack_688;
  Tuple3<pbrt::Vector3,_float> TStack_684;
  undefined1 local_678 [16];
  anon_class_120_15_cd2b6fed local_668;
  undefined1 local_5e8 [8];
  undefined8 uStack_5e0;
  undefined1 local_5d8 [8];
  float fStack_5d0;
  float fStack_5cc;
  ulong local_5c0;
  LightSampleContext local_5b8;
  aligned_storage_t<sizeof(pbrt::BSDFSample),_alignof(pbrt::BSDFSample)> local_588;
  char local_55c;
  undefined1 local_558 [32];
  undefined1 local_538 [128];
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  local_4b8;
  undefined4 uStack_4b0;
  undefined8 uStack_4ac;
  undefined4 uStack_4a4;
  undefined8 auStack_4a0 [13];
  ulong local_438;
  undefined1 local_428 [16];
  undefined1 local_418 [24];
  float afStack_400 [2];
  MediumHandle local_3f8;
  undefined8 local_3c8;
  float local_3c0;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  *local_3b0;
  ScratchBuffer *local_3a8;
  long local_3a0;
  float local_394;
  float local_390;
  float local_38c;
  undefined1 local_388 [16];
  undefined1 local_378 [8];
  float fStack_370;
  float fStack_36c;
  undefined1 local_368 [8];
  float fStack_360;
  Interval IStack_358;
  Float FStack_350;
  undefined4 uStack_32c;
  undefined1 local_328 [16];
  undefined1 local_318 [44];
  bool local_2ec;
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined8 local_298;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  undefined1 local_278 [32];
  Float FStack_258;
  undefined4 uStack_254;
  float fStack_250;
  float fStack_24c;
  undefined8 uStack_248;
  float fStack_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  undefined1 auStack_230 [20];
  undefined8 *local_210;
  undefined8 *local_208;
  bool *local_200;
  VisibleSurface *local_1f8;
  PrimitiveHandle *local_1f0;
  SamplerHandle local_1e8;
  undefined1 local_1e0 [8];
  SamplerHandle local_1d8;
  TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  local_1d0;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_1c8;
  BSDF local_1c0;
  undefined1 local_188 [16];
  uchar *local_170;
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  aligned_storage_t<sizeof(pbrt::ShapeIntersection),_alignof(pbrt::ShapeIntersection)> local_138;
  ulong local_38;
  undefined1 auVar384 [28];
  undefined1 auVar176 [64];
  undefined1 auVar180 [64];
  undefined1 auVar183 [64];
  undefined1 auVar186 [64];
  undefined1 auVar188 [64];
  undefined1 auVar166 [16];
  undefined1 auVar238 [64];
  undefined1 auVar242 [64];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 extraout_var_03 [60];
  undefined1 extraout_var_04 [60];
  undefined1 auVar301 [64];
  undefined1 auVar305 [64];
  undefined1 auVar312 [56];
  
  local_1f8 = visibleSurf;
  local_3a8 = scratchBuffer;
  local_738.values.values = (array<float,_4>)ZEXT816(0);
  local_788.values.values[0] = 1.0;
  local_788.values.values[1] = 1.0;
  local_788.values.values[2] = 1.0;
  local_788.values.values[3] = 1.0;
  local_7a8.values.values[2] = 1.0;
  local_7a8.values.values[0] = 1.0;
  local_7a8.values.values[1] = 1.0;
  local_7a8.values.values[3] = 1.0;
  local_6f8.values.values[2] = 1.0;
  local_6f8.values.values[0] = 1.0;
  local_6f8.values.values[1] = 1.0;
  local_6f8.values.values[3] = 1.0;
  local_82c = false;
  local_82b = false;
  local_808._28_4_ = 0.0;
  local_5b8.n.super_Tuple3<pbrt::Normal3,_float>.z = 0.0;
  local_5b8.ns.super_Tuple3<pbrt::Normal3,_float>.x = 0.0;
  local_5b8.ns.super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
  local_5b8.ns.super_Tuple3<pbrt::Normal3,_float>.z = 0.0;
  local_5b8.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low = 0.0;
  local_5b8.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high = 0.0;
  local_5b8.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low = 0.0;
  local_5b8.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high = 0.0;
  local_5b8.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low = 0.0;
  local_5b8.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high = 0.0;
  local_5b8.n.super_Tuple3<pbrt::Normal3,_float>.x = 0.0;
  local_5b8.n.super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
  local_38c = 0.5;
  local_390 = 0.33333334;
  local_394 = 0.2;
  local_170 = local_138.__data + 0x80;
  local_3b0 = &local_4b8;
  local_188 = SUB6416(ZEXT464(0x3f800000),0);
  local_7b0 = this;
  local_1f0 = &(this->super_RayIntegrator).super_ImageTileIntegrator.super_Integrator.aggregate;
  local_200 = &ray->hasDifferentials;
  local_208 = &uStack_4ac;
  local_210 = auStack_4a0;
  local_790 = lambda;
  local_808._16_8_ = ray;
  local_7d8 = sampler;
  do {
    uVar253 = local_808._16_8_;
    *(long *)(in_FS_OFFSET + -0x298) = *(long *)(in_FS_OFFSET + -0x298) + 1;
    if (((local_1f0->
         super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
         ).bits & 0xffffffffffff) == 0) {
      in_ZmmResult = ZEXT1664(ZEXT816(0) << 0x40);
      local_138._192_64_ = in_ZmmResult;
      local_138._128_64_ = in_ZmmResult;
      local_138._64_64_ = in_ZmmResult;
      local_138._0_64_ = in_ZmmResult;
      local_38 = 0;
    }
    else {
      in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
      in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
      in_ZMM10 = ZEXT1664(in_ZMM10._0_16_);
      in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
      in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
      PrimitiveHandle::Intersect
                ((optional<pbrt::ShapeIntersection> *)&local_138.__align,local_1f0,
                 (Ray *)local_808._16_8_,INFINITY);
    }
    if (((((MediumHandle *)(uVar253 + 0x20))->
         super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
         ).bits & 0xffffffffffff) == 0) {
LAB_003d6e15:
      IVar149 = (Interval)local_808._16_8_;
      if ((byte)local_38 == '\0') {
        pLVar9 = *(pointer *)
                  ((long)&(local_7b0->super_RayIntegrator).super_ImageTileIntegrator.
                          super_Integrator.infiniteLights.
                          super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                          _M_impl.super__Vector_impl_data + 8);
        uVar157 = 3;
        for (pLVar162 = (local_7b0->super_RayIntegrator).super_ImageTileIntegrator.super_Integrator.
                        infiniteLights.
                        super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                        _M_impl.super__Vector_impl_data._M_start; lambda = local_790,
            sampler = local_7d8, pLVar162 != pLVar9; pLVar162 = pLVar162 + 1) {
          uVar141 = (pLVar162->
                    super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                    ).bits;
          auVar172 = ZEXT816(0) << 0x40;
          auVar169 = ZEXT816(0) << 0x40;
          if (0x6ffffffffffff < uVar141) {
            this_02 = (ImageInfiniteLight *)(uVar141 & 0xffffffffffff);
            auVar172 = in_ZMM8._0_16_;
            auVar169 = in_ZMM9._0_16_;
            auVar166 = in_ZMM10._0_16_;
            auVar168 = in_ZMM12._0_16_;
            auVar201 = in_ZMM13._0_16_;
            if (uVar141 >> 0x30 == 8) {
              auVar312 = ZEXT856(0);
              auVar255 = ZEXT856(0);
              in_ZMM8 = ZEXT1664(auVar172);
              in_ZMM9 = ZEXT1664(auVar169);
              in_ZMM10 = ZEXT1664(auVar166);
              in_ZMM12 = ZEXT1664(auVar168);
              in_ZMM13 = ZEXT1664(auVar201);
              SVar382 = ImageInfiniteLight::Le(this_02,(Ray *)local_808._16_8_,local_790);
              auVar307._0_8_ = SVar382.values.values._8_8_;
              auVar307._8_56_ = auVar255;
              auVar169 = auVar307._0_16_;
              auVar244._0_8_ = SVar382.values.values._0_8_;
              auVar244._8_56_ = auVar312;
              auVar172 = auVar244._0_16_;
            }
            else if ((short)(uVar141 >> 0x30) == 7) {
              auVar312 = ZEXT856(0);
              auVar255 = ZEXT856(0);
              in_ZMM8 = ZEXT1664(auVar172);
              in_ZMM9 = ZEXT1664(auVar169);
              in_ZMM10 = ZEXT1664(auVar166);
              in_ZMM12 = ZEXT1664(auVar168);
              in_ZMM13 = ZEXT1664(auVar201);
              SVar382 = UniformInfiniteLight::Le
                                  ((UniformInfiniteLight *)this_02,(Ray *)local_808._16_8_,local_790
                                  );
              auVar306._0_8_ = SVar382.values.values._8_8_;
              auVar306._8_56_ = auVar255;
              auVar169 = auVar306._0_16_;
              auVar243._0_8_ = SVar382.values.values._0_8_;
              auVar243._8_56_ = auVar312;
              auVar172 = auVar243._0_16_;
            }
            else {
              auVar312 = ZEXT856(0);
              auVar255 = ZEXT856(0);
              in_ZMM8 = ZEXT1664(auVar172);
              in_ZMM9 = ZEXT1664(auVar169);
              in_ZMM10 = ZEXT1664(auVar166);
              in_ZMM12 = ZEXT1664(auVar168);
              in_ZMM13 = ZEXT1664(auVar201);
              SVar382 = PortalImageInfiniteLight::Le
                                  ((PortalImageInfiniteLight *)this_02,(Ray *)local_808._16_8_,
                                   local_790);
              auVar308._0_8_ = SVar382.values.values._8_8_;
              auVar308._8_56_ = auVar255;
              auVar169 = auVar308._0_16_;
              auVar245._0_8_ = SVar382.values.values._0_8_;
              auVar245._8_56_ = auVar312;
              auVar172 = auVar245._0_16_;
            }
          }
          auVar187._16_48_ = in_ZmmResult._16_48_;
          auVar172 = vmovlhps_avx(auVar172,auVar169);
          local_6d8._0_4_ = auVar172._0_4_;
          local_6d8._4_4_ = auVar172._4_4_;
          auStack_6d0._0_4_ = auVar172._8_4_;
          auStack_6d0._4_4_ = auVar172._12_4_;
          if (((float)local_6d8._0_4_ != 0.0) || (NAN((float)local_6d8._0_4_))) {
LAB_003d7011:
            if (((float)local_808._28_4_ == 0.0) || (local_82c == true)) {
              auVar220._0_4_ = (float)local_6d8._0_4_ * local_788.values.values[0];
              auVar220._4_4_ = (float)local_6d8._4_4_ * local_788.values.values[1];
              auVar220._8_4_ = (float)auStack_6d0._0_4_ * local_788.values.values[2];
              auVar220._12_4_ = (float)auStack_6d0._4_4_ * local_788.values.values[3];
              lVar151 = 1;
              aVar256 = (anon_struct_4_0_00000001_for___align)local_7a8.values.values[0];
              do {
                aVar256 = (anon_struct_4_0_00000001_for___align)
                          ((float)aVar256 + local_7a8.values.values[lVar151]);
                lVar151 = lVar151 + 1;
              } while (lVar151 != 4);
            }
            else {
              uVar10 = (pLVar162->
                       super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                       ).bits;
              uVar141 = (local_7b0->lightSampler).
                        super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
                        .bits;
              pEVar155 = (ExhaustiveLightSampler *)(uVar141 & 0xffffffffffff);
              sVar108 = (short)(uVar141 >> 0x30);
              auVar172 = in_ZMM8._0_16_;
              auVar169 = in_ZMM9._0_16_;
              auVar166 = in_ZMM10._0_16_;
              auVar168 = in_ZMM12._0_16_;
              auVar201 = in_ZMM13._0_16_;
              local_538._0_4_ = (undefined4)uVar10;
              local_538._4_4_ = (undefined4)(uVar10 >> 0x20);
              if (uVar141 < 0x3000000000000) {
                if (sVar108 == 2) {
                  in_ZMM8 = ZEXT1664(auVar172);
                  in_ZMM9 = ZEXT1664(auVar169);
                  in_ZMM10 = ZEXT1664(auVar166);
                  in_ZMM12 = ZEXT1664(auVar168);
                  in_ZMM13 = ZEXT1664(auVar201);
                  local_828._0_4_ =
                       PowerLightSampler::PDF
                                 ((PowerLightSampler *)pEVar155,&local_5b8,(LightHandle *)local_538)
                  ;
                  local_828._4_4_ = extraout_XMM0_Db;
                  fStack_820 = (float)extraout_XMM0_Dc;
                  fStack_81c = (float)extraout_XMM0_Dd;
                }
                else {
                  sVar11 = (pEVar155->lights).nStored;
                  auVar172 = vcvtusi2ss_avx512f(auVar201,sVar11);
                  fVar192 = 1.0 / auVar172._0_4_;
                  auVar187._4_12_ = SUB6012((undefined1  [60])0x0,0);
                  auVar187._0_4_ = fVar192;
                  auVar186._4_60_ = auVar187._4_60_;
                  auVar186._0_4_ = (uint)(sVar11 != 0) * (int)fVar192;
                  _local_828 = auVar186._0_16_;
                }
              }
              else if (sVar108 == 3) {
                in_ZMM8 = ZEXT1664(auVar172);
                in_ZMM9 = ZEXT1664(auVar169);
                in_ZMM10 = ZEXT1664(auVar166);
                in_ZMM12 = ZEXT1664(auVar168);
                in_ZMM13 = ZEXT1664(auVar201);
                local_828._0_4_ =
                     BVHLightSampler::PDF
                               ((BVHLightSampler *)pEVar155,&local_5b8,(LightHandle *)local_538);
                local_828._4_4_ = extraout_XMM0_Db_00;
                fStack_820 = (float)extraout_XMM0_Dc_00;
                fStack_81c = (float)extraout_XMM0_Dd_00;
              }
              else {
                in_ZMM8 = ZEXT1664(auVar172);
                in_ZMM9 = ZEXT1664(auVar169);
                in_ZMM10 = ZEXT1664(auVar166);
                in_ZMM12 = ZEXT1664(auVar168);
                in_ZMM13 = ZEXT1664(auVar201);
                local_828._0_4_ =
                     ExhaustiveLightSampler::PDF(pEVar155,&local_5b8,(LightHandle *)local_538);
                local_828._4_4_ = extraout_XMM0_Db_01;
                fStack_820 = (float)extraout_XMM0_Dc_01;
                fStack_81c = (float)extraout_XMM0_Dd_01;
              }
              local_538._32_4_ = local_5b8.n.super_Tuple3<pbrt::Normal3,_float>.z;
              local_538._36_4_ = local_5b8.ns.super_Tuple3<pbrt::Normal3,_float>.x;
              local_538._40_4_ = local_5b8.ns.super_Tuple3<pbrt::Normal3,_float>.y;
              local_538._44_4_ = local_5b8.ns.super_Tuple3<pbrt::Normal3,_float>.z;
              local_538._0_4_ =
                   local_5b8.pi.super_Point3<pbrt::Interval>.
                   super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
              local_538._4_4_ =
                   local_5b8.pi.super_Point3<pbrt::Interval>.
                   super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
              local_538._8_4_ =
                   local_5b8.pi.super_Point3<pbrt::Interval>.
                   super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
              local_538._12_4_ =
                   local_5b8.pi.super_Point3<pbrt::Interval>.
                   super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
              local_538._16_4_ =
                   local_5b8.pi.super_Point3<pbrt::Interval>.
                   super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low;
              local_538._20_4_ =
                   local_5b8.pi.super_Point3<pbrt::Interval>.
                   super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high;
              local_538._24_4_ = local_5b8.n.super_Tuple3<pbrt::Normal3,_float>.x;
              local_538._28_4_ = local_5b8.n.super_Tuple3<pbrt::Normal3,_float>.y;
              pTVar1 = (Tuple3<pbrt::Vector3,_float> *)(local_808._16_8_ + 0xc);
              local_418._0_4_ = pTVar1->x;
              local_418._4_4_ = pTVar1->y;
              local_418._8_4_ = *(float *)(local_808._16_8_ + 0x14);
              auVar134._60_4_ = 0;
              auVar134._0_60_ = stack0xfffffffffffffc9c;
              _local_368 = auVar134 << 0x20;
              local_668.T_hat = (SampledSpectrum *)local_538;
              local_668.terminated = (bool *)local_418;
              local_668.uniPathPDF = (SampledSpectrum *)local_368;
              uVar141 = (pLVar162->
                        super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                        ).bits;
              uVar145 = (uint)(ushort)(uVar141 >> 0x30);
              auVar172 = in_ZMM8._0_16_;
              auVar169 = in_ZMM9._0_16_;
              auVar166 = in_ZMM10._0_16_;
              auVar168 = in_ZMM12._0_16_;
              auVar201 = in_ZMM13._0_16_;
              if (uVar141 < 0x5000000000000) {
                fVar192 = 0.0;
                if (0x2ffffffffffff < uVar141) {
                  if (uVar145 == 3) {
                    auVar121._8_4_ = local_5b8.n.super_Tuple3<pbrt::Normal3,_float>.x;
                    auVar121._12_4_ = local_5b8.n.super_Tuple3<pbrt::Normal3,_float>.y;
                    auVar121._0_4_ =
                         local_5b8.pi.super_Point3<pbrt::Interval>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low;
                    auVar121._4_4_ =
                         local_5b8.pi.super_Point3<pbrt::Interval>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high;
                    auVar121._16_4_ = local_5b8.n.super_Tuple3<pbrt::Normal3,_float>.z;
                    auVar121._20_4_ = local_5b8.ns.super_Tuple3<pbrt::Normal3,_float>.x;
                    auVar121._24_4_ = local_5b8.ns.super_Tuple3<pbrt::Normal3,_float>.y;
                    auVar121._28_4_ = local_5b8.ns.super_Tuple3<pbrt::Normal3,_float>.z;
                    in_ZMM8 = ZEXT1664(auVar172);
                    in_ZMM9 = ZEXT1664(auVar169);
                    in_ZMM10 = ZEXT1664(auVar166);
                    in_ZMM12 = ZEXT1664(auVar168);
                    in_ZMM13 = ZEXT1664(auVar201);
                    LVar109.pi.super_Point3<pbrt::Interval>.
                    super_Tuple3<pbrt::Point3,_pbrt::Interval>.y =
                         local_5b8.pi.super_Point3<pbrt::Interval>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval>.y;
                    LVar109.pi.super_Point3<pbrt::Interval>.
                    super_Tuple3<pbrt::Point3,_pbrt::Interval>.x =
                         local_5b8.pi.super_Point3<pbrt::Interval>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval>.x;
                    LVar109.pi.super_Point3<pbrt::Interval>.
                    super_Tuple3<pbrt::Point3,_pbrt::Interval>.z =
                         local_5b8.pi.super_Point3<pbrt::Interval>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval>.z;
                    LVar109.n.super_Tuple3<pbrt::Normal3,_float>.x =
                         local_5b8.n.super_Tuple3<pbrt::Normal3,_float>.x;
                    LVar109.n.super_Tuple3<pbrt::Normal3,_float>.y =
                         local_5b8.n.super_Tuple3<pbrt::Normal3,_float>.y;
                    auVar383 = SUB1612(auVar121._16_16_,4);
                    LVar109.n.super_Tuple3<pbrt::Normal3,_float>.z =
                         (float)SUB164(auVar121._16_16_,0);
                    LVar109.ns.super_Tuple3<pbrt::Normal3,_float>.x = (float)auVar383._0_4_;
                    LVar109.ns.super_Tuple3<pbrt::Normal3,_float>.y = (float)auVar383._4_4_;
                    LVar109.ns.super_Tuple3<pbrt::Normal3,_float>.z = (float)auVar383._8_4_;
                    fVar192 = ProjectionLight::PDF_Li
                                        ((ProjectionLight *)(uVar141 & 0xffffffffffff),LVar109,
                                         (Vector3f)*pTVar1,WithMIS);
                  }
                  else {
                    auVar122._8_4_ = local_5b8.n.super_Tuple3<pbrt::Normal3,_float>.x;
                    auVar122._12_4_ = local_5b8.n.super_Tuple3<pbrt::Normal3,_float>.y;
                    auVar122._0_4_ =
                         local_5b8.pi.super_Point3<pbrt::Interval>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low;
                    auVar122._4_4_ =
                         local_5b8.pi.super_Point3<pbrt::Interval>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high;
                    auVar122._16_4_ = local_5b8.n.super_Tuple3<pbrt::Normal3,_float>.z;
                    auVar122._20_4_ = local_5b8.ns.super_Tuple3<pbrt::Normal3,_float>.x;
                    auVar122._24_4_ = local_5b8.ns.super_Tuple3<pbrt::Normal3,_float>.y;
                    auVar122._28_4_ = local_5b8.ns.super_Tuple3<pbrt::Normal3,_float>.z;
                    in_ZMM8 = ZEXT1664(auVar172);
                    in_ZMM9 = ZEXT1664(auVar169);
                    in_ZMM10 = ZEXT1664(auVar166);
                    in_ZMM12 = ZEXT1664(auVar168);
                    in_ZMM13 = ZEXT1664(auVar201);
                    LVar110.pi.super_Point3<pbrt::Interval>.
                    super_Tuple3<pbrt::Point3,_pbrt::Interval>.y =
                         local_5b8.pi.super_Point3<pbrt::Interval>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval>.y;
                    LVar110.pi.super_Point3<pbrt::Interval>.
                    super_Tuple3<pbrt::Point3,_pbrt::Interval>.x =
                         local_5b8.pi.super_Point3<pbrt::Interval>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval>.x;
                    LVar110.pi.super_Point3<pbrt::Interval>.
                    super_Tuple3<pbrt::Point3,_pbrt::Interval>.z =
                         local_5b8.pi.super_Point3<pbrt::Interval>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval>.z;
                    LVar110.n.super_Tuple3<pbrt::Normal3,_float>.x =
                         local_5b8.n.super_Tuple3<pbrt::Normal3,_float>.x;
                    LVar110.n.super_Tuple3<pbrt::Normal3,_float>.y =
                         local_5b8.n.super_Tuple3<pbrt::Normal3,_float>.y;
                    auVar383 = SUB1612(auVar122._16_16_,4);
                    LVar110.n.super_Tuple3<pbrt::Normal3,_float>.z =
                         (float)SUB164(auVar122._16_16_,0);
                    LVar110.ns.super_Tuple3<pbrt::Normal3,_float>.x = (float)auVar383._0_4_;
                    LVar110.ns.super_Tuple3<pbrt::Normal3,_float>.y = (float)auVar383._4_4_;
                    LVar110.ns.super_Tuple3<pbrt::Normal3,_float>.z = (float)auVar383._8_4_;
                    fVar192 = GoniometricLight::PDF_Li
                                        ((GoniometricLight *)(uVar141 & 0xffffffffffff),LVar110,
                                         (Vector3f)*pTVar1,WithMIS);
                  }
                }
              }
              else {
                in_ZMM8 = ZEXT1664(auVar172);
                in_ZMM9 = ZEXT1664(auVar169);
                in_ZMM10 = ZEXT1664(auVar166);
                in_ZMM12 = ZEXT1664(auVar168);
                in_ZMM13 = ZEXT1664(auVar201);
                local_278._0_8_ = uVar141;
                fVar192 = DispatchSplit<5>::operator()
                                    ((DispatchSplit<5> *)&local_1c0,local_278,uVar145 - 4);
              }
              fVar192 = fVar192 * (float)local_828._0_4_;
              local_6f8.values.values[0] = fVar192 * local_6f8.values.values[0];
              local_6f8.values.values[1] = fVar192 * local_6f8.values.values[1];
              local_6f8.values.values[2] = fVar192 * local_6f8.values.values[2];
              local_6f8.values.values[3] = fVar192 * local_6f8.values.values[3];
              auVar220._0_4_ = (float)local_6d8._0_4_ * local_788.values.values[0];
              auVar220._4_4_ = (float)local_6d8._4_4_ * local_788.values.values[1];
              auVar220._8_4_ = (float)auStack_6d0._0_4_ * local_788.values.values[2];
              auVar220._12_4_ = (float)auStack_6d0._4_4_ * local_788.values.values[3];
              aVar256 = (anon_struct_4_0_00000001_for___align)
                        (local_6f8.values.values[0] + local_7a8.values.values[0]);
              local_538._0_4_ = aVar256;
              local_538._4_4_ = local_6f8.values.values[1] + local_7a8.values.values[1];
              local_538._8_4_ = local_6f8.values.values[2] + local_7a8.values.values[2];
              local_538._12_4_ = local_6f8.values.values[3] + local_7a8.values.values[3];
              lVar151 = 1;
              do {
                aVar256 = (anon_struct_4_0_00000001_for___align)
                          ((float)aVar256 + *(float *)(local_538 + lVar151 * 4));
                lVar151 = lVar151 + 1;
              } while (lVar151 != 4);
            }
            fVar192 = (float)aVar256 * 0.25;
            auVar288._0_4_ = fVar192 * (local_790->pdf).values[0];
            auVar288._4_4_ = fVar192 * (local_790->pdf).values[1];
            auVar288._8_4_ = fVar192 * (local_790->pdf).values[2];
            auVar288._12_4_ = fVar192 * (local_790->pdf).values[3];
            uVar141 = vcmpps_avx512vl(auVar288,_DAT_00453010,4);
            auVar172 = vdivps_avx512vl(auVar220,auVar288);
            fVar368 = (float)((uint)((byte)uVar141 & 1) * auVar172._0_4_);
            fVar252 = (float)((uint)((byte)(uVar141 >> 1) & 1) * auVar172._4_4_);
            in_ZmmResult._4_4_ = fVar252;
            in_ZmmResult._0_4_ = fVar368;
            fVar251 = (float)((uint)((byte)(uVar141 >> 2) & 1) * auVar172._8_4_);
            in_ZmmResult._8_4_ = fVar251;
            fVar192 = (float)((uint)((byte)(uVar141 >> 3) & 1) * auVar172._12_4_);
            in_ZmmResult._12_4_ = fVar192;
            in_ZmmResult._16_48_ = auVar187._16_48_;
            local_738.values.values[1] = fVar252 + local_738.values.values[1];
            local_738.values.values[0] = fVar368 + local_738.values.values[0];
            local_738.values.values[2] = fVar251 + local_738.values.values[2];
            local_738.values.values[3] = fVar192 + local_738.values.values[3];
          }
          else {
            uVar141 = 0;
            while (uVar144 = uVar141, uVar144 != 3) {
              if ((*(float *)(local_6d8 + uVar144 * 4 + 4) != 0.0) ||
                 (uVar141 = uVar144 + 1, NAN(*(float *)(local_6d8 + uVar144 * 4 + 4)))) break;
            }
            if (uVar144 < 3) goto LAB_003d7011;
          }
        }
      }
      else {
        auVar286._0_4_ = -*(float *)(local_808._16_8_ + 0x14);
        auVar286._4_4_ = 0x80000000;
        auVar286._8_4_ = 0x80000000;
        auVar286._12_4_ = 0x80000000;
        uVar141._0_4_ =
             (((Vector3f *)(local_808._16_8_ + 0xc))->super_Tuple3<pbrt::Vector3,_float>).x;
        uVar141._4_4_ =
             (((Vector3f *)(local_808._16_8_ + 0xc))->super_Tuple3<pbrt::Vector3,_float>).y;
        auVar218._0_8_ = uVar141 ^ 0x8000000080000000;
        auVar218._8_4_ = 0x80000000;
        auVar218._12_4_ = 0x80000000;
        auVar169 = in_ZMM8._0_16_;
        auVar166 = in_ZMM9._0_16_;
        auVar168 = in_ZMM10._0_16_;
        auVar201 = in_ZMM12._0_16_;
        auVar173 = in_ZMM13._0_16_;
        w.super_Tuple3<pbrt::Vector3,_float>.z = auVar286._0_4_;
        w.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)auVar218._0_8_;
        w.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)(auVar218._0_8_ >> 0x20);
        auVar255 = ZEXT856(auVar286._8_8_);
        auVar312 = ZEXT856(auVar218._8_8_);
        SVar382 = SurfaceInteraction::Le((SurfaceInteraction *)&local_138.__align,w,lambda);
        auVar346 = local_138._192_64_;
        auVar305._0_8_ = SVar382.values.values._8_8_;
        auVar305._8_56_ = auVar255;
        auVar242._0_8_ = SVar382.values.values._0_8_;
        auVar242._8_56_ = auVar312;
        uVar141 = auVar255._0_8_;
        auVar172 = vmovlhps_avx(auVar242._0_16_,auVar305._0_16_);
        local_6d8._0_4_ = auVar172._0_4_;
        local_6d8._4_4_ = auVar172._4_4_;
        auStack_6d0._0_4_ = auVar172._8_4_;
        auStack_6d0._4_4_ = auVar172._12_4_;
        if (((float)local_6d8._0_4_ != 0.0) || (NAN((float)local_6d8._0_4_))) {
LAB_003d6ea6:
          if (((float)local_808._28_4_ == 0.0) || (local_82c == true)) {
            auVar219._0_4_ = (float)local_6d8._0_4_ * local_788.values.values[0];
            auVar219._4_4_ = (float)local_6d8._4_4_ * local_788.values.values[1];
            auVar219._8_4_ = (float)auStack_6d0._0_4_ * local_788.values.values[2];
            auVar219._12_4_ = (float)auStack_6d0._4_4_ * local_788.values.values[3];
            lVar151 = 1;
            fVar192 = local_7a8.values.values[0];
            do {
              fVar192 = fVar192 + local_7a8.values.values[lVar151];
              lVar151 = lVar151 + 1;
            } while (lVar151 != 4);
            fVar192 = fVar192 * 0.25;
            auVar287._0_4_ = fVar192 * (lambda->pdf).values[0];
            auVar287._4_4_ = fVar192 * (lambda->pdf).values[1];
            auVar287._8_4_ = fVar192 * (lambda->pdf).values[2];
            auVar287._12_4_ = fVar192 * (lambda->pdf).values[3];
            uVar141 = auVar287._8_8_;
            uVar144 = vcmpps_avx512vl(auVar287,_DAT_00453010,4);
            auVar172 = vdivps_avx512vl(auVar219,auVar287);
            fVar252 = (float)((uint)((byte)uVar144 & 1) * auVar172._0_4_);
            fVar368 = (float)((uint)((byte)(uVar144 >> 1) & 1) * auVar172._4_4_);
            in_ZmmResult._4_4_ = fVar368;
            in_ZmmResult._0_4_ = fVar252;
            fVar251 = (float)((uint)((byte)(uVar144 >> 2) & 1) * auVar172._8_4_);
            in_ZmmResult._8_4_ = fVar251;
            fVar192 = (float)((uint)((byte)(uVar144 >> 3) & 1) * auVar172._12_4_);
            in_ZmmResult._12_4_ = fVar192;
            local_738.values.values[0] = fVar252 + local_738.values.values[0];
            local_738.values.values[1] = fVar368 + local_738.values.values[1];
            local_738.values.values[2] = fVar251 + local_738.values.values[2];
            local_738.values.values[3] = fVar192 + local_738.values.values[3];
            uVar144 = local_738.values.values._8_8_;
          }
          else {
            uVar253 = local_138._200_8_;
            uVar141 = (local_7b0->lightSampler).
                      super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
                      .bits;
            pEVar155 = (ExhaustiveLightSampler *)(uVar141 & 0xffffffffffff);
            sVar108 = (short)(uVar141 >> 0x30);
            local_538._0_4_ = local_138._200_4_;
            local_538._4_4_ = local_138._204_4_;
            if (uVar141 < 0x3000000000000) {
              if (sVar108 == 2) {
                local_828._0_4_ =
                     PowerLightSampler::PDF
                               ((PowerLightSampler *)pEVar155,&local_5b8,(LightHandle *)local_538);
                local_828._4_4_ = extraout_XMM0_Db_02;
                fStack_820 = (float)extraout_XMM0_Dc_02;
                fStack_81c = (float)extraout_XMM0_Dd_02;
              }
              else {
                sVar11 = (pEVar155->lights).nStored;
                auVar172 = vcvtusi2ss_avx512f(auVar173,sVar11);
                fVar192 = 1.0 / auVar172._0_4_;
                auVar189._4_12_ = SUB6012((undefined1  [60])0x0,0);
                auVar189._0_4_ = fVar192;
                auVar189._16_48_ = in_ZmmResult._16_48_;
                auVar188._4_60_ = auVar189._4_60_;
                auVar188._0_4_ = (uint)(sVar11 != 0) * (int)fVar192;
                _local_828 = auVar188._0_16_;
              }
            }
            else if (sVar108 == 3) {
              local_828._0_4_ =
                   BVHLightSampler::PDF
                             ((BVHLightSampler *)pEVar155,&local_5b8,(LightHandle *)local_538);
              local_828._4_4_ = extraout_XMM0_Db_03;
              fStack_820 = (float)extraout_XMM0_Dc_03;
              fStack_81c = (float)extraout_XMM0_Dd_03;
            }
            else {
              local_828._0_4_ =
                   ExhaustiveLightSampler::PDF(pEVar155,&local_5b8,(LightHandle *)local_538);
              local_828._4_4_ = extraout_XMM0_Db_04;
              fStack_820 = (float)extraout_XMM0_Dc_04;
              fStack_81c = (float)extraout_XMM0_Dd_04;
            }
            local_538._32_4_ = local_5b8.n.super_Tuple3<pbrt::Normal3,_float>.z;
            local_538._36_4_ = local_5b8.ns.super_Tuple3<pbrt::Normal3,_float>.x;
            local_538._40_4_ = local_5b8.ns.super_Tuple3<pbrt::Normal3,_float>.y;
            local_538._44_4_ = local_5b8.ns.super_Tuple3<pbrt::Normal3,_float>.z;
            local_538._0_4_ =
                 local_5b8.pi.super_Point3<pbrt::Interval>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
            local_538._4_4_ =
                 local_5b8.pi.super_Point3<pbrt::Interval>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
            local_538._8_4_ =
                 local_5b8.pi.super_Point3<pbrt::Interval>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
            local_538._12_4_ =
                 local_5b8.pi.super_Point3<pbrt::Interval>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
            local_538._16_4_ =
                 local_5b8.pi.super_Point3<pbrt::Interval>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low;
            local_538._20_4_ =
                 local_5b8.pi.super_Point3<pbrt::Interval>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high;
            local_538._24_4_ = local_5b8.n.super_Tuple3<pbrt::Normal3,_float>.x;
            local_538._28_4_ = local_5b8.n.super_Tuple3<pbrt::Normal3,_float>.y;
            pTVar1 = (Tuple3<pbrt::Vector3,_float> *)(local_808._16_8_ + 0xc);
            local_418._0_4_ = pTVar1->x;
            local_418._4_4_ = pTVar1->y;
            local_418._8_4_ = *(float *)(local_808._16_8_ + 0x14);
            auVar135._60_4_ = 0;
            auVar135._0_60_ = stack0xfffffffffffffc9c;
            _local_368 = auVar135 << 0x20;
            local_668.T_hat = (SampledSpectrum *)local_538;
            local_668.terminated = (bool *)local_418;
            local_668.uniPathPDF = (SampledSpectrum *)local_368;
            if ((ulong)uVar253 < 0x5000000000000) {
              fVar192 = 0.0;
              if (0x2ffffffffffff < (ulong)uVar253) {
                if (auVar346._14_2_ == 3) {
                  auVar123._8_4_ = local_5b8.n.super_Tuple3<pbrt::Normal3,_float>.x;
                  auVar123._12_4_ = local_5b8.n.super_Tuple3<pbrt::Normal3,_float>.y;
                  auVar123._0_4_ =
                       local_5b8.pi.super_Point3<pbrt::Interval>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low;
                  auVar123._4_4_ =
                       local_5b8.pi.super_Point3<pbrt::Interval>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high;
                  auVar123._16_4_ = local_5b8.n.super_Tuple3<pbrt::Normal3,_float>.z;
                  auVar123._20_4_ = local_5b8.ns.super_Tuple3<pbrt::Normal3,_float>.x;
                  auVar123._24_4_ = local_5b8.ns.super_Tuple3<pbrt::Normal3,_float>.y;
                  auVar123._28_4_ = local_5b8.ns.super_Tuple3<pbrt::Normal3,_float>.z;
                  LVar111.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>
                  .y = local_5b8.pi.super_Point3<pbrt::Interval>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval>.y;
                  LVar111.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>
                  .x = local_5b8.pi.super_Point3<pbrt::Interval>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval>.x;
                  LVar111.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>
                  .z = local_5b8.pi.super_Point3<pbrt::Interval>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval>.z;
                  LVar111.n.super_Tuple3<pbrt::Normal3,_float>.x =
                       local_5b8.n.super_Tuple3<pbrt::Normal3,_float>.x;
                  LVar111.n.super_Tuple3<pbrt::Normal3,_float>.y =
                       local_5b8.n.super_Tuple3<pbrt::Normal3,_float>.y;
                  auVar383 = SUB1612(auVar123._16_16_,4);
                  LVar111.n.super_Tuple3<pbrt::Normal3,_float>.z = (float)SUB164(auVar123._16_16_,0)
                  ;
                  LVar111.ns.super_Tuple3<pbrt::Normal3,_float>.x = (float)auVar383._0_4_;
                  LVar111.ns.super_Tuple3<pbrt::Normal3,_float>.y = (float)auVar383._4_4_;
                  LVar111.ns.super_Tuple3<pbrt::Normal3,_float>.z = (float)auVar383._8_4_;
                  fVar192 = ProjectionLight::PDF_Li
                                      ((ProjectionLight *)(uVar253 & 0xffffffffffff),LVar111,
                                       (Vector3f)*pTVar1,WithMIS);
                }
                else {
                  auVar124._8_4_ = local_5b8.n.super_Tuple3<pbrt::Normal3,_float>.x;
                  auVar124._12_4_ = local_5b8.n.super_Tuple3<pbrt::Normal3,_float>.y;
                  auVar124._0_4_ =
                       local_5b8.pi.super_Point3<pbrt::Interval>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low;
                  auVar124._4_4_ =
                       local_5b8.pi.super_Point3<pbrt::Interval>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high;
                  auVar124._16_4_ = local_5b8.n.super_Tuple3<pbrt::Normal3,_float>.z;
                  auVar124._20_4_ = local_5b8.ns.super_Tuple3<pbrt::Normal3,_float>.x;
                  auVar124._24_4_ = local_5b8.ns.super_Tuple3<pbrt::Normal3,_float>.y;
                  auVar124._28_4_ = local_5b8.ns.super_Tuple3<pbrt::Normal3,_float>.z;
                  LVar112.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>
                  .y = local_5b8.pi.super_Point3<pbrt::Interval>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval>.y;
                  LVar112.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>
                  .x = local_5b8.pi.super_Point3<pbrt::Interval>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval>.x;
                  LVar112.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>
                  .z = local_5b8.pi.super_Point3<pbrt::Interval>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval>.z;
                  LVar112.n.super_Tuple3<pbrt::Normal3,_float>.x =
                       local_5b8.n.super_Tuple3<pbrt::Normal3,_float>.x;
                  LVar112.n.super_Tuple3<pbrt::Normal3,_float>.y =
                       local_5b8.n.super_Tuple3<pbrt::Normal3,_float>.y;
                  auVar383 = SUB1612(auVar124._16_16_,4);
                  LVar112.n.super_Tuple3<pbrt::Normal3,_float>.z = (float)SUB164(auVar124._16_16_,0)
                  ;
                  LVar112.ns.super_Tuple3<pbrt::Normal3,_float>.x = (float)auVar383._0_4_;
                  LVar112.ns.super_Tuple3<pbrt::Normal3,_float>.y = (float)auVar383._4_4_;
                  LVar112.ns.super_Tuple3<pbrt::Normal3,_float>.z = (float)auVar383._8_4_;
                  fVar192 = GoniometricLight::PDF_Li
                                      ((GoniometricLight *)(uVar253 & 0xffffffffffff),LVar112,
                                       (Vector3f)*pTVar1,WithMIS);
                }
              }
            }
            else {
              local_278._0_8_ = uVar253;
              fVar192 = DispatchSplit<5>::operator()
                                  ((DispatchSplit<5> *)&local_1c0,local_278,auVar346._14_2_ - 4);
            }
            fVar192 = fVar192 * (float)local_828._0_4_;
            local_6f8.values.values[0] = fVar192 * local_6f8.values.values[0];
            local_6f8.values.values[1] = fVar192 * local_6f8.values.values[1];
            local_6f8.values.values[2] = fVar192 * local_6f8.values.values[2];
            local_6f8.values.values[3] = fVar192 * local_6f8.values.values[3];
            auVar221._0_4_ = (float)local_6d8._0_4_ * local_788.values.values[0];
            auVar221._4_4_ = (float)local_6d8._4_4_ * local_788.values.values[1];
            auVar221._8_4_ = (float)auStack_6d0._0_4_ * local_788.values.values[2];
            auVar221._12_4_ = (float)auStack_6d0._4_4_ * local_788.values.values[3];
            aVar256 = (anon_struct_4_0_00000001_for___align)
                      (local_6f8.values.values[0] + local_7a8.values.values[0]);
            local_538._0_4_ = aVar256;
            local_538._4_4_ = local_6f8.values.values[1] + local_7a8.values.values[1];
            local_538._8_4_ = local_6f8.values.values[2] + local_7a8.values.values[2];
            local_538._12_4_ = local_6f8.values.values[3] + local_7a8.values.values[3];
            lVar151 = 1;
            do {
              aVar256 = (anon_struct_4_0_00000001_for___align)
                        ((float)aVar256 + *(float *)(local_538 + lVar151 * 4));
              lVar151 = lVar151 + 1;
            } while (lVar151 != 4);
            fVar192 = (float)aVar256 * 0.25;
            auVar289._0_4_ = fVar192 * (lambda->pdf).values[0];
            auVar289._4_4_ = fVar192 * (lambda->pdf).values[1];
            auVar289._8_4_ = fVar192 * (lambda->pdf).values[2];
            auVar289._12_4_ = fVar192 * (lambda->pdf).values[3];
            uVar141 = auVar289._8_8_;
            uVar144 = vcmpps_avx512vl(auVar289,_DAT_00453010,4);
            auVar172 = vdivps_avx512vl(auVar221,auVar289);
            fVar368 = (float)((uint)((byte)uVar144 & 1) * auVar172._0_4_);
            fVar192 = (float)((uint)((byte)(uVar144 >> 1) & 1) * auVar172._4_4_);
            in_ZmmResult._4_4_ = fVar192;
            in_ZmmResult._0_4_ = fVar368;
            fVar251 = (float)((uint)((byte)(uVar144 >> 2) & 1) * auVar172._8_4_);
            in_ZmmResult._8_4_ = fVar251;
            fVar252 = (float)((uint)((byte)(uVar144 >> 3) & 1) * auVar172._12_4_);
            in_ZmmResult._12_4_ = fVar252;
            local_738.values.values[0] = fVar368 + local_738.values.values[0];
            local_738.values.values[1] = fVar192 + local_738.values.values[1];
            local_738.values.values[2] = fVar251 + local_738.values.values[2];
            local_738.values.values[3] = fVar252 + local_738.values.values[3];
            uVar144 = local_738.values.values._8_8_;
            IVar149 = (Interval)local_808._16_8_;
          }
        }
        else {
          uVar144 = 0;
          while (uVar142 = uVar144, uVar142 != 3) {
            if ((*(float *)(local_6d8 + uVar142 * 4 + 4) != 0.0) ||
               (uVar144 = uVar142 + 1, NAN(*(float *)(local_6d8 + uVar142 * 4 + 4)))) break;
          }
          uVar144 = 0;
          if (uVar142 < 3) goto LAB_003d6ea6;
        }
        local_1c8.bits =
             (local_7b0->super_RayIntegrator).super_ImageTileIntegrator.camera.
             super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
             .bits;
        local_1d0.bits =
             (sampler->
             super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
             ).bits;
        in_ZMM8 = ZEXT1664(auVar169);
        in_ZMM9 = ZEXT1664(auVar166);
        in_ZMM10 = ZEXT1664(auVar168);
        in_ZMM12 = ZEXT1664(auVar201);
        in_ZMM13 = ZEXT1664(auVar173);
        SurfaceInteraction::GetBSDF
                  (&local_1c0,(SurfaceInteraction *)&local_138.__align,(RayDifferential *)IVar149,
                   lambda,(CameraHandle *)&local_1c8,local_3a8,(SamplerHandle *)&local_1d0);
        if (((ulong)local_1c0.bxdf.
                    super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
                    .bits & 0xffffffffffff) == 0) {
          if ((byte)local_38 == '\0') {
            LogFatal<char_const(&)[4]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                       ,0xea,"Check failed: %s",(char (*) [4])0x287813c);
          }
          uVar157 = 0;
          SurfaceInteraction::SkipIntersection
                    ((SurfaceInteraction *)&local_138.__align,(RayDifferential *)local_808._16_8_,
                     (Float)local_138._248_4_);
        }
        else {
          if ((local_1f8 != (VisibleSurface *)0x0) && ((float)local_808._28_4_ == 0.0)) {
            _local_828 = ZEXT816(0);
            uVar144 = 0;
            do {
              uVar144 = uVar144 + 1;
              fVar192 = 1.0;
              lVar151 = 0;
              uVar141 = uVar144;
              do {
                lVar151 = (lVar151 - uVar141 / 2) * 2 + uVar141;
                fVar192 = local_38c * fVar192;
                bVar163 = 1 < uVar141;
                uVar141 = uVar141 / 2;
              } while (bVar163);
              auVar172 = vcvtusi2ss_avx512f(in_ZMM10._0_16_,lVar151);
              fVar251 = 1.0;
              lVar151 = 0;
              uVar141 = uVar144;
              do {
                lVar151 = (lVar151 - uVar141 / 3) * 3 + uVar141;
                fVar251 = local_390 * fVar251;
                bVar163 = 2 < uVar141;
                uVar141 = uVar141 / 3;
              } while (bVar163);
              auVar169 = vcvtusi2ss_avx512f(in_ZMM9._0_16_,lVar151);
              fVar252 = 1.0;
              lVar151 = 0;
              uVar141 = uVar144;
              do {
                lVar151 = (lVar151 - uVar141 / 5) * 5 + uVar141;
                fVar252 = local_394 * fVar252;
                bVar163 = 4 < uVar141;
                uVar141 = uVar141 / 5;
              } while (bVar163);
              if ((byte)local_38 == '\0') {
                LogFatal<char_const(&)[4]>
                          (Fatal,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                           ,0xea,"Check failed: %s",(char (*) [4])0x287813c);
              }
              auVar168 = SUB6416(ZEXT464(0x3f7fffff),0);
              auVar169 = vminss_avx(auVar168,ZEXT416((uint)(fVar251 * auVar169._0_4_)));
              auVar166 = vcvtusi2ss_avx512f(in_ZMM8._0_16_,lVar151);
              auVar166 = vminss_avx(auVar168,ZEXT416((uint)(fVar252 * auVar166._0_4_)));
              auVar169 = vinsertps_avx(auVar169,auVar166,0x10);
              auVar172 = vminss_avx(auVar168,ZEXT416((uint)(fVar192 * auVar172._0_4_)));
              uVar141 = 0;
              BSDF::Sample_f((optional<pbrt::BSDFSample> *)local_538,&local_1c0,
                             (Vector3f)local_138._28_12_,auVar172._0_4_,(Point2f)auVar169._0_8_,
                             Radiance,All);
              if ((bool)local_538[0x2c] == true) {
                if ((byte)local_38 == '\0') {
                  LogFatal<char_const(&)[4]>
                            (Fatal,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                             ,0xea,"Check failed: %s",(char (*) [4])0x287813c);
                }
                auVar172 = vfmadd132ss_fma(ZEXT416((uint)local_138._132_4_),
                                           ZEXT416((uint)((float)local_138._136_4_ *
                                                         (float)local_538._24_4_)),
                                           ZEXT416((uint)local_538._20_4_));
                auVar169 = vfmsub213ss_fma(ZEXT416((uint)local_538._24_4_),
                                           ZEXT416((uint)local_138._136_4_),
                                           ZEXT416((uint)((float)local_138._136_4_ *
                                                         (float)local_538._24_4_)));
                auVar172 = vfmadd231ss_fma(ZEXT416((uint)(auVar172._0_4_ + auVar169._0_4_)),
                                           ZEXT416((uint)local_138._128_4_),
                                           ZEXT416((uint)local_538._16_4_));
                uVar194 = auVar172._0_4_;
                auVar222._4_4_ = uVar194;
                auVar222._0_4_ = uVar194;
                auVar222._8_4_ = uVar194;
                auVar222._12_4_ = uVar194;
                auVar25._8_4_ = 0x7fffffff;
                auVar25._0_8_ = 0x7fffffff7fffffff;
                auVar25._12_4_ = 0x7fffffff;
                auVar172 = vandps_avx512vl(auVar222,auVar25);
                auVar223._0_4_ = auVar172._0_4_ * (float)local_538._0_4_;
                auVar223._4_4_ = auVar172._4_4_ * (float)local_538._4_4_;
                auVar223._8_4_ = auVar172._8_4_ * (float)local_538._8_4_;
                auVar223._12_4_ = auVar172._12_4_ * (float)local_538._12_4_;
                auVar26._4_4_ = local_538._28_4_;
                auVar26._0_4_ = local_538._28_4_;
                auVar26._8_4_ = local_538._28_4_;
                auVar26._12_4_ = local_538._28_4_;
                auVar172 = vdivps_avx512vl(auVar223,auVar26);
                local_828._0_4_ = auVar172._0_4_ + (float)local_828._0_4_;
                local_828._4_4_ = auVar172._4_4_ + (float)local_828._4_4_;
                fStack_820 = auVar172._8_4_ + fStack_820;
                fStack_81c = auVar172._12_4_ + fStack_81c;
                uVar141 = local_828._8_8_;
                local_538._44_4_ = local_538._44_4_ & 0xffffff00;
              }
            } while (uVar144 != 0x10);
            auVar27._8_4_ = 0x3d800000;
            auVar27._0_8_ = 0x3d8000003d800000;
            auVar27._12_4_ = 0x3d800000;
            auVar172 = vmulps_avx512vl(_local_828,auVar27);
            local_668.T_hat = auVar172._0_8_;
            local_668.terminated = auVar172._8_8_;
            if ((byte)local_38 == '\0') {
              LogFatal<char_const(&)[4]>
                        (Fatal,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                         ,0xea,"Check failed: %s",(char (*) [4])0x287813c);
            }
            VisibleSurface::VisibleSurface
                      ((VisibleSurface *)local_538,(SurfaceInteraction *)&local_138.__align,
                       (CameraTransform *)
                       ((local_7b0->super_RayIntegrator).super_ImageTileIntegrator.camera.
                        super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                        .bits & 0xffffffffffff),(SampledSpectrum *)&local_668,lambda);
            *(undefined4 *)((local_1f8->albedo).values.values + 3) = local_538._64_4_;
            auVar132._4_4_ = local_538._4_4_;
            auVar132._0_4_ = local_538._0_4_;
            auVar132._8_4_ = local_538._8_4_;
            auVar132._12_4_ = local_538._12_4_;
            uVar126 = local_538._16_4_;
            auVar125 = auVar132;
            auVar384._16_4_ = uVar126;
            auVar384._0_16_ = auVar125;
            uVar127 = local_538._20_4_;
            auVar384._20_4_ = uVar127;
            uVar128 = local_538._24_4_;
            auVar384._24_4_ = uVar128;
            uVar129 = local_538._28_4_;
            in_ZmmResult._28_4_ = uVar129;
            in_ZmmResult._0_28_ = auVar384;
            uVar130 = local_538._32_4_;
            in_ZmmResult._32_4_ = uVar130;
            uVar131 = local_538._36_4_;
            in_ZmmResult._36_4_ = uVar131;
            in_ZmmResult._40_4_ = local_538._40_4_;
            in_ZmmResult._44_4_ = local_538._44_4_;
            in_ZmmResult._48_4_ = local_538._48_4_;
            in_ZmmResult._52_4_ = local_538._52_4_;
            in_ZmmResult._56_4_ = local_538._56_4_;
            in_ZmmResult._60_4_ = local_538._60_4_;
            uVar144 = auVar132._8_8_;
            local_1f8->set = (bool)(char)local_538._0_4_;
            *(int3 *)&local_1f8->field_0x1 = SUB43(local_538._0_4_,1);
            local_1f8->p = (Point3f)auVar132._4_12_;
            local_1f8->n = (Normal3f)auVar384._16_12_;
            local_1f8->ns = (Normal3f)in_ZmmResult._28_12_;
            local_1f8->time = (Float)local_538._40_4_;
            local_1f8->dzdx = (Float)local_538._44_4_;
            local_1f8->dzdy = (Float)local_538._48_4_;
            (local_1f8->albedo).values.values[0] = (float)local_538._52_4_;
            (local_1f8->albedo).values.values[1] = (float)local_538._56_4_;
            (local_1f8->albedo).values.values[2] = (float)local_538._60_4_;
          }
          auVar201 = in_ZMM13._0_16_;
          auVar168 = in_ZMM12._0_16_;
          auVar166 = in_ZMM10._0_16_;
          auVar169 = in_ZMM9._0_16_;
          auVar172 = in_ZMM8._0_16_;
          fVar192 = (float)(local_808._28_4_ + 1);
          uVar157 = 1;
          bVar163 = (int)local_808._28_4_ < local_7b0->maxDepth;
          local_808._28_4_ = fVar192;
          if (bVar163) {
            *(long *)(in_FS_OFFSET + -600) = *(long *)(in_FS_OFFSET + -600) + 1;
            if ((local_7b0->regularize == true) && (local_82b == true)) {
              *(long *)(in_FS_OFFSET + -0x288) = *(long *)(in_FS_OFFSET + -0x288) + 1;
              BSDF::Regularize(&local_1c0);
            }
            IVar149 = (Interval)local_808._16_8_;
            sVar108 = local_1c0.bxdf.
                      super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
                      .bits._6_2_;
            if (local_1c0.bxdf.
                super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
                .bits._4_4_ >> 0x11 < 3) {
              if ((ulong)local_1c0.bxdf.
                         super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
                         .bits < 0x3000000000000) {
                this_03 = (DiffuseBxDF *)
                          ((ulong)local_1c0.bxdf.
                                  super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
                                  .bits & 0xffffffffffff);
                if (sVar108 == 2) {
                  BVar140 = DiffuseBxDF::Flags(this_03);
                }
                else {
                  fVar192 = (this_03->R).values.values[0];
                  uVar144 = 0;
                  BVar140 = DiffuseReflection;
                  if ((fVar192 == 0.0) && (!NAN(fVar192))) {
                    uVar142 = 0xffffffffffffffff;
                    while (uVar142 != 2) {
                      fVar192 = (this_03->R).values.values[uVar142 + 2];
                      uVar142 = uVar142 + 1;
                      if ((fVar192 != 0.0) || (NAN(fVar192))) goto LAB_003d7b11;
                    }
                    uVar142 = 3;
LAB_003d7b11:
                    uVar144 = 0;
                    BVar140 = (uint)(uVar142 < 3) * 5;
                  }
                }
              }
              else {
                this_04 = (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *)
                          ((ulong)local_1c0.bxdf.
                                  super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
                                  .bits & 0xffffffffffff);
                if (sVar108 == 4) {
                  BVar140 = LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::Flags
                                      (this_04);
                  IVar149 = (Interval)local_808._16_8_;
                }
                else if (sVar108 == 3) {
                  BVar140 = LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::
                            Flags((LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>
                                   *)this_04);
                  IVar149 = (Interval)local_808._16_8_;
                }
                else {
                  auVar173 = vminss_avx(ZEXT416((uint)(this_04->top).mfDistrib.alpha_y),
                                        ZEXT416((uint)(this_04->top).mfDistrib.alpha_x));
                  uVar144 = auVar173._8_8_;
                  uVar141 = 0;
                  BVar140 = (uint)(auVar173._0_4_ < 0.001) * 8 + (GlossyTransmission|Reflection);
                }
              }
            }
            else if ((ulong)local_1c0.bxdf.
                            super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
                            .bits >> 0x33 == 0) {
              BVar140 = Unset;
              if (sVar108 == 7) {
                BVar140 = GlossyReflection;
              }
            }
            else if ((ulong)local_1c0.bxdf.
                            super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
                            .bits >> 0x30 == 8) {
              BVar140 = GlossyReflection;
            }
            else if (sVar108 == 9) {
              auVar173 = vminss_avx(ZEXT416(((uint *)((ulong)local_1c0.bxdf.
                                                                                                                          
                                                  super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
                                                  .bits & 0xffffffffffff))[1]),
                                    ZEXT416(*(uint *)((ulong)local_1c0.bxdf.
                                                                                                                          
                                                  super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
                                                  .bits & 0xffffffffffff)));
              uVar144 = auVar173._8_8_;
              uVar141 = 0;
              BVar140 = (uint)(auVar173._0_4_ < 0.001) * 8 + GlossyReflection;
            }
            else {
              BVar140 = DiffuseReflection;
            }
            if ((BVar140 & (Glossy|Diffuse)) != Unset) {
              local_1d8.
              super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
              .bits = (TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                       )(sampler->
                        super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                        ).bits;
              auVar312 = ZEXT856(uVar144);
              auVar255 = ZEXT856(uVar141);
              SVar382 = SampleLd(local_7b0,(Interaction *)&local_138.__align,&local_1c0,lambda,
                                 &local_1d8,&local_788,&local_7a8);
              auVar309._0_8_ = SVar382.values.values._8_8_;
              auVar309._8_56_ = auVar255;
              auVar246._0_8_ = SVar382.values.values._0_8_;
              auVar246._8_56_ = auVar312;
              auVar174 = vmovlhps_avx(auVar246._0_16_,auVar309._0_16_);
              auVar173 = *(undefined1 (*) [16])(lambda->pdf).values;
              uVar141 = vcmpps_avx512vl(auVar173,_DAT_00453010,4);
              auVar173 = vdivps_avx512vl(auVar174,auVar173);
              fVar368 = (float)((uint)((byte)uVar141 & 1) * auVar173._0_4_);
              fVar252 = (float)((uint)((byte)(uVar141 >> 1) & 1) * auVar173._4_4_);
              in_ZmmResult._4_4_ = fVar252;
              in_ZmmResult._0_4_ = fVar368;
              fVar251 = (float)((uint)((byte)(uVar141 >> 2) & 1) * auVar173._8_4_);
              in_ZmmResult._8_4_ = fVar251;
              fVar192 = (float)((uint)((byte)(uVar141 >> 3) & 1) * auVar173._12_4_);
              in_ZmmResult._12_4_ = fVar192;
              local_738.values.values[1] = fVar252 + local_738.values.values[1];
              local_738.values.values[0] = fVar368 + local_738.values.values[0];
              local_738.values.values[2] = fVar251 + local_738.values.values[2];
              local_738.values.values[3] = fVar192 + local_738.values.values[3];
            }
            auVar346 = local_138._0_64_;
            local_538._16_4_ = local_138._16_4_;
            local_538._20_4_ = local_138._20_4_;
            local_538._8_4_ = local_138._8_4_;
            local_538._12_4_ = local_138._12_4_;
            local_538._32_4_ = local_138._48_4_;
            local_538._24_4_ = local_138._40_4_;
            local_538._28_4_ = local_138._44_4_;
            local_538._44_4_ = *(undefined4 *)(local_170 + 8);
            local_538._36_4_ = (undefined4)*(undefined8 *)local_170;
            local_538._40_4_ = (undefined4)((ulong)*(undefined8 *)local_170 >> 0x20);
            local_5b8.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x =
                 (Interval)local_138.__align;
            local_5b8.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
            low = (Float)local_138._8_4_;
            local_5b8.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
            high = (Float)local_138._12_4_;
            local_5b8.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.
            low = (Float)local_138._16_4_;
            local_5b8.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.
            high = (Float)local_138._20_4_;
            local_5b8.n.super_Tuple3<pbrt::Normal3,_float>.x = (float)local_138._40_4_;
            local_5b8.n.super_Tuple3<pbrt::Normal3,_float>.y = (float)local_138._44_4_;
            local_5b8._32_8_ = CONCAT44(local_538._36_4_,local_138._48_4_);
            local_5b8.ns.super_Tuple3<pbrt::Normal3,_float>.z = (float)local_538._44_4_;
            local_5b8.ns.super_Tuple3<pbrt::Normal3,_float>.y = (float)local_538._40_4_;
            uVar5 = (((Vector3f *)((long)IVar149 + 0xc))->super_Tuple3<pbrt::Vector3,_float>).x;
            uVar7 = (((Vector3f *)((long)IVar149 + 0xc))->super_Tuple3<pbrt::Vector3,_float>).y;
            local_828._4_4_ = uVar7;
            local_828._0_4_ = uVar5;
            _fStack_820 = 0;
            register0x00001200 = ZEXT416((uint)*(float *)((long)IVar149 + 0x14));
            uVar141 = (sampler->
                      super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                      ).bits;
            local_538._0_4_ = (undefined4)uVar141;
            local_538._4_4_ = (undefined4)(uVar141 >> 0x20);
            in_ZMM8 = ZEXT1664(auVar172);
            in_ZMM9 = ZEXT1664(auVar169);
            in_ZMM10 = ZEXT1664(auVar166);
            in_ZMM12 = ZEXT1664(auVar168);
            in_ZMM13 = ZEXT1664(auVar201);
            local_138._0_64_ = auVar346;
            FVar191 = DispatchSplit<9>::operator()
                                ((DispatchSplit<9> *)&local_668,local_538,uVar141 >> 0x30);
            local_558._0_4_ = FVar191;
            uVar141 = (sampler->
                      super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                      ).bits;
            pDVar150 = (DebugMLTSampler *)(uVar141 & 0xffffffffffff);
            sVar108 = (short)(uVar141 >> 0x30);
            if (uVar141 < 0x5000000000000) {
              if (uVar141 < 0x3000000000000) {
                if (sVar108 == 2) {
                  TVar195 = (Tuple2<pbrt::Point2,_float>)
                            StratifiedSampler::Get2D((StratifiedSampler *)pDVar150);
                }
                else {
                  TVar195 = (Tuple2<pbrt::Point2,_float>)
                            RandomSampler::Get2D((RandomSampler *)pDVar150);
                }
              }
              else if (sVar108 == 3) {
                TVar195 = (Tuple2<pbrt::Point2,_float>)
                          HaltonSampler::Get2D((HaltonSampler *)pDVar150);
              }
              else {
                TVar195 = (Tuple2<pbrt::Point2,_float>)
                          PaddedSobolSampler::Get2D((PaddedSobolSampler *)pDVar150);
              }
            }
            else if (uVar141 < 0x7000000000000) {
              if (sVar108 == 6) {
                TVar195 = (Tuple2<pbrt::Point2,_float>)
                          ZSobolSampler::Get2D((ZSobolSampler *)pDVar150);
              }
              else {
                TVar195 = (Tuple2<pbrt::Point2,_float>)SobolSampler::Get2D((SobolSampler *)pDVar150)
                ;
              }
            }
            else if (uVar141 >> 0x30 == 8) {
              TVar195 = (Tuple2<pbrt::Point2,_float>)MLTSampler::Get2D((MLTSampler *)pDVar150);
            }
            else if (sVar108 == 7) {
              TVar195 = (Tuple2<pbrt::Point2,_float>)
                        PMJ02BNSampler::Get2D((PMJ02BNSampler *)pDVar150);
            }
            else {
              local_7c8._0_4_ = DebugMLTSampler::Get1D(pDVar150);
              local_7c8._4_4_ = extraout_XMM0_Db_05;
              local_7c8._8_4_ = extraout_XMM0_Dc_05;
              local_7c8._12_4_ = extraout_XMM0_Dd_05;
              auVar247._0_4_ = DebugMLTSampler::Get1D(pDVar150);
              auVar247._4_60_ = extraout_var_02;
              auVar172 = vinsertps_avx(local_7c8,auVar247._0_16_,0x10);
              TVar195 = auVar172._0_8_;
            }
            auVar224._0_8_ = local_828 ^ 0x8000000080000000;
            auVar224._8_4_ = local_828._8_4_ ^ 0x80000000;
            auVar224._12_4_ = local_828._12_4_ ^ 0x80000000;
            woRender.super_Tuple3<pbrt::Vector3,_float>.z = -local_808._32_4_;
            auVar290._0_8_ = local_808._32_8_ ^ 0x8000000080000000;
            auVar290._8_4_ = local_808._40_4_ ^ 0x80000000;
            auVar290._12_4_ = local_808._44_4_ ^ 0x80000000;
            woRender.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)auVar224._0_8_;
            woRender.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)(auVar224._0_8_ >> 0x20);
            _local_828 = auVar224;
            unique0x1000c80a = auVar290;
            BSDF::Sample_f((optional<pbrt::BSDFSample> *)&local_588.__align,&local_1c0,woRender,
                           (Float)local_558._0_4_,(Point2f)TVar195,Radiance,All);
            auVar172 = _local_828;
            auVar173 = in_ZMM13._0_16_;
            auVar201 = in_ZMM12._0_16_;
            auVar168 = in_ZMM10._0_16_;
            auVar166 = in_ZMM9._0_16_;
            auVar169 = in_ZMM8._0_16_;
            uVar157 = 3;
            if (local_55c != '\0') {
              auVar174 = vfmadd132ss_fma(ZEXT416((uint)local_138._132_4_),
                                         ZEXT416((uint)((float)local_138._136_4_ *
                                                       (float)local_588._24_4_)),
                                         ZEXT416((uint)local_588._20_4_));
              auVar170 = vfmsub213ss_fma(ZEXT416((uint)local_588._24_4_),
                                         ZEXT416((uint)local_138._136_4_),
                                         ZEXT416((uint)((float)local_138._136_4_ *
                                                       (float)local_588._24_4_)));
              auVar174 = vfmadd231ss_fma(ZEXT416((uint)(auVar174._0_4_ + auVar170._0_4_)),
                                         ZEXT416((uint)local_138._128_4_),
                                         ZEXT416((uint)local_588._16_4_));
              uVar194 = auVar174._0_4_;
              auVar225._4_4_ = uVar194;
              auVar225._0_4_ = uVar194;
              auVar225._8_4_ = uVar194;
              auVar225._12_4_ = uVar194;
              auVar28._8_4_ = 0x7fffffff;
              auVar28._0_8_ = 0x7fffffff7fffffff;
              auVar28._12_4_ = 0x7fffffff;
              auVar174 = vandps_avx512vl(auVar225,auVar28);
              local_788.values.values[0] =
                   auVar174._0_4_ * (float)local_588.__align * local_788.values.values[0];
              local_788.values.values[1] =
                   auVar174._4_4_ * (float)local_588._4_4_ * local_788.values.values[1];
              local_788.values.values[2] =
                   auVar174._8_4_ * (float)local_588._8_4_ * local_788.values.values[2];
              local_788.values.values[3] =
                   auVar174._12_4_ * (float)local_588._12_4_ * local_788.values.values[3];
              local_6f8.values.values = local_7a8.values.values;
              uVar194 = local_588._28_4_;
              if (local_588.__data[0x28] == '\x01') {
                wiRender.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_588._20_4_;
                wiRender.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_588._16_4_;
                wiRender.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_588._24_4_;
                woRender_00.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_808._32_4_;
                woRender_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_828._0_4_;
                woRender_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_828._4_4_;
                auVar170 = ZEXT416((uint)local_588._24_4_);
                _local_828 = auVar172;
                uVar194 = BSDF::PDF(&local_1c0,woRender_00,wiRender,Radiance,All);
                if (local_55c == '\0') {
                  LogFatal<char_const(&)[4]>
                            (Fatal,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                             ,0xea,"Check failed: %s",(char (*) [4])0x287813c);
                }
                fVar192 = (float)uVar194 / (float)local_588._28_4_;
                local_788.values.values[0] = fVar192 * local_788.values.values[0];
                local_788.values.values[1] = fVar192 * local_788.values.values[1];
                local_788.values.values[2] = fVar192 * local_788.values.values[2];
                local_788.values.values[3] = fVar192 * local_788.values.values[3];
              }
              local_7a8.values.values[1] = (float)uVar194 * local_7a8.values.values[1];
              local_7a8.values.values[0] = (float)uVar194 * local_7a8.values.values[0];
              local_7a8.values.values[2] = (float)uVar194 * local_7a8.values.values[2];
              local_7a8.values.values[3] = (float)uVar194 * local_7a8.values.values[3];
              Rescale(&local_788,&local_7a8,&local_6f8);
              uVar253 = local_808._16_8_;
              if (local_55c == '\0') {
                LogFatal<char_const(&)[4]>
                          (Fatal,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                           ,0xea,"Check failed: %s",(char (*) [4])0x287813c);
              }
              local_82c = SUB41((local_588._32_4_ & 0x10) >> 4,0);
              local_82b = (bool)(local_82b | (local_588._32_4_ & 0x10) == 0);
              bVar163 = (local_588._32_4_ & 2) == 0;
              wi.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_588._20_4_;
              wi.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_588._16_4_;
              wi.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_588._24_4_;
              local_828._0_4_ = local_588._36_4_;
              SurfaceInteraction::SpawnRay
                        ((RayDifferential *)local_538,(SurfaceInteraction *)&local_138.__align,
                         (RayDifferential *)local_808._16_8_,&local_1c0,wi,local_588._32_4_,
                         (Float)local_588._36_4_);
              (((Vector3f *)(uVar253 + 0xc))->super_Tuple3<pbrt::Vector3,_float>).x =
                   (float)local_538._12_4_;
              (((Vector3f *)(uVar253 + 0xc))->super_Tuple3<pbrt::Vector3,_float>).y =
                   (float)local_538._16_4_;
              *(ulong *)(uVar253 + 0x14) = CONCAT44(local_538._24_4_,local_538._20_4_);
              *(ulong *)uVar253 = CONCAT44(local_538._4_4_,local_538._0_4_);
              *(ulong *)(uVar253 + 8) = CONCAT44(local_538._12_4_,local_538._8_4_);
              (((MediumHandle *)(uVar253 + 0x20))->
              super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
              ).bits = CONCAT44(local_538._36_4_,local_538._32_4_);
              *(ulong *)(local_200 + 0x14) = CONCAT44(local_538._64_4_,local_538._60_4_);
              (((Vector3f *)(local_200 + 0x1c))->super_Tuple3<pbrt::Vector3,_float>).x =
                   (float)local_538._68_4_;
              (((Vector3f *)(local_200 + 0x1c))->super_Tuple3<pbrt::Vector3,_float>).y =
                   (float)local_538._72_4_;
              *(ulong *)(local_200 + 0x24) = CONCAT44(local_538._80_4_,local_538._76_4_);
              *(ulong *)(local_200 + 0x2c) = CONCAT44(local_538._88_4_,local_538._84_4_);
              *(ulong *)local_200 = CONCAT44(local_538._44_4_,local_538._40_4_);
              *(ulong *)(local_200 + 8) = CONCAT44(local_538._52_4_,local_538._48_4_);
              (((Point3f *)(local_200 + 0x10))->super_Tuple3<pbrt::Point3,_float>).x =
                   (float)local_538._56_4_;
              (((Point3f *)(local_200 + 0x10))->super_Tuple3<pbrt::Point3,_float>).y =
                   (float)local_538._60_4_;
              *(ulong *)(local_200 + 0x18) = CONCAT44(local_538._68_4_,local_538._64_4_);
              local_1e0 = (undefined1  [8])
                          (local_7b0->super_RayIntegrator).super_ImageTileIntegrator.camera.
                          super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                          .bits;
              auVar346 = ZEXT1664(auVar170);
              in_ZMM8 = ZEXT1664(auVar169);
              in_ZMM9 = ZEXT1664(auVar166);
              in_ZMM10 = ZEXT1664(auVar168);
              in_ZMM12 = ZEXT1664(auVar201);
              in_ZMM13 = ZEXT1664(auVar173);
              SurfaceInteraction::GetBSSRDF
                        ((SurfaceInteraction *)local_808,(RayDifferential *)&local_138.__align,
                         (SampledWavelengths *)uVar253,(CameraHandle *)lambda,
                         (ScratchBuffer *)local_1e0);
              pSVar136 = local_7d8;
              fVar192 = local_188._0_4_ * (float)local_828._0_4_ * (float)local_828._0_4_;
              auVar190._16_48_ = in_ZmmResult._16_48_;
              auVar190._0_16_ = ZEXT416((uint)fVar192);
              in_ZmmResult._4_60_ = auVar190._4_60_;
              in_ZmmResult._0_4_ =
                   (float)((uint)bVar163 * (int)local_188._0_4_ + (uint)!bVar163 * (int)fVar192);
              local_188 = in_ZmmResult._0_16_;
              if ((CONCAT44(local_808._4_4_,local_808._0_4_) & 0xffffffffffff) != 0) {
                if (local_55c == '\0') {
                  LogFatal<char_const(&)[4]>
                            (Fatal,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                             ,0xea,"Check failed: %s",(char (*) [4])0x287813c);
                }
                if ((local_588._32_4_ & 2) != 0) {
                  uVar141 = (local_7d8->
                            super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                            ).bits;
                  local_538._0_4_ = (undefined4)uVar141;
                  local_538._4_4_ = (undefined4)(uVar141 >> 0x20);
                  FVar191 = DispatchSplit<9>::operator()
                                      ((DispatchSplit<9> *)&local_668,
                                       (optional<pbrt::ShapeIntersection> *)local_538,
                                       uVar141 >> 0x30);
                  local_828._0_4_ = FVar191;
                  uVar141 = (pSVar136->
                            super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                            ).bits;
                  pDVar150 = (DebugMLTSampler *)(uVar141 & 0xffffffffffff);
                  sVar108 = (short)(uVar141 >> 0x30);
                  if (uVar141 < 0x5000000000000) {
                    if (uVar141 < 0x3000000000000) {
                      if (sVar108 == 2) {
                        TVar195 = (Tuple2<pbrt::Point2,_float>)
                                  StratifiedSampler::Get2D((StratifiedSampler *)pDVar150);
                      }
                      else {
                        TVar195 = (Tuple2<pbrt::Point2,_float>)
                                  RandomSampler::Get2D((RandomSampler *)pDVar150);
                      }
                    }
                    else if (sVar108 == 3) {
                      TVar195 = (Tuple2<pbrt::Point2,_float>)
                                HaltonSampler::Get2D((HaltonSampler *)pDVar150);
                    }
                    else {
                      TVar195 = (Tuple2<pbrt::Point2,_float>)
                                PaddedSobolSampler::Get2D((PaddedSobolSampler *)pDVar150);
                    }
                  }
                  else if (uVar141 < 0x7000000000000) {
                    if (sVar108 == 6) {
                      TVar195 = (Tuple2<pbrt::Point2,_float>)
                                ZSobolSampler::Get2D((ZSobolSampler *)pDVar150);
                    }
                    else {
                      TVar195 = (Tuple2<pbrt::Point2,_float>)
                                SobolSampler::Get2D((SobolSampler *)pDVar150);
                    }
                  }
                  else if (uVar141 >> 0x30 == 8) {
                    TVar195 = (Tuple2<pbrt::Point2,_float>)MLTSampler::Get2D((MLTSampler *)pDVar150)
                    ;
                  }
                  else if (sVar108 == 7) {
                    TVar195 = (Tuple2<pbrt::Point2,_float>)
                              PMJ02BNSampler::Get2D((PMJ02BNSampler *)pDVar150);
                  }
                  else {
                    local_808._32_4_ = DebugMLTSampler::Get1D(pDVar150);
                    fStack_7e4 = extraout_XMM0_Db_06;
                    fStack_7e0 = (float)extraout_XMM0_Dc_06;
                    fStack_7dc = (float)extraout_XMM0_Dd_06;
                    auVar248._0_4_ = DebugMLTSampler::Get1D(pDVar150);
                    auVar248._4_60_ = extraout_var_03;
                    auVar172 = vinsertps_avx(stack0xfffffffffffff818,auVar248._0_16_,0x10);
                    TVar195 = auVar172._0_8_;
                  }
                  TabulatedBSSRDF::SampleSp
                            ((optional<pbrt::BSSRDFProbeSegment> *)local_728,
                             (TabulatedBSSRDF *)
                             (CONCAT44(local_808._4_4_,local_808._0_4_) & 0xffffffffffff),
                             (Float)local_828._0_4_,(Point2f)TVar195);
                  uVar157 = 3;
                  if (local_710 != false) {
                    uVar141 = (local_7d8->
                              super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                              ).bits;
                    local_538._0_4_ = (undefined4)uVar141;
                    local_538._4_4_ = (undefined4)(uVar141 >> 0x20);
                    FVar191 = DispatchSplit<9>::operator()
                                        ((DispatchSplit<9> *)&local_668,
                                         (optional<pbrt::ShapeIntersection> *)local_538,
                                         uVar141 >> 0x30);
                    auVar367 = _local_368;
                    in_ZmmResult = ZEXT1664(ZEXT816(0) << 0x40);
                    local_668.rng = (RNG *)0x0;
                    local_668.sampler = (SamplerHandle *)0x0;
                    local_668.ray = (RayDifferential *)0x0;
                    local_668.prevIntrContext = (LightSampleContext *)0x0;
                    local_668.T_hat = (SampledSpectrum *)0x0;
                    local_668.terminated = (bool *)0x0;
                    local_668.uniPathPDF = (SampledSpectrum *)0x0;
                    local_668.lightPathPDF = (SampledSpectrum *)0x0;
                    local_668.depth = (int *)0x0;
                    local_668.this = (VolPathIntegrator *)0x0;
                    local_668.L = (SampledSpectrum *)0x0;
                    local_668.lambda = (SampledWavelengths *)0x0;
                    if (local_710 == false) {
                      LogFatal<char_const(&)[4]>
                                (Fatal,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                                 ,0xea,"Check failed: %s",(char (*) [4])0x287813c);
                    }
                    uVar141 = (ulong)((uint)FVar191 >> 0x1f ^ (uint)FVar191) * 0x7fb5d329728ea185;
                    uVar141 = (uVar141 >> 0x1b ^ uVar141) * -0x7e25210b43d22bb3;
                    uVar144 = uVar141 >> 0x21 ^ uVar141;
                    lVar151 = uVar144 * 2 + 1;
                    uVar141 = (uVar141 >> 0x1f ^ uVar144) * 0x7fb5d329728ea185;
                    uVar141 = (uVar141 >> 0x1b ^ uVar141) * -0x7e25210b43d22bb3;
                    uVar141 = (uVar141 >> 0x21 ^ uVar141) * 0x5851f42d4c957f2d +
                              lVar151 * 0x5851f42d4c957f2e;
                    auVar226._4_4_ = local_728._4_4_;
                    auVar226._0_4_ = local_728._0_4_;
                    auVar326._4_4_ = local_728._8_4_;
                    auVar326._0_4_ = local_728._8_4_;
                    auVar326._8_4_ = local_728._8_4_;
                    auVar326._12_4_ = local_728._8_4_;
                    auVar226._8_8_ = 0;
                    auVar172 = vpshufd_avx(auVar226,0x50);
                    IVar149 = (Interval)vmovlps_avx(auVar326);
                    uStack_32c = auVar367._60_4_;
                    _local_368 = ZEXT2860(CONCAT424(*(Float *)(local_808._16_8_ + 0x18),
                                                    CONCAT816(IVar149,auVar172)));
                    local_328 = (undefined1  [16])0x0;
                    _local_828 = (undefined1  [16])0x0;
                    do {
                      if (local_710 == false) {
                        LogFatal<char_const(&)[4]>
                                  (Fatal,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                                   ,0xea,"Check failed: %s",(char (*) [4])0x287813c);
                      }
                      auVar346 = ZEXT1664(auVar346._0_16_);
                      in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
                      in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
                      in_ZMM10 = ZEXT1664(in_ZMM10._0_16_);
                      in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
                      in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
                      Interaction::SpawnRayTo
                                ((Ray *)local_418,(Interaction *)local_368,
                                 (Point3f *)(local_728 + 0xc));
                      if (((float)local_418._12_4_ == 0.0) && ((float)local_418._16_4_ == 0.0)) {
                        if (((float)local_418._20_4_ != 0.0) || (NAN((float)local_418._20_4_)))
                        goto LAB_003d836d;
                        cVar164 = '\0';
                      }
                      else {
LAB_003d836d:
                        *(long *)(in_FS_OFFSET + -0x298) = *(long *)(in_FS_OFFSET + -0x298) + 1;
                        if (((local_1f0->
                             super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                             ).bits & 0xffffffffffff) == 0) {
                          in_ZmmResult = ZEXT464(0) << 0x20;
                          auStack_4a0[5] = in_ZmmResult._0_8_;
                          auStack_4a0[5] = 0;
                          auStack_4a0[6] = 0;
                          auStack_4a0[7] = 0;
                          auStack_4a0[8] = 0;
                          auStack_4a0[9] = 0;
                          auStack_4a0[10] = 0;
                          auStack_4a0[0xb] = 0;
                          auStack_4a0[0xc] = (MediumInterface *)0x0;
                          local_4b8.bits._0_4_ = in_ZmmResult._0_4_;
                          local_538._0_4_ = (anon_struct_4_0_00000001_for___align)0x0;
                          local_4b8.bits._4_4_ = 0.0;
                          uStack_4b0 = 0.0;
                          uStack_4ac._0_4_ = 0.0;
                          local_538._72_8_ = (float **)0x0;
                          uStack_4ac._4_4_ = 0.0;
                          uStack_4a4 = 0.0;
                          auStack_4a0[0]._0_4_ = 0.0;
                          auStack_4a0[0]._4_4_ = 0.0;
                          auStack_4a0[1]._0_4_ = 0.0;
                          auStack_4a0[1]._4_4_ = 0.0;
                          auStack_4a0._16_16_ = (undefined1  [16])0x0;
                          local_538._80_4_ = 0.0;
                          local_538._84_4_ = 0.0;
                          local_538._92_4_ = 0.0;
                          local_538._96_4_ = 0.0;
                          local_538._40_4_ = 0.0;
                          local_538._44_4_ = 0.0;
                          local_538._48_4_ = 0.0;
                          local_538._52_4_ = 0.0;
                          local_538._56_4_ = 0.0;
                          local_538._60_4_ = 0.0;
                          local_438 = 0;
                          local_538._4_4_ = local_4b8.bits._4_4_;
                          local_538._8_4_ = uStack_4b0;
                          local_538._12_4_ = (undefined4)uStack_4ac;
                          local_538._16_4_ = local_538._80_4_;
                          local_538._20_4_ = local_538._84_4_;
                          local_538._24_4_ = (undefined4)auStack_4a0[0];
                          local_538._28_4_ = auStack_4a0[0]._4_4_;
                          local_538._32_4_ = (undefined4)auStack_4a0[1];
                          local_538._36_4_ = auStack_4a0[1]._4_4_;
                          local_538._64_4_ = local_538._0_4_;
                          local_538._68_4_ = local_4b8.bits._4_4_;
                          local_538._88_4_ = (undefined4)auStack_4a0[0];
                          local_538._100_4_ = auStack_4a0[1]._4_4_;
                          local_538._104_16_ = auStack_4a0._16_16_;
                          local_538._120_8_ = auStack_4a0[0xc];
                          local_4b8.bits._0_4_ = local_538._0_4_;
                          auStack_4a0[4] = auStack_4a0[0xc];
                        }
                        else {
                          PrimitiveHandle::Intersect
                                    ((optional<pbrt::ShapeIntersection> *)local_538,local_1f0,
                                     (Ray *)local_418,1.0);
                        }
                        cVar164 = local_438._0_1_;
                        if (local_438._0_1_ != false) {
                          in_ZmmResult._4_4_ = (float)local_538._4_4_;
                          in_ZmmResult._0_4_ = (float)local_538._0_4_;
                          in_ZmmResult._8_4_ = (float)local_538._8_4_;
                          in_ZmmResult._12_4_ = (float)local_538._12_4_;
                          in_ZmmResult._16_4_ = local_538._16_4_;
                          in_ZmmResult._20_4_ = local_538._20_4_;
                          in_ZmmResult._24_4_ = local_538._24_4_;
                          in_ZmmResult._28_4_ = local_538._28_4_;
                          in_ZmmResult._32_4_ = local_538._32_4_;
                          in_ZmmResult._36_4_ = local_538._36_4_;
                          in_ZmmResult._40_4_ = local_538._40_4_;
                          in_ZmmResult._44_4_ = local_538._44_4_;
                          in_ZmmResult._48_4_ = local_538._48_4_;
                          in_ZmmResult._52_4_ = local_538._52_4_;
                          in_ZmmResult._56_4_ = local_538._56_4_;
                          in_ZmmResult._60_4_ = local_538._60_4_;
                          _local_368 = in_ZmmResult;
                          local_328._4_4_ = local_538._68_4_;
                          local_328._0_4_ = local_538._64_4_;
                          local_328._8_8_ = local_538._72_8_;
                          if (auStack_4a0[5] == local_138._192_8_) {
                            auStack_6d0._8_4_ = local_538._16_4_;
                            auStack_6d0._12_4_ = local_538._20_4_;
                            local_6d8._0_4_ = local_538._0_4_;
                            local_6d8._4_4_ = local_538._4_4_;
                            auStack_6d0._0_4_ = local_538._8_4_;
                            auStack_6d0._4_4_ = local_538._12_4_;
                            FStack_6b8 = (Float)local_538._48_4_;
                            auStack_6d0._16_8_ = CONCAT44(local_538._44_4_,local_538._40_4_);
                            fStack_6ac = *(float *)&local_3b0[1].bits;
                            uStack_6b4 = local_3b0->bits;
                            fStack_6a0 = (float)local_538._88_4_;
                            pSStack_6a8 = (SampledSpectrum *)
                                          CONCAT44(local_538._84_4_,local_538._80_4_);
                            fStack_694 = (float)local_538._100_4_;
                            fStack_69c = (float)local_538._92_8_;
                            fStack_698 = SUB84(local_538._92_8_,4);
                            FStack_688 = *(Float *)(local_208 + 1);
                            pSStack_690 = (SamplerHandle *)*local_208;
                            TStack_684.z = *(float *)(local_210 + 1);
                            uVar253 = *local_210;
                            TStack_684.x = (float)uVar253;
                            TStack_684.y = SUB84(uVar253,4);
                            fVar192 = (float)local_828._0_4_ + 1.0;
                            _local_828 = ZEXT416((uint)fVar192);
                            uVar157 = (uint)(uVar141 >> 0x2d) ^ (uint)(uVar141 >> 0x1b);
                            bVar143 = (byte)(uVar141 >> 0x3b);
                            auVar172 = vcvtusi2ss_avx512f(auVar346._0_16_,
                                                          uVar157 >> bVar143 |
                                                          uVar157 << 0x20 - bVar143);
                            auVar172 = vminss_avx(ZEXT416((uint)(auVar172._0_4_ * 2.3283064e-10)),
                                                  ZEXT416(0x3f7fffff));
                            if (auVar172._0_4_ < 1.0 / fVar192) {
                              auVar113._8_4_ = local_538._8_4_;
                              auVar113._0_8_ =
                                   (SampledSpectrum *)CONCAT44(local_538._4_4_,local_538._0_4_);
                              auVar113._12_4_ = local_538._12_4_;
                              auVar114._16_4_ = local_538._16_4_;
                              auVar114._0_16_ = auVar113;
                              auVar114._20_4_ = local_538._20_4_;
                              auVar115._24_8_ = auStack_6d0._16_8_;
                              auVar115._0_24_ = auVar114;
                              auVar115._32_4_ = local_538._48_4_;
                              auVar115._36_8_ = uStack_6b4;
                              auVar116._44_4_ = fStack_6ac;
                              auVar116._0_44_ = auVar115;
                              in_ZmmResult._48_8_ = pSStack_6a8;
                              in_ZmmResult._0_48_ = auVar116;
                              in_ZmmResult._56_4_ = local_538._88_4_;
                              in_ZmmResult._60_4_ = fStack_69c;
                              auVar118._4_8_ = uStack_6b4;
                              auVar118._0_4_ = local_538._48_4_;
                              auVar118._12_4_ = fStack_6ac;
                              auVar118._16_8_ = pSStack_6a8;
                              auVar118._24_4_ = local_538._88_4_;
                              auVar118._28_4_ = fStack_69c;
                              auVar118._32_4_ = fStack_698;
                              auVar118._36_4_ = local_538._100_4_;
                              auVar119._40_8_ = pSStack_690;
                              auVar119._0_40_ = auVar118;
                              auVar119._48_4_ = *(Float *)(local_208 + 1);
                              auVar119._52_4_ = (float)uVar253;
                              auVar119._56_4_ = SUB84(uVar253,4);
                              auVar117._60_4_ = *(float *)(local_210 + 1);
                              auVar117._0_60_ = auVar119;
                              local_668.rng = auVar118._32_8_;
                              local_668.sampler = pSStack_690;
                              local_668.ray = auVar119._48_8_;
                              local_668.prevIntrContext = auVar117._56_8_;
                              local_668.T_hat =
                                   (SampledSpectrum *)CONCAT44(local_538._4_4_,local_538._0_4_);
                              local_668.terminated = auVar113._8_8_;
                              local_668.uniPathPDF = auVar114._16_8_;
                              local_668.lightPathPDF = (SampledSpectrum *)auStack_6d0._16_8_;
                              local_668.depth = auVar115._32_8_;
                              local_668.this = auVar116._40_8_;
                              local_668.L = pSStack_6a8;
                              local_668.lambda = in_ZmmResult._56_8_;
                            }
                            uVar141 = uVar141 * 0x5851f42d4c957f2d + lVar151;
                          }
                        }
                        if (local_438._0_1_ != false) {
                          local_438 = local_438 & 0xffffffffffffff00;
                        }
                      }
                      lambda = local_790;
                    } while (cVar164 != '\0');
                    uVar157 = 3;
                    if (0.0 < (float)local_828._0_4_) {
                      auVar120._8_8_ = local_668.terminated;
                      auVar120._0_8_ = local_668.T_hat;
                      auVar120._16_8_ = local_668.uniPathPDF;
                      auVar120._24_8_ = local_668.lightPathPDF;
                      auVar120._32_8_ = local_668.depth;
                      auVar120._40_8_ = local_668.this;
                      auVar120._48_8_ = local_668.L;
                      auVar120._56_8_ = local_668.lambda;
                      auVar346 = vmovdqu64_avx512f(auVar120);
                      in_ZmmResult._8_8_ = local_668.this;
                      in_ZmmResult._0_8_ = local_668.depth;
                      in_ZmmResult._16_8_ = local_668.L;
                      in_ZmmResult._24_8_ = local_668.lambda;
                      in_ZmmResult._32_8_ = local_668.rng;
                      in_ZmmResult._40_8_ = local_668.sampler;
                      in_ZmmResult._48_8_ = local_668.ray;
                      in_ZmmResult._56_8_ = local_668.prevIntrContext;
                      fStack_698 = SUB84(local_668.rng,0);
                      fStack_694 = (float)((ulong)local_668.rng >> 0x20);
                      pSStack_690 = local_668.sampler;
                      FStack_688 = SUB84(local_668.ray,0);
                      TStack_684._0_8_ = in_ZmmResult._52_8_;
                      TStack_684.z = (float)((ulong)local_668.prevIntrContext >> 0x20);
                      auVar346 = vmovdqu64_avx512f(auVar346);
                      local_6d8._0_4_ = auVar346._0_4_;
                      local_6d8._4_4_ = auVar346._4_4_;
                      auStack_6d0._0_4_ = auVar346._8_4_;
                      auStack_6d0._4_4_ = auVar346._12_4_;
                      auStack_6d0._8_4_ = auVar346._16_4_;
                      auStack_6d0._12_4_ = auVar346._20_4_;
                      auStack_6d0._16_8_ = auVar346._24_8_;
                      FStack_6b8 = auVar346._32_4_;
                      uStack_6b4 = auVar346._36_8_;
                      fStack_6ac = auVar346._44_4_;
                      pSStack_6a8 = auVar346._48_8_;
                      fStack_6a0 = auVar346._56_4_;
                      fStack_69c = auVar346._60_4_;
                      uVar141 = CONCAT44(local_808._4_4_,local_808._0_4_);
                      in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
                      in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
                      in_ZMM10 = ZEXT1664(in_ZMM10._0_16_);
                      in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
                      in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
                      bxdf = (NormalizedFresnelBxDF *)ScratchBuffer::Alloc(local_3a8,4,4);
                      TabulatedBSSRDF::ProbeIntersectionToSample
                                ((BSSRDFSample *)local_418,
                                 (TabulatedBSSRDF *)(uVar141 & 0xffffffffffff),
                                 (SubsurfaceInteraction *)local_6d8,bxdf);
                      pTVar137 = local_3b0;
                      this_00 = local_7b0;
                      auVar201 = in_ZMM13._0_16_;
                      auVar168 = in_ZMM12._0_16_;
                      auVar166 = in_ZMM10._0_16_;
                      auVar169 = in_ZMM9._0_16_;
                      auVar172 = in_ZMM8._0_16_;
                      bVar163 = true;
                      if (((float)local_418._0_4_ == 0.0) && (!NAN((float)local_418._0_4_))) {
                        uVar141 = 0;
                        while (uVar144 = uVar141, uVar144 != 3) {
                          if ((*(float *)(local_418 + uVar144 * 4 + 4) != 0.0) ||
                             (uVar141 = uVar144 + 1, NAN(*(float *)(local_418 + uVar144 * 4 + 4))))
                          break;
                        }
                        bVar163 = uVar144 < 3;
                      }
                      uVar157 = 3;
                      if (bVar163) {
                        if (((float)local_418._16_4_ != 0.0) || (NAN((float)local_418._16_4_))) {
                          auVar292._0_4_ = (float)local_828._0_4_ * (float)local_418._0_4_;
                          auVar292._4_4_ = (float)local_828._0_4_ * (float)local_418._4_4_;
                          auVar292._8_4_ = (float)local_828._0_4_ * (float)local_418._8_4_;
                          auVar292._12_4_ = (float)local_828._0_4_ * (float)local_418._12_4_;
                          auVar228._4_4_ = local_418._16_4_;
                          auVar228._0_4_ = local_418._16_4_;
                          auVar228._8_4_ = local_418._16_4_;
                          auVar228._12_4_ = local_418._16_4_;
                          auVar173 = vdivps_avx(auVar292,auVar228);
                          local_788.values.values[0] = auVar173._0_4_ * local_788.values.values[0];
                          local_788.values.values[1] = auVar173._4_4_ * local_788.values.values[1];
                          local_788.values.values[2] = auVar173._8_4_ * local_788.values.values[2];
                          local_788.values.values[3] = auVar173._12_4_ * local_788.values.values[3];
                          local_4b8.bits._0_4_ = (anon_struct_4_0_00000001_for___align)0x0;
                          local_538._64_4_ = (undefined4)local_4b8.bits;
                          in_ZmmResult._16_48_ = (undefined1  [48])0x0;
                          auStack_4a0[5] = 0;
                          auStack_4a0[6] = 0;
                          auStack_4a0[7] = 0;
                          auStack_4a0[8] = 0;
                          auStack_4a0[9] = 0;
                          auStack_4a0[10] = 0;
                          auStack_4a0[0xb] = 0;
                          local_4b8.bits._4_4_ = 0.0;
                          local_538._68_4_ = local_4b8.bits._4_4_;
                          uStack_4b0 = 0.0;
                          local_538._72_4_ = uStack_4b0;
                          uStack_4ac._0_4_ = 0.0;
                          local_538._76_4_ = (undefined4)uStack_4ac;
                          uStack_4ac._4_4_ = 0.0;
                          uStack_4a4 = 0.0;
                          auStack_4a0[0]._0_4_ = 0.0;
                          auStack_4a0[0]._4_4_ = 0.0;
                          auStack_4a0[1]._0_4_ = 0.0;
                          auStack_4a0[1]._4_4_ = 0.0;
                          auStack_4a0._16_16_ = (undefined1  [16])0x0;
                          local_538._104_16_ = auStack_4a0._16_16_;
                          auStack_4a0[4] = (MediumInterface *)0x0;
                          local_538._120_8_ = auStack_4a0[4];
                          local_538._24_4_ = 0.0;
                          local_538._52_4_ = 0.0;
                          local_538._56_4_ = 0.0;
                          local_538._16_4_ = auStack_6d0._8_4_;
                          local_538._20_4_ = auStack_6d0._12_4_;
                          local_538._0_4_ = local_6d8._0_4_;
                          local_538._4_4_ = local_6d8._4_4_;
                          local_538._8_4_ = auStack_6d0._0_4_;
                          local_538._12_4_ = auStack_6d0._4_4_;
                          local_538._48_4_ = FStack_6b8;
                          local_538._40_4_ = (undefined4)auStack_6d0._16_8_;
                          local_538._44_4_ = SUB84(auStack_6d0._16_8_,4);
                          local_538._88_4_ = fStack_6a0;
                          local_538._80_4_ = SUB84(pSStack_6a8,0);
                          local_538._84_4_ = (undefined4)((ulong)pSStack_6a8 >> 0x20);
                          local_538._100_4_ = fStack_694;
                          local_538._96_4_ = fStack_698;
                          local_538._92_4_ = fStack_69c;
                          *(float *)&local_3b0[1].bits = fStack_6ac;
                          pTVar137->bits = uStack_6b4;
                          puVar138 = local_208;
                          *(Float *)(local_208 + 1) = FStack_688;
                          *puVar138 = pSStack_690;
                          puVar138 = local_210;
                          *(float *)(local_210 + 1) = TStack_684.z;
                          *puVar138 = TStack_684._0_8_;
                          local_538._36_4_ = local_3c0;
                          local_538._28_4_ = (undefined4)local_3c8;
                          local_538._32_4_ = SUB84(local_3c8,4);
                          local_82b = true;
                          if (local_7b0->regularize == true) {
                            *(long *)(in_FS_OFFSET + -0x288) = *(long *)(in_FS_OFFSET + -0x288) + 1;
                            in_ZmmResult._16_48_ = (undefined1  [48])0x0;
                            BSDF::Regularize((BSDF *)afStack_400);
                          }
                          else {
                            *(long *)(in_FS_OFFSET + -0x280) = *(long *)(in_FS_OFFSET + -0x280) + 1;
                          }
                          pSVar136 = local_7d8;
                          local_278._16_4_ = local_538._16_4_;
                          local_278._20_4_ = local_538._20_4_;
                          local_5b8.pi.super_Point3<pbrt::Interval>.
                          super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high = (Float)local_538._4_4_
                          ;
                          local_5b8.pi.super_Point3<pbrt::Interval>.
                          super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low = (Float)local_538._0_4_;
                          local_278._8_4_ = local_538._8_4_;
                          local_278._12_4_ = local_538._12_4_;
                          FStack_258 = (Float)local_538._48_4_;
                          local_278._24_4_ = local_538._40_4_;
                          local_278._28_4_ = local_538._44_4_;
                          fStack_24c = *(float *)&local_3b0[1].bits;
                          uStack_254 = (undefined4)local_3b0->bits;
                          fStack_250 = (float)(local_3b0->bits >> 0x20);
                          local_5b8.pi.super_Point3<pbrt::Interval>.
                          super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high =
                               (Float)local_538._12_4_;
                          local_5b8.pi.super_Point3<pbrt::Interval>.
                          super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low = (Float)local_538._8_4_;
                          local_5b8.pi.super_Point3<pbrt::Interval>.
                          super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high =
                               (Float)local_538._20_4_;
                          local_5b8.pi.super_Point3<pbrt::Interval>.
                          super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low = (Float)local_538._16_4_
                          ;
                          local_5b8.n.super_Tuple3<pbrt::Normal3,_float>.y = (float)local_538._44_4_
                          ;
                          local_5b8.n.super_Tuple3<pbrt::Normal3,_float>.x = (float)local_538._40_4_
                          ;
                          local_5b8._32_8_ = CONCAT44(uStack_254,local_538._48_4_);
                          local_5b8.ns.super_Tuple3<pbrt::Normal3,_float>.z = fStack_24c;
                          local_5b8.ns.super_Tuple3<pbrt::Normal3,_float>.y = fStack_250;
                          local_1e8.
                          super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                          .bits = (TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                                   )(local_7d8->
                                    super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                                    ).bits;
                          auVar312 = ZEXT856((ulong)local_5b8.pi.super_Point3<pbrt::Interval>.
                                                    super_Tuple3<pbrt::Point3,_pbrt::Interval>.y);
                          auVar255 = ZEXT856((ulong)local_5b8._32_8_);
                          in_ZMM8 = ZEXT1664(auVar172);
                          in_ZMM9 = ZEXT1664(auVar169);
                          in_ZMM10 = ZEXT1664(auVar166);
                          in_ZMM12 = ZEXT1664(auVar168);
                          in_ZMM13 = ZEXT1664(auVar201);
                          local_278._0_8_ =
                               local_5b8.pi.super_Point3<pbrt::Interval>.
                               super_Tuple3<pbrt::Point3,_pbrt::Interval>.x;
                          SVar382 = SampleLd(this_00,(Interaction *)local_538,(BSDF *)afStack_400,
                                             lambda,&local_1e8,&local_788,&local_7a8);
                          auVar310._0_8_ = SVar382.values.values._8_8_;
                          auVar310._8_56_ = auVar255;
                          auVar249._0_8_ = SVar382.values.values._0_8_;
                          auVar249._8_56_ = auVar312;
                          auVar169 = vmovlhps_avx(auVar249._0_16_,auVar310._0_16_);
                          auVar172 = *(undefined1 (*) [16])(lambda->pdf).values;
                          uVar141 = vcmpps_avx512vl(auVar172,_DAT_00453010,4);
                          auVar172 = vdivps_avx512vl(auVar169,auVar172);
                          fVar192 = (float)((uint)((byte)uVar141 & 1) * auVar172._0_4_);
                          fVar251 = (float)((uint)((byte)(uVar141 >> 1) & 1) * auVar172._4_4_);
                          in_ZmmResult._4_4_ = fVar251;
                          in_ZmmResult._0_4_ = fVar192;
                          fVar252 = (float)((uint)((byte)(uVar141 >> 2) & 1) * auVar172._8_4_);
                          in_ZmmResult._8_4_ = fVar252;
                          fVar368 = (float)((uint)((byte)(uVar141 >> 3) & 1) * auVar172._12_4_);
                          in_ZmmResult._12_4_ = fVar368;
                          local_738.values.values[0] = fVar192 + local_738.values.values[0];
                          local_738.values.values[1] = fVar251 + local_738.values.values[1];
                          local_738.values.values[2] = fVar252 + local_738.values.values[2];
                          local_738.values.values[3] = fVar368 + local_738.values.values[3];
                          local_278._0_8_ =
                               (pSVar136->
                               super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                               ).bits;
                          FVar191 = DispatchSplit<9>::operator()
                                              ((DispatchSplit<9> *)local_318,local_278,
                                               (ulong)local_278._0_8_ >> 0x30);
                          local_828._0_4_ = FVar191;
                          fStack_7e4 = (float)local_538._32_4_;
                          local_808._32_4_ = local_538._28_4_;
                          _fStack_7e0 = 0;
                          local_558._0_4_ = local_538._36_4_;
                          uVar141 = (pSVar136->
                                    super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                                    ).bits;
                          pDVar150 = (DebugMLTSampler *)(uVar141 & 0xffffffffffff);
                          sVar108 = (short)(uVar141 >> 0x30);
                          if (uVar141 < 0x5000000000000) {
                            if (uVar141 < 0x3000000000000) {
                              if (sVar108 == 2) {
                                TVar195 = (Tuple2<pbrt::Point2,_float>)
                                          StratifiedSampler::Get2D((StratifiedSampler *)pDVar150);
                              }
                              else {
                                TVar195 = (Tuple2<pbrt::Point2,_float>)
                                          RandomSampler::Get2D((RandomSampler *)pDVar150);
                              }
                            }
                            else if (sVar108 == 3) {
                              TVar195 = (Tuple2<pbrt::Point2,_float>)
                                        HaltonSampler::Get2D((HaltonSampler *)pDVar150);
                            }
                            else {
                              TVar195 = (Tuple2<pbrt::Point2,_float>)
                                        PaddedSobolSampler::Get2D((PaddedSobolSampler *)pDVar150);
                            }
                          }
                          else if (uVar141 < 0x7000000000000) {
                            if (sVar108 == 6) {
                              TVar195 = (Tuple2<pbrt::Point2,_float>)
                                        ZSobolSampler::Get2D((ZSobolSampler *)pDVar150);
                            }
                            else {
                              TVar195 = (Tuple2<pbrt::Point2,_float>)
                                        SobolSampler::Get2D((SobolSampler *)pDVar150);
                            }
                          }
                          else if (uVar141 >> 0x30 == 8) {
                            TVar195 = (Tuple2<pbrt::Point2,_float>)
                                      MLTSampler::Get2D((MLTSampler *)pDVar150);
                          }
                          else if (sVar108 == 7) {
                            TVar195 = (Tuple2<pbrt::Point2,_float>)
                                      PMJ02BNSampler::Get2D((PMJ02BNSampler *)pDVar150);
                          }
                          else {
                            local_7c8._0_4_ = DebugMLTSampler::Get1D(pDVar150);
                            local_7c8._4_4_ = extraout_XMM0_Db_07;
                            local_7c8._8_4_ = extraout_XMM0_Dc_07;
                            local_7c8._12_4_ = extraout_XMM0_Dd_07;
                            auVar250._0_4_ = DebugMLTSampler::Get1D(pDVar150);
                            auVar250._4_60_ = extraout_var_04;
                            auVar172 = vinsertps_avx(local_7c8,auVar250._0_16_,0x10);
                            TVar195 = auVar172._0_8_;
                          }
                          auVar172 = stack0xfffffffffffff818;
                          woRender_01.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_558._0_4_;
                          woRender_01.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_808._32_4_
                          ;
                          woRender_01.super_Tuple3<pbrt::Vector3,_float>.y = fStack_7e4;
                          unique0x1000c81a = auVar172;
                          BSDF::Sample_f((optional<pbrt::BSDFSample> *)local_318,(BSDF *)afStack_400
                                         ,woRender_01,(Float)local_828._0_4_,(Point2f)TVar195,
                                         Radiance,All);
                          uVar157 = 3;
                          if (local_2ec != false) {
                            auVar172 = vfmadd132ss_fma(ZEXT416((uint)local_4b8.bits._4_4_),
                                                       ZEXT416((uint)((float)uStack_4b0 *
                                                                     (float)local_318._24_4_)),
                                                       ZEXT416((uint)local_318._20_4_));
                            auVar169 = vfmsub213ss_fma(ZEXT416((uint)local_318._24_4_),
                                                       ZEXT416((uint)uStack_4b0),
                                                       ZEXT416((uint)((float)uStack_4b0 *
                                                                     (float)local_318._24_4_)));
                            auVar172 = vfmadd231ss_fma(ZEXT416((uint)(auVar172._0_4_ +
                                                                     auVar169._0_4_)),
                                                       ZEXT416((uint)(undefined4)local_4b8.bits),
                                                       ZEXT416((uint)local_318._16_4_));
                            uVar194 = auVar172._0_4_;
                            auVar229._4_4_ = uVar194;
                            auVar229._0_4_ = uVar194;
                            auVar229._8_4_ = uVar194;
                            auVar229._12_4_ = uVar194;
                            auVar29._8_4_ = 0x7fffffff;
                            auVar29._0_8_ = 0x7fffffff7fffffff;
                            auVar29._12_4_ = 0x7fffffff;
                            in_ZmmResult._0_16_ = vandps_avx512vl(auVar229,auVar29);
                            local_788.values.values[0] =
                                 in_ZmmResult._0_4_ * (float)local_318._0_4_ *
                                 local_788.values.values[0];
                            local_788.values.values[1] =
                                 in_ZmmResult._4_4_ * (float)local_318._4_4_ *
                                 local_788.values.values[1];
                            local_788.values.values[2] =
                                 in_ZmmResult._8_4_ * (float)local_318._8_4_ *
                                 local_788.values.values[2];
                            local_788.values.values[3] =
                                 in_ZmmResult._12_4_ * (float)local_318._12_4_ *
                                 local_788.values.values[3];
                            local_6f8.values.values = local_7a8.values.values;
                            local_7a8.values.values[1] =
                                 (float)local_318._28_4_ * local_7a8.values.values[1];
                            local_7a8.values.values[0] =
                                 (float)local_318._28_4_ * local_7a8.values.values[0];
                            local_7a8.values.values[2] =
                                 (float)local_318._28_4_ * local_7a8.values.values[2];
                            local_7a8.values.values[3] =
                                 (float)local_318._28_4_ * local_7a8.values.values[3];
                            local_82c = (bool)((byte)local_318[0x20] >> 4 & 1);
                            Interaction::SpawnRay
                                      ((RayDifferential *)local_278,(Interaction *)local_538,
                                       (Vector3f *)(local_318 + 0x10));
                            (((Vector3f *)(local_808._16_8_ + 0xc))->
                            super_Tuple3<pbrt::Vector3,_float>).x = (float)local_278._12_4_;
                            (((Vector3f *)(local_808._16_8_ + 0xc))->
                            super_Tuple3<pbrt::Vector3,_float>).y = (float)local_278._16_4_;
                            *(ulong *)(local_808._16_8_ + 0x14) =
                                 CONCAT44(local_278._24_4_,local_278._20_4_);
                            *(undefined8 *)local_808._16_8_ = local_278._0_8_;
                            *(ulong *)(local_808._16_8_ + 8) =
                                 CONCAT44(local_278._12_4_,local_278._8_4_);
                            (((MediumHandle *)(local_808._16_8_ + 0x20))->
                            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                            ).bits = CONCAT44(uStack_254,FStack_258);
                            auVar133._4_4_ = fStack_238;
                            auVar133._8_4_ = fStack_234;
                            auVar133._0_4_ = fStack_23c;
                            auVar133._12_20_ = auStack_230;
                            *(undefined1 (*) [32])(local_200 + 0x14) = auVar133;
                            *(ulong *)local_200 = CONCAT44(fStack_24c,fStack_250);
                            *(undefined8 *)(local_200 + 8) = uStack_248;
                            (((Point3f *)(local_200 + 0x10))->super_Tuple3<pbrt::Point3,_float>).x =
                                 fStack_240;
                            (((Point3f *)(local_200 + 0x10))->super_Tuple3<pbrt::Point3,_float>).y =
                                 fStack_23c;
                            *(undefined8 *)(local_200 + 0x18) = _fStack_238;
                            uVar157 = 0;
                          }
                          local_538._72_8_ = (float **)CONCAT44(local_538._76_4_,local_538._72_4_);
                          local_278._8_8_ = CONCAT44(local_278._12_4_,local_278._8_4_);
                          if (local_2ec == true) {
                            local_2ec = false;
                            local_538._72_8_ = (float **)CONCAT44(local_538._76_4_,local_538._72_4_)
                            ;
                            local_278._8_8_ = CONCAT44(local_278._12_4_,local_278._8_4_);
                          }
                        }
                      }
                    }
                  }
                  if (local_710 == true) {
                    local_710 = false;
                  }
                  sampler = local_7d8;
                  if (uVar157 != 0) goto LAB_003d873f;
                }
              }
              if ((local_788.values.values[0] == 0.0) && (!NAN(local_788.values.values[0]))) {
                uVar141 = 0;
                while (uVar144 = uVar141, uVar144 != 3) {
                  fVar192 = local_788.values.values[uVar144 + 1];
                  if ((fVar192 != 0.0) || (uVar141 = uVar144 + 1, NAN(fVar192))) break;
                }
                uVar157 = 3;
                sampler = local_7d8;
                if (2 < uVar144) goto LAB_003d873f;
              }
              auVar227._0_4_ = (float)local_188._0_4_ * local_788.values.values[0];
              auVar227._4_4_ = (float)local_188._0_4_ * local_788.values.values[1];
              auVar227._8_4_ = (float)local_188._0_4_ * local_788.values.values[2];
              auVar227._12_4_ = (float)local_188._0_4_ * local_788.values.values[3];
              lVar151 = 1;
              fVar192 = local_7a8.values.values[0];
              do {
                fVar192 = fVar192 + local_7a8.values.values[lVar151];
                lVar151 = lVar151 + 1;
              } while (lVar151 != 4);
              fVar192 = fVar192 * 0.25;
              auVar291._4_4_ = fVar192;
              auVar291._0_4_ = fVar192;
              auVar291._8_4_ = fVar192;
              auVar291._12_4_ = fVar192;
              auVar172 = vdivps_avx(auVar227,auVar291);
              local_538._0_4_ = auVar172._0_4_;
              local_538._4_4_ = auVar172._4_4_;
              local_538._8_4_ = auVar172._8_4_;
              local_538._12_4_ = auVar172._12_4_;
              lVar151 = 1;
              auVar367 = ZEXT464((uint)local_538._0_4_);
              auVar346 = ZEXT464((uint)local_538._0_4_);
              do {
                auVar172 = vmaxss_avx(ZEXT416(*(uint *)(local_538 + lVar151 * 4)),auVar346._0_16_);
                auVar346 = ZEXT1664(auVar172);
                lVar151 = lVar151 + 1;
              } while (lVar151 != 4);
              if ((auVar172._0_4_ < 1.0) && (1 < (int)local_808._28_4_)) {
                lVar151 = 1;
                do {
                  auVar172 = vmaxss_avx(ZEXT416(*(uint *)(local_538 + lVar151 * 4)),auVar367._0_16_)
                  ;
                  auVar367 = ZEXT1664(auVar172);
                  lVar151 = lVar151 + 1;
                } while (lVar151 != 4);
                local_828._0_4_ = auVar172._0_4_;
                local_668.T_hat =
                     (SampledSpectrum *)
                     (local_7d8->
                     super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                     ).bits;
                in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
                in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
                in_ZMM10 = ZEXT1664(in_ZMM10._0_16_);
                in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
                in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
                FVar191 = DispatchSplit<9>::operator()
                                    ((DispatchSplit<9> *)local_6d8,&local_668,
                                     (ulong)local_668.T_hat >> 0x30);
                auVar172 = vmaxss_avx(ZEXT416((uint)(1.0 - (float)local_828._0_4_)),ZEXT416(0));
                uVar157 = 3;
                sampler = local_7d8;
                if (FVar191 < auVar172._0_4_) goto LAB_003d873f;
                fVar192 = 1.0 - auVar172._0_4_;
                local_7a8.values.values[0] = fVar192 * local_7a8.values.values[0];
                local_7a8.values.values[1] = fVar192 * local_7a8.values.values[1];
                local_7a8.values.values[2] = fVar192 * local_7a8.values.values[2];
                local_7a8.values.values[3] = fVar192 * local_7a8.values.values[3];
                local_6f8.values.values[0] = fVar192 * local_6f8.values.values[0];
                local_6f8.values.values[1] = fVar192 * local_6f8.values.values[1];
                local_6f8.values.values[2] = fVar192 * local_6f8.values.values[2];
                local_6f8.values.values[3] = fVar192 * local_6f8.values.values[3];
              }
              uVar157 = 0;
              sampler = local_7d8;
            }
LAB_003d873f:
            if (local_55c == '\x01') {
              local_55c = '\0';
            }
          }
        }
      }
    }
    else {
      local_829 = false;
      local_82a = false;
      local_7c8 = ZEXT416((uint)((byte)local_38 & 1) * local_138._248_4_ +
                          (uint)!(bool)((byte)local_38 & 1) * 0x7f800000);
      uVar141 = (sampler->
                super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                ).bits;
      local_538._0_4_ = (undefined4)uVar141;
      local_538._4_4_ = (undefined4)(uVar141 >> 0x20);
      in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
      in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
      in_ZMM10 = ZEXT1664(in_ZMM10._0_16_);
      in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
      in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
      FVar191 = DispatchSplit<9>::operator()
                          ((DispatchSplit<9> *)&local_668,local_538,uVar141 >> 0x30);
      local_828._0_4_ = FVar191;
      uVar141 = (sampler->
                super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                ).bits;
      local_538._0_4_ = (undefined4)uVar141;
      local_538._4_4_ = (undefined4)(uVar141 >> 0x20);
      FVar191 = DispatchSplit<9>::operator()
                          ((DispatchSplit<9> *)&local_668,local_538,uVar141 >> 0x30);
      uVar141 = (CONCAT44(extraout_var,local_828._0_4_) ^ 0x1a929e4d6f47a654) * -0x395b586ca42e166b;
      uVar144 = (uVar141 >> 0x2f ^ uVar141) * -0x395b586ca42e166b;
      uVar141 = uVar144 >> 0x2f ^ uVar144;
      uVar144 = (CONCAT44((int)(uVar144 >> 0x20),FVar191) ^ 0x1a929e4d6f47a654) *
                -0x395b586ca42e166b;
      uVar144 = (uVar144 >> 0x2f ^ uVar144) * -0x395b586ca42e166b;
      local_278._8_8_ = uVar141 * 2 + 1;
      local_278._0_8_ =
           ((uVar144 >> 0x2f ^ uVar144) + 1) * 0x5851f42d4c957f2d + uVar141 * -0x4f5c17a566d501a4 +
           1;
      _fStack_760 = 0;
      local_768 = (undefined1  [8])*(ulong *)uVar253;
      local_758._0_4_ = *(float *)(uVar253 + 8);
      uVar4 = (((Vector3f *)(uVar253 + 0xc))->super_Tuple3<pbrt::Vector3,_float>).x;
      uVar6 = (((Vector3f *)(uVar253 + 0xc))->super_Tuple3<pbrt::Vector3,_float>).y;
      fStack_7e4 = (float)uVar6;
      local_808._32_4_ = uVar4;
      _fStack_7e0 = 0;
      _fStack_820 = 0;
      local_828 = (undefined1  [8])*(ulong *)(uVar253 + 0x14);
      TVar8.bits = (((MediumHandle *)(uVar253 + 0x20))->
                   super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                   ).bits;
      uVar141 = (sampler->
                super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                ).bits;
      local_538._0_4_ = (undefined4)uVar141;
      local_538._4_4_ = (undefined4)(uVar141 >> 0x20);
      FVar191 = DispatchSplit<9>::operator()
                          ((DispatchSplit<9> *)&local_668,local_538,uVar141 >> 0x30);
      lambda = local_790;
      local_558._0_4_ = FVar191;
      uVar141 = (((MediumHandle *)(local_808._16_8_ + 0x20))->
                super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                ).bits;
      local_748 = (undefined1  [8])uVar141;
      sVar108 = (short)(uVar141 >> 0x30);
      if (uVar141 < 0x3000000000000) {
        if (sVar108 == 2) {
          local_418._0_8_ = vmovlps_avx(_local_768);
          local_418._8_4_ = local_758._0_4_;
          unique0x00106900 = vunpcklpd_avx(stack0xfffffffffffff818,_local_828);
          local_668.T_hat = &local_788;
          local_668.terminated = &local_82a;
          local_668.uniPathPDF = &local_7a8;
          local_668.lightPathPDF = &local_6f8;
          local_668.depth = (int *)(local_808 + 0x1c);
          local_668.this = local_7b0;
          local_668.L = &local_738;
          local_668.lambda = local_790;
          local_668.rng = (RNG *)local_278;
          local_668.sampler = local_7d8;
          local_668.ray = (RayDifferential *)local_808._16_8_;
          local_668.prevIntrContext = &local_5b8;
          local_668.scattered = &local_829;
          local_668.specularBounce = &local_82c;
          local_668.anyNonSpecularBounces = &local_82b;
          local_80c = (float)local_7c8._0_4_;
          auVar147 = (undefined1  [8])(uVar141 & 0xffffffffffff);
          local_3f8.
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
          .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                   )(TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                     )TVar8.bits;
          Transform::ApplyInverse
                    ((Ray *)local_6d8,(Transform *)((long)auVar147 + 0x78),(Ray *)local_418,
                     &local_80c);
          auVar257._0_4_ = (float)auStack_6d0._8_4_ * (float)auStack_6d0._8_4_;
          auVar257._4_4_ = (float)auStack_6d0._12_4_ * (float)auStack_6d0._12_4_;
          auVar257._8_8_ = 0;
          auVar172 = vmovshdup_avx(auVar257);
          fVar192 = (float)auStack_6d0._4_4_ * (float)auStack_6d0._4_4_ + auVar257._0_4_ +
                    auVar172._0_4_;
          if (fVar192 < 0.0) {
            fVar192 = sqrtf(fVar192);
          }
          else {
            auVar172 = vsqrtss_avx(ZEXT416((uint)fVar192),ZEXT416((uint)fVar192));
            fVar192 = auVar172._0_4_;
          }
          local_80c = fVar192 * local_80c;
          auVar259._0_4_ = (float)auStack_6d0._8_4_ * (float)auStack_6d0._8_4_;
          auVar259._4_4_ = (float)auStack_6d0._12_4_ * (float)auStack_6d0._12_4_;
          auVar259._8_8_ = 0;
          auVar172 = vmovshdup_avx(auVar259);
          fVar192 = (float)auStack_6d0._4_4_ * (float)auStack_6d0._4_4_ + auVar259._0_4_ +
                    auVar172._0_4_;
          if (fVar192 < 0.0) {
            fVar192 = sqrtf(fVar192);
          }
          else {
            auVar172 = vsqrtss_avx(ZEXT416((uint)fVar192),ZEXT416((uint)fVar192));
            fVar192 = auVar172._0_4_;
          }
          auVar261._4_4_ = auStack_6d0._8_4_;
          auVar261._0_4_ = auStack_6d0._4_4_;
          auVar261._8_8_ = 0;
          auVar314._4_4_ = fVar192;
          auVar314._0_4_ = fVar192;
          auVar314._8_4_ = fVar192;
          auVar314._12_4_ = fVar192;
          auVar172 = vdivps_avx(auVar261,auVar314);
          uVar253 = vmovlps_avx(auVar172);
          auStack_6d0._4_4_ = (undefined4)uVar253;
          auStack_6d0._8_4_ = (undefined4)((ulong)uVar253 >> 0x20);
          auStack_6d0._12_4_ = (float)auStack_6d0._12_4_ / fVar192;
          auVar346 = ZEXT464((uint)local_80c);
          auVar172 = ZEXT816(0) << 0x40;
          bVar163 = false;
          uVar157 = 0;
          do {
            pfVar153 = (float *)(auStack_6d0 + 4);
            if ((uVar157 != 0) && (pfVar153 = (float *)(auStack_6d0 + 8), uVar157 != 1)) {
              pfVar153 = (float *)(auStack_6d0 + 0xc);
            }
            pfVar158 = (float *)((long)auVar147 + 8);
            if ((uVar157 != 0) && (pfVar158 = (float *)((long)auVar147 + 0xc), uVar157 != 1)) {
              pfVar158 = (float *)((long)auVar147 + 0x10);
            }
            pRVar159 = (Ray *)local_6d8;
            if ((uVar157 != 0) && (pRVar159 = (Ray *)(local_6d8 + 4), uVar157 != 1)) {
              pRVar159 = (Ray *)auStack_6d0;
            }
            pfVar160 = (float *)((long)auVar147 + 0x14);
            if ((uVar157 != 0) && (pfVar160 = (float *)((long)auVar147 + 0x18), uVar157 != 1)) {
              pfVar160 = (float *)((long)auVar147 + 0x1c);
            }
            pRVar161 = (Ray *)local_6d8;
            if ((uVar157 != 0) && (pRVar161 = (Ray *)(local_6d8 + 4), uVar157 != 1)) {
              pRVar161 = (Ray *)auStack_6d0;
            }
            auVar312 = (undefined1  [56])0x0;
            auVar166 = ZEXT416((uint)((1.0 / *pfVar153) *
                                     (*pfVar160 - (pRVar161->o).super_Tuple3<pbrt::Point3,_float>.x)
                                     ));
            auVar168 = ZEXT416((uint)((1.0 / *pfVar153) *
                                     (*pfVar158 - (pRVar159->o).super_Tuple3<pbrt::Point3,_float>.x)
                                     ));
            auVar169 = vminss_avx(auVar166,auVar168);
            auVar172 = vmaxss_avx(auVar169,auVar172);
            auVar169 = vmaxss_avx(auVar168,auVar166);
            auVar169 = vminss_avx(ZEXT416((uint)(auVar169._0_4_ * 1.0000004)),auVar346._0_16_);
            auVar346 = ZEXT1664(auVar169);
            if (auVar169._0_4_ < auVar172._0_4_) break;
            bVar163 = 1 < uVar157;
            uVar157 = uVar157 + 1;
          } while (uVar157 != 3);
          auVar201._8_4_ = 0x3f800000;
          auVar201._0_8_ = 0x3f8000003f800000;
          auVar201._12_4_ = 0x3f800000;
          if (bVar163) {
            local_808._32_4_ = auVar172._0_4_;
            uVar253 = 0;
            _local_828 = ZEXT416(*(uint *)((long)auVar147 + 0x70));
            local_778 = auVar169._0_4_;
            SVar382 = DenselySampledSpectrum::Sample
                                ((DenselySampledSpectrum *)((long)auVar147 + 0x20),lambda);
            auVar296._0_8_ = SVar382.values.values._8_8_;
            auVar296._8_56_ = auVar312;
            local_7c8._8_8_ = uVar253;
            local_7c8._0_8_ = SVar382.values.values._0_8_;
            local_758 = auVar296._0_16_;
            auVar255 = (undefined1  [56])0x0;
            _local_768 = ZEXT416(*(uint *)((long)auVar147 + 0x70));
            SVar382 = DenselySampledSpectrum::Sample
                                ((DenselySampledSpectrum *)((long)auVar147 + 0x48),lambda);
            auVar297._0_8_ = SVar382.values.values._8_8_;
            auVar297._8_56_ = auVar312;
            auVar235._0_8_ = SVar382.values.values._0_8_;
            auVar235._8_56_ = auVar255;
            auVar172 = vunpcklpd_avx(local_7c8,local_758);
            local_288 = (float)local_828._0_4_ * auVar172._0_4_;
            fStack_284 = (float)local_828._0_4_ * auVar172._4_4_;
            fStack_280 = (float)local_828._0_4_ * auVar172._8_4_;
            fStack_27c = (float)local_828._0_4_ * auVar172._12_4_;
            auVar172 = vmovlhps_avx(auVar235._0_16_,auVar297._0_16_);
            fVar192 = (float)local_768._0_4_ * auVar172._0_4_;
            fVar251 = (float)local_768._0_4_ * auVar172._4_4_;
            fStack_290 = (float)local_768._0_4_ * auVar172._8_4_;
            fStack_28c = (float)local_768._0_4_ * auVar172._12_4_;
            local_298 = CONCAT44(fVar251,fVar192);
            local_2e8._0_4_ = fVar192 + local_288;
            local_2e8._4_4_ = fVar251 + fStack_284;
            local_2e8._8_4_ = fStack_290 + fStack_280;
            local_2e8._12_4_ = fStack_28c + fStack_27c;
            auVar367 = ZEXT1664(local_2e8);
            fVar192 = *(float *)((long)auVar147 + 0x10);
            fVar368 = *(float *)((long)auVar147 + 0x1c) - fVar192;
            uVar253 = vcmpss_avx512f(ZEXT416((uint)fVar192),
                                     ZEXT416((uint)*(float *)((long)auVar147 + 0x1c)),1);
            bVar15 = (bool)((byte)uVar253 & 1);
            auVar198._8_8_ = 0;
            auVar198._0_8_ = *(ulong *)((long)auVar147 + 8);
            auVar262._8_8_ = 0;
            auVar262._0_8_ = *(ulong *)((long)auVar147 + 0x14);
            auVar172 = vsubps_avx(auVar262,auVar198);
            auVar358._4_4_ = local_6d8._4_4_;
            auVar358._0_4_ = local_6d8._0_4_;
            auVar358._8_8_ = 0;
            auVar169 = vsubps_avx(auVar358,auVar198);
            uVar141 = vcmpps_avx512vl(auVar198,auVar262,1);
            auVar166 = vdivps_avx512vl(auVar169,auVar172);
            bVar163 = (bool)((byte)uVar141 & 1);
            auVar167._0_4_ =
                 (float)((uint)bVar163 * auVar166._0_4_ | (uint)!bVar163 * auVar169._0_4_);
            bVar163 = (bool)((byte)(uVar141 >> 1) & 1);
            auVar167._4_4_ = (uint)bVar163 * auVar166._4_4_ | (uint)!bVar163 * auVar169._4_4_;
            bVar163 = (bool)((byte)(uVar141 >> 2) & 1);
            auVar167._8_4_ = (uint)bVar163 * auVar166._8_4_ | (uint)!bVar163 * auVar169._8_4_;
            bVar163 = (bool)((byte)(uVar141 >> 3) & 1);
            auVar167._12_4_ = (uint)bVar163 * auVar166._12_4_ | (uint)!bVar163 * auVar169._12_4_;
            in_ZmmResult._0_16_ = auVar167;
            auVar169 = vmovshdup_avx(auVar167);
            auVar199._4_4_ = auStack_6d0._8_4_;
            auVar199._0_4_ = auStack_6d0._4_4_;
            auVar199._8_8_ = 0;
            auVar172 = vdivps_avx(auVar199,auVar172);
            local_6dc = (float)auStack_6d0._12_4_ / fVar368;
            uVar253 = vmovlps_avx(auVar172);
            local_7d0 = (float)uVar253;
            fStack_7cc = (float)SUB84(uVar253,4);
            uVar311 = _local_7d0;
            auVar346 = ZEXT464((uint)local_808._32_4_);
            local_7d0 = (float)uVar253;
            fStack_7cc = SUB84(uVar253,4);
            fVar251 = (float)local_808._32_4_ * local_7d0 + auVar167._0_4_;
            fVar252 = (float)local_808._32_4_ * fStack_7cc + auVar169._0_4_;
            fVar192 = (float)((uint)bVar15 * (int)(((float)auStack_6d0._0_4_ - fVar192) / fVar368) +
                             (uint)!bVar15 * (int)((float)auStack_6d0._0_4_ - fVar192)) +
                      (float)local_808._32_4_ * local_6dc;
            piVar3 = (int *)((long)auVar147 + 0x118);
            piVar2 = (int *)((long)auVar147 + 0x11c);
            local_378 = auVar147;
            piVar146 = (int *)((long)auVar147 + 0x120);
            lVar151 = 0;
            _local_7d0 = uVar311;
            do {
              iVar139 = (int)lVar151;
              fVar368 = fVar251;
              if ((iVar139 != 0) && (fVar368 = fVar252, iVar139 != 1)) {
                fVar368 = fVar192;
              }
              piVar154 = piVar3;
              if ((iVar139 != 0) && (piVar154 = piVar2, iVar139 != 1)) {
                piVar154 = piVar146;
              }
              piVar156 = piVar3;
              if ((iVar139 != 0) && (piVar156 = piVar2, iVar139 != 1)) {
                piVar156 = piVar146;
              }
              auVar351._0_4_ = (float)(*piVar156 + -1);
              auVar351._4_12_ = in_ZMM8._4_12_;
              auVar172 = vminss_avx(auVar351,ZEXT416((uint)(fVar368 * (float)*piVar154)));
              uVar253 = vcmpss_avx512f(ZEXT416((uint)(fVar368 * (float)*piVar154)),
                                       ZEXT816(0) << 0x40,1);
              auVar175._16_48_ = in_ZmmResult._16_48_;
              auVar175._0_16_ = auVar172;
              fVar368 = (float)((uint)!(bool)((byte)uVar253 & 1) * auVar172._0_4_);
              in_ZmmResult._4_60_ = auVar175._4_60_;
              in_ZmmResult._0_4_ = fVar368;
              iVar152 = (int)fVar368;
              *(int *)(local_728 + lVar151 * 4) = iVar152;
              pfVar153 = &local_7d0;
              if ((iVar139 != 0) && (pfVar153 = &fStack_7cc, iVar139 != 1)) {
                pfVar153 = &local_6dc;
              }
              if ((*pfVar153 == 0.0) && (!NAN(*pfVar153))) {
                pfVar153 = &local_7d0;
                if ((iVar139 != 0) && (pfVar153 = &fStack_7cc, iVar139 != 1)) {
                  pfVar153 = &local_6dc;
                }
                *pfVar153 = 0.0;
              }
              pfVar153 = &local_7d0;
              if ((iVar139 != 0) && (pfVar153 = &fStack_7cc, iVar139 != 1)) {
                pfVar153 = &local_6dc;
              }
              if (0.0 <= *pfVar153) {
                piVar154 = piVar3;
                if ((iVar139 != 0) && (piVar154 = piVar2, iVar139 != 1)) {
                  piVar154 = piVar146;
                }
                fVar368 = fVar251;
                if ((iVar139 != 0) && (fVar368 = fVar252, iVar139 != 1)) {
                  fVar368 = fVar192;
                }
                pfVar153 = &local_7d0;
                if ((iVar139 != 0) && (pfVar153 = &fStack_7cc, iVar139 != 1)) {
                  pfVar153 = &local_6dc;
                }
                *(float *)(local_368 + lVar151 * 4) =
                     (float)local_808._32_4_ +
                     ((float)(iVar152 + 1) / (float)*piVar154 - fVar368) / *pfVar153;
                pfVar153 = &local_7d0;
                if ((iVar139 != 0) && (pfVar153 = &fStack_7cc, iVar139 != 1)) {
                  pfVar153 = &local_6dc;
                }
                piVar154 = piVar3;
                if ((iVar139 != 0) && (piVar154 = piVar2, iVar139 != 1)) {
                  piVar154 = piVar146;
                }
                *(float *)((long)&local_1c0.bxdf.
                                  super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
                                  .bits + lVar151 * 4) = 1.0 / ((float)*piVar154 * *pfVar153);
                *(undefined4 *)((long)&local_588 + lVar151 * 4) = 1;
                piVar154 = piVar3;
                if ((iVar139 != 0) && (piVar154 = piVar2, iVar139 != 1)) {
                  piVar154 = piVar146;
                }
                iVar139 = *piVar154;
              }
              else {
                piVar154 = piVar3;
                if ((iVar139 != 0) && (piVar154 = piVar2, iVar139 != 1)) {
                  piVar154 = piVar146;
                }
                fVar368 = fVar251;
                if ((iVar139 != 0) && (fVar368 = fVar252, iVar139 != 1)) {
                  fVar368 = fVar192;
                }
                pfVar153 = &local_7d0;
                if ((iVar139 != 0) && (pfVar153 = &fStack_7cc, iVar139 != 1)) {
                  pfVar153 = &local_6dc;
                }
                *(float *)(local_368 + lVar151 * 4) =
                     (float)local_808._32_4_ +
                     ((float)iVar152 / (float)*piVar154 - fVar368) / *pfVar153;
                pfVar153 = &local_7d0;
                if ((iVar139 != 0) && (pfVar153 = &fStack_7cc, iVar139 != 1)) {
                  pfVar153 = &local_6dc;
                }
                piVar154 = piVar3;
                if ((iVar139 != 0) && (piVar154 = piVar2, iVar139 != 1)) {
                  piVar154 = piVar146;
                }
                *(float *)((long)&local_1c0.bxdf.
                                  super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
                                  .bits + lVar151 * 4) = -1.0 / ((float)*piVar154 * *pfVar153);
                *(undefined4 *)((long)&local_588 + lVar151 * 4) = 0xffffffff;
                iVar139 = -1;
              }
              *(int *)(local_318 + lVar151 * 4) = iVar139;
              lVar151 = lVar151 + 1;
            } while (lVar151 != 3);
            local_5c0 = (long)auVar147 + 0x74U | 0x1000000000000;
            fStack_820 = 1.0;
            local_828 = (undefined1  [8])0x3f8000003f800000;
            fStack_81c = 1.0;
            auVar357 = ZEXT464((uint)local_558._0_4_);
            auVar347 = ZEXT464((uint)local_778);
            do {
              auVar169 = auVar346._0_16_;
              lVar151 = (long)*(int *)(&DAT_0287a500 +
                                      (ulong)((uint)((float)local_368._4_4_ < fStack_360) |
                                             (uint)((float)local_368._0_4_ < (float)local_368._4_4_)
                                             * 4 + (uint)((float)local_368._0_4_ < fStack_360) * 2)
                                      * 4);
              uVar194 = *(undefined4 *)
                         (*(long *)((long)auVar147 + 0x100) +
                         (((long)(int)local_728._8_4_ * (long)*(int *)((long)auVar147 + 0x11c) +
                          (long)(int)local_728._4_4_) * (long)*(int *)((long)auVar147 + 0x118) +
                         (long)(int)local_728._0_4_) * 4);
              auVar16._4_4_ = uVar194;
              auVar16._0_4_ = uVar194;
              auVar16._8_4_ = uVar194;
              auVar16._12_4_ = uVar194;
              auVar166 = vmulps_avx512vl(auVar367._0_16_,auVar16);
              auVar172 = vminss_avx(ZEXT416(*(uint *)(local_368 + lVar151 * 4)),auVar347._0_16_);
              if ((auVar166._0_4_ != 0.0) || (NAN(auVar166._0_4_))) {
                local_758._0_4_ = auVar172._0_4_;
                local_808._32_4_ = auVar346._0_4_;
                auVar30._8_4_ = 0x80000000;
                auVar30._0_8_ = 0x8000000080000000;
                auVar30._12_4_ = 0x80000000;
                in_ZmmResult._0_16_ = vxorps_avx512vl(auVar166,auVar30);
                local_7c8 = auVar166;
                _local_768 = in_ZmmResult._0_16_;
                local_3a0 = lVar151;
                do {
                  fVar192 = logf(1.0 - auVar357._0_4_);
                  uVar253 = local_278._0_8_;
                  fVar192 = (float)local_808._32_4_ - fVar192 / (float)local_7c8._0_4_;
                  local_278._0_8_ = local_278._0_8_ * 0x5851f42d4c957f2d + local_278._8_8_;
                  uVar157 = SUB84(uVar253,4) >> 0xd ^ (uint)((ulong)uVar253 >> 0x1b);
                  bVar143 = SUB81(uVar253,7) >> 3;
                  auVar172 = vcvtusi2ss_avx512f(in_XMM14,uVar157 >> bVar143 |
                                                         uVar157 << 0x20 - bVar143);
                  auVar172 = vminss_avx(ZEXT416((uint)(auVar172._0_4_ * 2.3283064e-10)),
                                        ZEXT416(0x3f7fffff));
                  auVar357 = ZEXT1664(auVar172);
                  if ((float)local_758._0_4_ <= fVar192) {
                    fVar192 = (float)local_758._0_4_ - (float)local_808._32_4_;
                    auVar203._0_4_ = fVar192 * (float)local_768._0_4_;
                    auVar203._4_4_ = fVar192 * (float)local_768._4_4_;
                    auVar203._8_4_ = fVar192 * fStack_760;
                    auVar203._12_4_ = fVar192 * fStack_75c;
                    auVar38._8_4_ = 0x3fb8aa3b;
                    auVar38._0_8_ = 0x3fb8aa3b3fb8aa3b;
                    auVar38._12_4_ = 0x3fb8aa3b;
                    auVar169 = vmulps_avx512vl(auVar203,auVar38);
                    auVar172 = vroundps_avx(auVar169,9);
                    auVar169 = vsubps_avx(auVar169,auVar172);
                    auVar267._0_4_ = (int)auVar172._0_4_;
                    auVar267._4_4_ = (int)auVar172._4_4_;
                    auVar267._8_4_ = (int)auVar172._8_4_;
                    auVar267._12_4_ = (int)auVar172._12_4_;
                    auVar316._8_4_ = 0x3da00ac9;
                    auVar316._0_8_ = 0x3da00ac93da00ac9;
                    auVar316._12_4_ = 0x3da00ac9;
                    auVar39._8_4_ = 0x3e679a0b;
                    auVar39._0_8_ = 0x3e679a0b3e679a0b;
                    auVar39._12_4_ = 0x3e679a0b;
                    auVar172 = vfmadd213ps_avx512vl(auVar316,auVar169,auVar39);
                    auVar40._8_4_ = 0x3f321004;
                    auVar40._0_8_ = 0x3f3210043f321004;
                    auVar40._12_4_ = 0x3f321004;
                    auVar172 = vfmadd213ps_avx512vl(auVar172,auVar169,auVar40);
                    auVar41._8_4_ = 0x3f800000;
                    auVar41._0_8_ = 0x3f8000003f800000;
                    auVar41._12_4_ = 0x3f800000;
                    auVar169 = vfmadd213ps_avx512vl(auVar172,auVar169,auVar41);
                    auVar166 = vpsrld_avx(auVar169,0x17);
                    auVar332._8_4_ = 0xffffff81;
                    auVar332._0_8_ = 0xffffff81ffffff81;
                    auVar332._12_4_ = 0xffffff81;
                    auVar172 = vpaddd_avx(auVar267,auVar332);
                    auVar172 = vpaddd_avx(auVar172,auVar166);
                    uVar141 = vpcmpgtd_avx512vl(auVar172,auVar332);
                    uVar141 = uVar141 & 0xf;
                    auVar42._8_4_ = 0x7f;
                    auVar42._0_8_ = 0x7f0000007f;
                    auVar42._12_4_ = 0x7f;
                    uVar144 = vpcmpgtd_avx512vl(auVar172,auVar42);
                    uVar144 = uVar144 & 0xf;
                    auVar43._8_4_ = 0x807fffff;
                    auVar43._0_8_ = 0x807fffff807fffff;
                    auVar43._12_4_ = 0x807fffff;
                    auVar169 = vpandd_avx512vl(auVar169,auVar43);
                    auVar172 = vpslld_avx(auVar172,0x17);
                    auVar44._8_4_ = 0x3f800000;
                    auVar44._0_8_ = 0x3f8000003f800000;
                    auVar44._12_4_ = 0x3f800000;
                    auVar172 = vpaddd_avx512vl(auVar172,auVar44);
                    auVar172 = vpord_avx512vl(auVar172,auVar169);
                    auVar169 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                    bVar163 = (bool)((byte)uVar144 & 1);
                    in_ZmmResult._0_4_ =
                         (float)((uint)bVar163 * auVar169._0_4_ |
                                (uint)!bVar163 * (uint)((byte)uVar141 & 1) * auVar172._0_4_);
                    bVar163 = (bool)((byte)(uVar144 >> 1) & 1);
                    in_ZmmResult._4_4_ =
                         (float)((uint)bVar163 * auVar169._4_4_ |
                                (uint)!bVar163 * (uint)((byte)(uVar141 >> 1) & 1) * auVar172._4_4_);
                    bVar163 = (bool)((byte)(uVar144 >> 2) & 1);
                    in_ZmmResult._8_4_ =
                         (float)((uint)bVar163 * auVar169._8_4_ |
                                (uint)!bVar163 * (uint)((byte)(uVar141 >> 2) & 1) * auVar172._8_4_);
                    bVar163 = SUB81(uVar144 >> 3,0);
                    in_ZmmResult._12_4_ =
                         (float)((uint)bVar163 * auVar169._12_4_ |
                                (uint)!bVar163 * (uint)(byte)(uVar141 >> 3) * auVar172._12_4_);
                    local_828._4_4_ = in_ZmmResult._4_4_ * (float)local_828._4_4_;
                    local_828._0_4_ = in_ZmmResult._0_4_ * (float)local_828._0_4_;
                    fStack_820 = in_ZmmResult._8_4_ * fStack_820;
                    fStack_81c = in_ZmmResult._12_4_ * fStack_81c;
                    cVar164 = '\n';
                  }
                  else {
                    cVar164 = '\0';
                    if (local_778 <= fVar192) {
                      local_808._32_4_ = fVar192;
                    }
                    else {
                      local_558._0_4_ = auVar172._0_4_;
                      fVar251 = fVar192 - (float)local_808._32_4_;
                      auVar202._0_4_ = fVar251 * (float)local_768._0_4_;
                      auVar202._4_4_ = fVar251 * (float)local_768._4_4_;
                      auVar202._8_4_ = fVar251 * fStack_760;
                      auVar202._12_4_ = fVar251 * fStack_75c;
                      auVar31._8_4_ = 0x3fb8aa3b;
                      auVar31._0_8_ = 0x3fb8aa3b3fb8aa3b;
                      auVar31._12_4_ = 0x3fb8aa3b;
                      auVar172 = vmulps_avx512vl(auVar202,auVar31);
                      _local_5d8 = vroundps_avx(auVar172,9);
                      auVar172 = vsubps_avx(auVar172,_local_5d8);
                      auVar264._8_4_ = 0x3da00ac9;
                      auVar264._0_8_ = 0x3da00ac93da00ac9;
                      auVar264._12_4_ = 0x3da00ac9;
                      auVar32._8_4_ = 0x3e679a0b;
                      auVar32._0_8_ = 0x3e679a0b3e679a0b;
                      auVar32._12_4_ = 0x3e679a0b;
                      auVar169 = vfmadd213ps_avx512vl(auVar264,auVar172,auVar32);
                      auVar33._8_4_ = 0x3f321004;
                      auVar33._0_8_ = 0x3f3210043f321004;
                      auVar33._12_4_ = 0x3f321004;
                      auVar169 = vfmadd213ps_avx512vl(auVar169,auVar172,auVar33);
                      auVar34._8_4_ = 0x3f800000;
                      auVar34._0_8_ = 0x3f8000003f800000;
                      auVar34._12_4_ = 0x3f800000;
                      local_708 = vfmadd213ps_avx512vl(auVar169,auVar172,auVar34);
                      local_428 = ZEXT416((uint)fVar192);
                      auVar265._0_4_ = fVar192 * (float)auStack_6d0._4_4_ + (float)local_6d8._0_4_;
                      auVar265._4_4_ = fVar192 * (float)auStack_6d0._8_4_ + (float)local_6d8._4_4_;
                      auVar265._8_4_ = fVar192 * 0.0 + 0.0;
                      auVar265._12_4_ = fVar192 * 0.0 + 0.0;
                      uVar311 = auVar265._8_8_;
                      local_808._8_4_ =
                           fVar192 * (float)auStack_6d0._12_4_ + (float)auStack_6d0._0_4_;
                      uVar254 = 0;
                      uVar253 = vmovlps_avx(auVar265);
                      local_808._0_4_ = (undefined4)uVar253;
                      local_808._4_4_ = (undefined4)((ulong)uVar253 >> 0x20);
                      SVar382 = UniformGridMediumProvider::Density
                                          (*(UniformGridMediumProvider **)auVar147,
                                           (Point3f *)local_808,lambda);
                      uStack_5e0 = uVar254;
                      local_5e8 = (undefined1  [8])SVar382.values.values._0_8_;
                      local_678._8_8_ = uVar311;
                      local_678._0_8_ = SVar382.values.values._8_8_;
                      p.super_Tuple3<pbrt::Point3,_float>.y = (float)local_808._4_4_;
                      p.super_Tuple3<pbrt::Point3,_float>.x = (float)local_808._0_4_;
                      p.super_Tuple3<pbrt::Point3,_float>.z = (float)local_808._8_4_;
                      auVar255 = SUB6456(ZEXT6064((undefined1  [60])0x0),4);
                      auVar312 = ZEXT856(0);
                      SVar382 = UniformGridMediumProvider::Le
                                          (*(UniformGridMediumProvider **)auVar147,p,lambda);
                      auVar298._0_8_ = SVar382.values.values._8_8_;
                      auVar298._8_56_ = auVar255;
                      auVar236._0_8_ = SVar382.values.values._0_8_;
                      auVar236._8_56_ = auVar312;
                      auVar172 = vfmadd231ss_fma(ZEXT416((uint)((float)local_808._4_4_ *
                                                               *(float *)((long)auVar147 + 0x7c))),
                                                 ZEXT416((uint)local_808._0_4_),
                                                 ZEXT416(*(uint *)((long)auVar147 + 0x78)));
                      auVar172 = vfmadd231ss_fma(auVar172,ZEXT416((uint)local_808._8_4_),
                                                 ZEXT416(*(uint *)((long)auVar147 + 0x80)));
                      fVar192 = auVar172._0_4_ + *(float *)((long)auVar147 + 0x84);
                      auVar172 = vfmadd231ss_fma(ZEXT416((uint)((float)local_808._4_4_ *
                                                               *(float *)((long)auVar147 + 0x8c))),
                                                 ZEXT416((uint)local_808._0_4_),
                                                 ZEXT416(*(uint *)((long)auVar147 + 0x88)));
                      auVar172 = vfmadd231ss_fma(auVar172,ZEXT416((uint)local_808._8_4_),
                                                 ZEXT416(*(uint *)((long)auVar147 + 0x90)));
                      fVar251 = auVar172._0_4_ + *(float *)((long)auVar147 + 0x94);
                      auVar172 = vfmadd231ss_fma(ZEXT416((uint)((float)local_808._4_4_ *
                                                               *(float *)((long)auVar147 + 0x9c))),
                                                 ZEXT416((uint)local_808._0_4_),
                                                 ZEXT416(*(uint *)((long)auVar147 + 0x98)));
                      auVar172 = vfmadd231ss_fma(auVar172,ZEXT416((uint)local_808._8_4_),
                                                 ZEXT416(*(uint *)((long)auVar147 + 0xa0)));
                      auVar169 = vfmadd231ss_fma(ZEXT416((uint)((float)local_808._4_4_ *
                                                               *(float *)((long)auVar147 + 0xac))),
                                                 ZEXT416((uint)local_808._0_4_),
                                                 ZEXT416(*(uint *)((long)auVar147 + 0xa8)));
                      auVar169 = vfmadd231ss_fma(auVar169,ZEXT416((uint)local_808._8_4_),
                                                 ZEXT416(*(uint *)((long)auVar147 + 0xb0)));
                      fVar252 = auVar169._0_4_ + *(float *)((long)auVar147 + 0xb4);
                      bVar163 = fVar252 == 1.0;
                      fVar368 = auVar172._0_4_ + *(float *)((long)auVar147 + 0xa4);
                      auVar266._0_4_ = local_418._16_4_ * local_418._16_4_;
                      auVar266._4_4_ = local_418._20_4_ * local_418._20_4_;
                      auVar266._8_8_ = 0;
                      auVar172 = vmovshdup_avx(auVar266);
                      fVar193 = (float)local_418._12_4_ * (float)local_418._12_4_ + auVar266._0_4_ +
                                auVar172._0_4_;
                      if (fVar193 < 0.0) {
                        local_2c8 = ZEXT416((uint)fVar192);
                        local_2d8 = ZEXT416((uint)fVar251);
                        local_388 = ZEXT416((uint)fVar368);
                        local_6e0 = fVar252;
                        local_2b8 = auVar298._0_16_;
                        local_2a8 = auVar236._0_16_;
                        fVar193 = sqrtf(fVar193);
                        fVar252 = local_6e0;
                        auVar172 = local_2a8;
                        auVar169 = local_2b8;
                        auVar166 = local_2c8;
                        auVar168 = local_388;
                        fVar251 = (float)local_2d8._0_4_;
                      }
                      else {
                        auVar172 = vsqrtss_avx(ZEXT416((uint)fVar193),ZEXT416((uint)fVar193));
                        fVar193 = auVar172._0_4_;
                        auVar172 = auVar236._0_16_;
                        auVar169 = auVar298._0_16_;
                        auVar166 = ZEXT416((uint)fVar192);
                        auVar168 = ZEXT416((uint)fVar368);
                      }
                      auVar268._0_4_ = (int)(float)local_5d8._0_4_;
                      auVar268._4_4_ = (int)(float)local_5d8._4_4_;
                      auVar268._8_4_ = (int)fStack_5d0;
                      auVar268._12_4_ = (int)fStack_5cc;
                      auVar173 = vpsrld_avx(local_708,0x17);
                      auVar333._8_4_ = 0xffffff81;
                      auVar333._0_8_ = 0xffffff81ffffff81;
                      auVar333._12_4_ = 0xffffff81;
                      auVar201 = vpaddd_avx(auVar268,auVar333);
                      auVar201 = vpaddd_avx(auVar201,auVar173);
                      uVar141 = vpcmpgtd_avx512vl(auVar201,auVar333);
                      uVar141 = uVar141 & 0xf;
                      auVar35._8_4_ = 0x7f;
                      auVar35._0_8_ = 0x7f0000007f;
                      auVar35._12_4_ = 0x7f;
                      uVar144 = vpcmpgtd_avx512vl(auVar201,auVar35);
                      uVar144 = uVar144 & 0xf;
                      auVar36._8_4_ = 0x807fffff;
                      auVar36._0_8_ = 0x807fffff807fffff;
                      auVar36._12_4_ = 0x807fffff;
                      auVar173 = vpandd_avx512vl(local_708,auVar36);
                      auVar201 = vpslld_avx(auVar201,0x17);
                      auVar37._8_4_ = 0x3f800000;
                      auVar37._0_8_ = 0x3f8000003f800000;
                      auVar37._12_4_ = 0x3f800000;
                      auVar201 = vpaddd_avx512vl(auVar201,auVar37);
                      auVar174 = vpord_avx512vl(auVar201,auVar173);
                      auVar170 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                      bVar15 = (bool)((byte)uVar144 & 1);
                      bVar12 = (bool)((byte)(uVar144 >> 1) & 1);
                      bVar13 = (bool)((byte)(uVar144 >> 2) & 1);
                      bVar14 = SUB81(uVar144 >> 3,0);
                      auVar201 = vmovlhps_avx(_local_5e8,local_678);
                      auVar334._0_4_ = auVar201._0_4_ * local_288;
                      auVar334._4_4_ = auVar201._4_4_ * fStack_284;
                      auVar334._8_4_ = auVar201._8_4_ * fStack_280;
                      auVar334._12_4_ = auVar201._12_4_ * fStack_27c;
                      auVar173 = vshufpd_avx(auVar334,auVar334,1);
                      auVar317._0_4_ = auVar201._0_4_ * (float)local_298;
                      auVar317._4_4_ = auVar201._4_4_ * local_298._4_4_;
                      auVar317._8_4_ = auVar201._8_4_ * fStack_290;
                      auVar317._12_4_ = auVar201._12_4_ * fStack_28c;
                      auVar201 = vshufpd_avx(auVar317,auVar317,1);
                      auStack_4a0[0]._0_4_ =
                           (float)local_828._0_4_ *
                           (float)((uint)bVar15 * auVar170._0_4_ |
                                  (uint)!bVar15 * (uint)((byte)uVar141 & 1) * auVar174._0_4_);
                      auStack_4a0[0]._4_4_ =
                           (float)local_828._4_4_ *
                           (float)((uint)bVar12 * auVar170._4_4_ |
                                  (uint)!bVar12 * (uint)((byte)(uVar141 >> 1) & 1) * auVar174._4_4_)
                      ;
                      auStack_4a0[1]._0_4_ =
                           fStack_820 *
                           (float)((uint)bVar13 * auVar170._8_4_ |
                                  (uint)!bVar13 * (uint)((byte)(uVar141 >> 2) & 1) * auVar174._8_4_)
                      ;
                      auStack_4a0[1]._4_4_ =
                           fStack_81c *
                           (float)((uint)bVar14 * auVar170._12_4_ |
                                  (uint)!bVar14 * (uint)(byte)(uVar141 >> 3) * auVar174._12_4_);
                      fVar192 = auVar166._0_4_ / fVar252;
                      auVar177._4_12_ = auVar166._4_12_;
                      auVar177._0_4_ = fVar192;
                      fVar368 = auVar168._0_4_ / fVar252;
                      auVar178._4_12_ = auVar168._4_12_;
                      auVar178._0_4_ = fVar368;
                      auVar177._16_48_ = in_ZmmResult._16_48_;
                      auVar176._4_60_ = auVar177._4_60_;
                      auVar176._0_4_ =
                           (uint)bVar163 * (int)auVar166._0_4_ + (uint)!bVar163 * (int)fVar192;
                      iVar139 = (uint)bVar163 * (int)fVar251 +
                                (uint)!bVar163 * (int)(fVar251 / fVar252);
                      auVar178._16_48_ = in_ZmmResult._16_48_;
                      in_ZmmResult._4_60_ = auVar178._4_60_;
                      in_ZmmResult._0_4_ =
                           (float)((uint)bVar163 * (int)auVar168._0_4_ +
                                  (uint)!bVar163 * (int)fVar368);
                      auVar373._0_8_ = local_418._12_8_ ^ 0x8000000080000000;
                      auVar373._8_4_ = 0x80000000;
                      auVar373._12_4_ = 0x80000000;
                      auVar376._4_4_ = fVar193;
                      auVar376._0_4_ = fVar193;
                      auVar376._8_4_ = fVar193;
                      auVar376._12_4_ = fVar193;
                      auVar166 = vdivps_avx(auVar373,auVar376);
                      auVar377._0_4_ = -(float)local_418._20_4_;
                      auVar377._4_4_ = 0x80000000;
                      auVar377._8_4_ = 0x80000000;
                      auVar377._12_4_ = 0x80000000;
                      auVar204._0_4_ = auVar377._0_4_ / fVar193;
                      auVar204._4_12_ = auVar377._4_12_;
                      local_538._120_8_ = local_7c8._0_8_;
                      local_4b8.bits._0_4_ = local_7c8._8_4_;
                      local_4b8.bits._4_4_ = local_7c8._12_4_;
                      auVar362._4_4_ = iVar139;
                      auVar362._0_4_ = iVar139;
                      auVar362._8_4_ = iVar139;
                      auVar362._12_4_ = iVar139;
                      auVar369._4_4_ = in_ZmmResult._0_4_;
                      auVar369._0_4_ = in_ZmmResult._0_4_;
                      auVar369._8_4_ = in_ZmmResult._0_4_;
                      auVar369._12_4_ = in_ZmmResult._0_4_;
                      local_538._40_4_ = 0.0;
                      local_538._44_4_ = 0.0;
                      local_538._48_4_ = 0.0;
                      local_538._52_4_ = 0.0;
                      local_538._56_4_ = 0.0;
                      auVar168 = vshufps_avx(auVar176._0_16_,auVar362,0x40);
                      local_538._0_4_ = auVar168._0_4_;
                      local_538._4_4_ = auVar168._4_4_;
                      local_538._8_4_ = auVar168._8_4_;
                      local_538._12_4_ = auVar168._12_4_;
                      uVar253 = vmovlps_avx(auVar369);
                      local_538._16_4_ = (undefined4)uVar253;
                      local_538._20_4_ = (undefined4)((ulong)uVar253 >> 0x20);
                      local_538._24_4_ = afStack_400[0];
                      uVar253 = vmovlps_avx(auVar166);
                      local_538._28_4_ = (undefined4)uVar253;
                      local_538._32_4_ = (undefined4)((ulong)uVar253 >> 0x20);
                      local_538._64_4_ = (anon_struct_4_0_00000001_for___align)0x0;
                      local_538._68_4_ = 0.0;
                      local_538._72_4_ = local_748._0_4_;
                      local_538._76_4_ = local_748._4_4_;
                      local_538._80_4_ = (undefined4)local_5c0;
                      local_538._84_4_ = (undefined4)(local_5c0 >> 0x20);
                      auVar230._16_16_ = auVar201;
                      auVar230._0_16_ = auVar204;
                      auVar354._16_16_ = auVar173;
                      auVar354._0_16_ = auVar204;
                      auVar232 = vperm2f128_avx(auVar354,auVar230,0x31);
                      auVar327._16_16_ = auVar317;
                      auVar327._0_16_ = auVar334;
                      auVar232 = vunpcklpd_avx(auVar327,auVar232);
                      local_538._88_4_ = auVar232._0_4_;
                      local_538._92_8_ = auVar232._4_8_;
                      local_538._100_4_ = auVar232._12_4_;
                      local_538._104_16_ = auVar232._16_16_;
                      auVar168 = vmovlhps_avx(auVar172,auVar169);
                      uStack_4b0 = auVar168._0_4_;
                      uStack_4ac._0_4_ = auVar168._4_4_;
                      stack0xfffffffffffffb58 = auVar168._8_8_;
                      in_ZMM8 = ZEXT1664(auVar369);
                      in_ZMM9 = ZEXT1664(auVar166);
                      in_ZMM10 = ZEXT464((uint)afStack_400[0]);
                      in_ZMM12 = ZEXT1664(auVar172);
                      in_ZMM13 = ZEXT1664(auVar169);
                      local_538._36_4_ = auVar204._0_4_;
                      bVar163 = Li::anon_class_120_15_cd2b6fed::operator()
                                          (&local_668,(MediumSample *)local_538);
                      cVar164 = !bVar163;
                      if ((bool)cVar164) {
                        local_168._8_4_ = 0x3f800000;
                        local_168._0_8_ = 0x3f8000003f800000;
                        local_168._12_4_ = 0x3f800000;
                      }
                      else {
                        local_808._32_4_ = local_428._0_4_;
                      }
                      fStack_820 = 1.0;
                      local_828 = (undefined1  [8])0x3f8000003f800000;
                      fStack_81c = 1.0;
                      auVar357 = ZEXT464((uint)local_558._0_4_);
                      auVar147 = local_378;
                      lambda = local_790;
                    }
                  }
                } while (cVar164 == '\0');
                if (cVar164 == '\n') {
                  auVar169 = ZEXT416((uint)local_808._32_4_);
                  auVar367 = ZEXT1664(local_2e8);
                  auVar172 = ZEXT416((uint)local_758._0_4_);
                  lVar151 = local_3a0;
                  goto LAB_003d4dbc;
                }
                auVar169 = ZEXT416((uint)local_808._32_4_);
                auVar347 = ZEXT464((uint)local_778);
                auVar367 = ZEXT1664(local_2e8);
              }
              else {
                auVar17._8_4_ = 0x80000000;
                auVar17._0_8_ = 0x8000000080000000;
                auVar17._12_4_ = 0x80000000;
                auVar166 = vxorps_avx512vl(auVar166,auVar17);
                fVar192 = auVar172._0_4_ - auVar346._0_4_;
                auVar200._0_4_ = fVar192 * auVar166._0_4_;
                auVar200._4_4_ = fVar192 * auVar166._4_4_;
                auVar200._8_4_ = fVar192 * auVar166._8_4_;
                auVar200._12_4_ = fVar192 * auVar166._12_4_;
                auVar18._8_4_ = 0x3fb8aa3b;
                auVar18._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar18._12_4_ = 0x3fb8aa3b;
                auVar168 = vmulps_avx512vl(auVar200,auVar18);
                auVar166 = vroundps_avx(auVar168,9);
                auVar168 = vsubps_avx(auVar168,auVar166);
                auVar263._0_4_ = (int)auVar166._0_4_;
                auVar263._4_4_ = (int)auVar166._4_4_;
                auVar263._8_4_ = (int)auVar166._8_4_;
                auVar263._12_4_ = (int)auVar166._12_4_;
                auVar315._8_4_ = 0x3da00ac9;
                auVar315._0_8_ = 0x3da00ac93da00ac9;
                auVar315._12_4_ = 0x3da00ac9;
                auVar19._8_4_ = 0x3e679a0b;
                auVar19._0_8_ = 0x3e679a0b3e679a0b;
                auVar19._12_4_ = 0x3e679a0b;
                auVar166 = vfmadd213ps_avx512vl(auVar315,auVar168,auVar19);
                auVar20._8_4_ = 0x3f321004;
                auVar20._0_8_ = 0x3f3210043f321004;
                auVar20._12_4_ = 0x3f321004;
                auVar166 = vfmadd213ps_avx512vl(auVar166,auVar168,auVar20);
                auVar21._8_4_ = 0x3f800000;
                auVar21._0_8_ = 0x3f8000003f800000;
                auVar21._12_4_ = 0x3f800000;
                auVar168 = vfmadd213ps_avx512vl(auVar166,auVar168,auVar21);
                auVar201 = vpsrld_avx(auVar168,0x17);
                auVar331._8_4_ = 0xffffff81;
                auVar331._0_8_ = 0xffffff81ffffff81;
                auVar331._12_4_ = 0xffffff81;
                auVar166 = vpaddd_avx(auVar263,auVar331);
                auVar166 = vpaddd_avx(auVar166,auVar201);
                uVar141 = vpcmpgtd_avx512vl(auVar166,auVar331);
                uVar141 = uVar141 & 0xf;
                auVar22._8_4_ = 0x7f;
                auVar22._0_8_ = 0x7f0000007f;
                auVar22._12_4_ = 0x7f;
                uVar144 = vpcmpgtd_avx512vl(auVar166,auVar22);
                uVar144 = uVar144 & 0xf;
                auVar23._8_4_ = 0x807fffff;
                auVar23._0_8_ = 0x807fffff807fffff;
                auVar23._12_4_ = 0x807fffff;
                auVar168 = vpandd_avx512vl(auVar168,auVar23);
                auVar166 = vpslld_avx(auVar166,0x17);
                auVar24._8_4_ = 0x3f800000;
                auVar24._0_8_ = 0x3f8000003f800000;
                auVar24._12_4_ = 0x3f800000;
                auVar166 = vpaddd_avx512vl(auVar166,auVar24);
                auVar166 = vpord_avx512vl(auVar166,auVar168);
                auVar168 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                bVar163 = (bool)((byte)uVar144 & 1);
                in_ZmmResult._0_4_ =
                     (float)((uint)bVar163 * auVar168._0_4_ |
                            (uint)!bVar163 * (uint)((byte)uVar141 & 1) * auVar166._0_4_);
                bVar163 = (bool)((byte)(uVar144 >> 1) & 1);
                in_ZmmResult._4_4_ =
                     (float)((uint)bVar163 * auVar168._4_4_ |
                            (uint)!bVar163 * (uint)((byte)(uVar141 >> 1) & 1) * auVar166._4_4_);
                bVar163 = (bool)((byte)(uVar144 >> 2) & 1);
                in_ZmmResult._8_4_ =
                     (float)((uint)bVar163 * auVar168._8_4_ |
                            (uint)!bVar163 * (uint)((byte)(uVar141 >> 2) & 1) * auVar166._8_4_);
                bVar163 = SUB81(uVar144 >> 3,0);
                in_ZmmResult._12_4_ =
                     (float)((uint)bVar163 * auVar168._12_4_ |
                            (uint)!bVar163 * (uint)(byte)(uVar141 >> 3) * auVar166._12_4_);
                local_828._4_4_ = in_ZmmResult._4_4_ * (float)local_828._4_4_;
                local_828._0_4_ = in_ZmmResult._0_4_ * (float)local_828._0_4_;
                fStack_820 = in_ZmmResult._8_4_ * fStack_820;
                fStack_81c = in_ZmmResult._12_4_ * fStack_81c;
LAB_003d4dbc:
                auVar347 = ZEXT464((uint)local_778);
                cVar164 = '\b';
                if ((*(float *)(local_368 + lVar151 * 4) <= local_778) &&
                   (iVar139 = *(int *)(local_728 + lVar151 * 4) +
                              *(int *)((long)&local_588 + lVar151 * 4),
                   *(int *)(local_728 + lVar151 * 4) = iVar139,
                   iVar139 != *(int *)(local_318 + lVar151 * 4))) {
                  *(float *)(local_368 + lVar151 * 4) =
                       *(float *)(local_368 + lVar151 * 4) +
                       *(float *)((long)&local_1c0.bxdf.
                                         super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
                                         .bits + lVar151 * 4);
                  cVar164 = '\0';
                  auVar169 = auVar172;
                }
              }
              auVar346 = ZEXT1664(auVar169);
            } while (cVar164 == '\0');
            auVar201 = local_168;
            if (cVar164 == '\b') {
              auVar201 = _local_828;
            }
          }
          auVar172 = vshufpd_avx(auVar201,auVar201,1);
          local_168 = auVar201;
        }
        else {
          local_668.T_hat = &local_788;
          local_668.terminated = &local_82a;
          local_668.uniPathPDF = &local_7a8;
          local_668.lightPathPDF = &local_6f8;
          local_668.depth = (int *)(local_808 + 0x1c);
          local_668.this = local_7b0;
          local_668.L = &local_738;
          local_668.lambda = local_790;
          local_668.rng = (RNG *)local_278;
          local_668.sampler = local_7d8;
          local_668.ray = (RayDifferential *)local_808._16_8_;
          local_668.prevIntrContext = &local_5b8;
          local_668.scattered = &local_829;
          local_668.specularBounce = &local_82c;
          local_668.anyNonSpecularBounces = &local_82b;
          auVar196._0_4_ = (float)local_808._32_4_ * (float)local_808._32_4_;
          auVar196._4_4_ = fStack_7e4 * fStack_7e4;
          auVar196._8_4_ = fStack_7e0 * fStack_7e0;
          auVar196._12_4_ = fStack_7dc * fStack_7dc;
          auVar172 = vhaddps_avx(auVar196,auVar196);
          fVar192 = (float)local_828._0_4_ * (float)local_828._0_4_ + auVar172._0_4_;
          if (fVar192 < 0.0) {
            local_708._0_4_ = fVar192;
            local_778 = sqrtf(fVar192);
            fVar192 = (float)local_708._0_4_;
          }
          else {
            auVar172 = vsqrtss_avx(ZEXT416((uint)fVar192),ZEXT416((uint)fVar192));
            local_778 = auVar172._0_4_;
          }
          auVar312 = (undefined1  [56])0x0;
          auVar147 = local_748;
          if (fVar192 < 0.0) {
            auVar312 = (undefined1  [56])0x0;
            auVar233._0_4_ = sqrtf(fVar192);
            auVar233._4_60_ = extraout_var_01;
            local_678 = auVar233._0_16_;
          }
          else {
            local_678 = vsqrtss_avx(ZEXT416((uint)fVar192),ZEXT416((uint)fVar192));
          }
          this_01 = (DenselySampledSpectrum *)((ulong)auVar147 & 0xffffffffffff);
          uVar253 = 0;
          _local_748 = ZEXT416((uint)this_01[3].lambda_min);
          SVar382 = DenselySampledSpectrum::Sample(this_01,lambda);
          auVar294._0_8_ = SVar382.values.values._8_8_;
          auVar294._8_56_ = auVar312;
          local_708._8_8_ = uVar253;
          local_708._0_8_ = SVar382.values.values._0_8_;
          _local_5d8 = auVar294._0_16_;
          auVar255 = (undefined1  [56])0x0;
          _local_5e8 = ZEXT416((uint)this_01[3].lambda_min);
          SVar382 = DenselySampledSpectrum::Sample(this_01 + 1,lambda);
          auVar295._0_8_ = SVar382.values.values._8_8_;
          auVar295._8_56_ = auVar312;
          auVar234._0_8_ = SVar382.values.values._0_8_;
          auVar234._8_56_ = auVar255;
          auVar172 = vunpcklpd_avx(local_708,_local_5d8);
          fVar193 = (float)local_748._0_4_ * auVar172._0_4_;
          fVar348 = (float)local_748._0_4_ * auVar172._4_4_;
          fVar349 = (float)local_748._0_4_ * auVar172._8_4_;
          fVar350 = (float)local_748._0_4_ * auVar172._12_4_;
          auVar172 = vmovlhps_avx(auVar234._0_16_,auVar295._0_16_);
          fVar192 = (float)local_5e8._0_4_ * auVar172._0_4_;
          fVar251 = (float)local_5e8._0_4_ * auVar172._4_4_;
          fVar252 = (float)local_5e8._0_4_ * auVar172._8_4_;
          fVar368 = (float)local_5e8._0_4_ * auVar172._12_4_;
          auVar313._0_4_ = fVar192 + fVar193;
          auVar313._4_4_ = fVar251 + fVar348;
          auVar313._8_4_ = fVar252 + fVar349;
          auVar313._12_4_ = fVar368 + fVar350;
          bVar163 = ABS(local_778 * (float)local_7c8._0_4_) == INFINITY;
          uVar157 = (uint)bVar163 * 0x7f7fffff +
                    (uint)!bVar163 * (int)(local_778 * (float)local_7c8._0_4_);
          if ((auVar313._0_4_ != 0.0) || (NAN(auVar313._0_4_))) {
            local_748._4_4_ = fVar348;
            local_748._0_4_ = fVar193;
            fStack_740 = fVar349;
            fStack_73c = fVar350;
            fVar193 = 1.0 - (float)local_558._0_4_;
            local_558 = ZEXT1632(auVar313);
            local_7c8 = ZEXT416(uVar157);
            in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
            in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
            in_ZMM10 = ZEXT1664(in_ZMM10._0_16_);
            in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
            in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
            local_778 = fVar192;
            fStack_774 = fVar251;
            fStack_770 = fVar252;
            fStack_76c = fVar368;
            fVar192 = logf(fVar193);
            auVar313 = local_558._0_16_;
            fVar192 = -fVar192 / local_558._0_4_;
            if ((float)local_7c8._0_4_ <= fVar192) {
              auVar165._0_8_ = CONCAT44(local_7c8._0_4_,local_7c8._0_4_) ^ 0x8000000080000000;
              auVar165._8_4_ = -(float)local_7c8._0_4_;
              auVar165._12_4_ = -(float)local_7c8._0_4_;
              goto LAB_003d6d12;
            }
            local_7c8._0_8_ = CONCAT44(extraout_var_00._0_4_,fVar192) ^ 0x8000000000000000;
            local_7c8._8_4_ = extraout_var_00._4_4_ ^ 0x80000000;
            local_7c8._12_4_ = extraout_var_00._8_4_ ^ 0x80000000;
            auVar215._0_4_ = local_558._0_4_ * -fVar192;
            auVar215._4_4_ = local_558._4_4_ * -fVar192;
            auVar215._8_4_ = local_558._8_4_ * -fVar192;
            auVar215._12_4_ = local_558._12_4_ * -fVar192;
            auVar53._8_4_ = 0x3fb8aa3b;
            auVar53._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar53._12_4_ = 0x3fb8aa3b;
            auVar172 = vmulps_avx512vl(auVar215,auVar53);
            _local_5e8 = vroundps_avx(auVar172,9);
            auVar172 = vsubps_avx(auVar172,_local_5e8);
            auVar283._8_4_ = 0x3da00ac9;
            auVar283._0_8_ = 0x3da00ac93da00ac9;
            auVar283._12_4_ = 0x3da00ac9;
            auVar54._8_4_ = 0x3e679a0b;
            auVar54._0_8_ = 0x3e679a0b3e679a0b;
            auVar54._12_4_ = 0x3e679a0b;
            auVar169 = vfmadd213ps_avx512vl(auVar283,auVar172,auVar54);
            auVar55._8_4_ = 0x3f321004;
            auVar55._0_8_ = 0x3f3210043f321004;
            auVar55._12_4_ = 0x3f321004;
            auVar169 = vfmadd213ps_avx512vl(auVar169,auVar172,auVar55);
            auVar56._8_4_ = 0x3f800000;
            auVar56._0_8_ = 0x3f8000003f800000;
            auVar56._12_4_ = 0x3f800000;
            _local_5d8 = vfmadd213ps_avx512vl(auVar169,auVar172,auVar56);
            local_708 = ZEXT416((uint)this_01[3].lambda_max);
            auVar312 = ZEXT856(0);
            auVar255 = ZEXT856(local_5d8._8_8_);
            auVar174 = in_ZMM13._0_16_;
            SVar382 = DenselySampledSpectrum::Sample(this_01 + 2,lambda);
            auVar304._0_8_ = SVar382.values.values._8_8_;
            auVar304._8_56_ = auVar255;
            auVar241._0_8_ = SVar382.values.values._0_8_;
            auVar241._8_56_ = auVar312;
            auVar168 = vshufpd_avx(_local_748,_local_748,1);
            auVar343._4_4_ = local_678._0_4_;
            auVar343._0_4_ = local_678._0_4_;
            auVar343._8_4_ = local_678._0_4_;
            auVar343._12_4_ = local_678._0_4_;
            auVar172 = vdivps_avx(stack0xfffffffffffff818,auVar343);
            fVar368 = local_828._0_4_ / (float)local_678._0_4_;
            auVar173 = local_558._0_16_;
            auVar201 = vshufpd_avx(auVar173,auVar173,1);
            auVar361._0_4_ = (int)(float)local_5e8._0_4_;
            auVar361._4_4_ = (int)(float)local_5e8._4_4_;
            auVar361._8_4_ = (int)(float)uStack_5e0;
            auVar361._12_4_ = (int)uStack_5e0._4_4_;
            auVar166 = vpsrld_avx(_local_5d8,0x17);
            auVar372._8_4_ = 0xffffff81;
            auVar372._0_8_ = 0xffffff81ffffff81;
            auVar372._12_4_ = 0xffffff81;
            auVar169 = vpaddd_avx(auVar372,auVar361);
            auVar169 = vpaddd_avx(auVar169,auVar166);
            uVar141 = vpcmpgtd_avx512vl(auVar169,auVar372);
            uVar141 = uVar141 & 0xf;
            auVar57._8_4_ = 0x7f;
            auVar57._0_8_ = 0x7f0000007f;
            auVar57._12_4_ = 0x7f;
            uVar144 = vpcmpgtd_avx512vl(auVar169,auVar57);
            uVar144 = uVar144 & 0xf;
            auVar58._8_4_ = 0x807fffff;
            auVar58._0_8_ = 0x807fffff807fffff;
            auVar58._12_4_ = 0x807fffff;
            auVar166 = vpandd_avx512vl(_local_5d8,auVar58);
            auVar169 = vpslld_avx(auVar169,0x17);
            auVar59._8_4_ = 0x3f800000;
            auVar59._0_8_ = 0x3f8000003f800000;
            auVar59._12_4_ = 0x3f800000;
            auVar169 = vpaddd_avx512vl(auVar169,auVar59);
            auVar169 = vpord_avx512vl(auVar169,auVar166);
            auVar166 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            bVar163 = (bool)((byte)uVar144 & 1);
            in_ZmmResult._0_4_ =
                 (float)((uint)bVar163 * auVar166._0_4_ |
                        (uint)!bVar163 * (uint)((byte)uVar141 & 1) * auVar169._0_4_);
            bVar163 = (bool)((byte)(uVar144 >> 1) & 1);
            in_ZmmResult._4_4_ =
                 (float)((uint)bVar163 * auVar166._4_4_ |
                        (uint)!bVar163 * (uint)((byte)(uVar141 >> 1) & 1) * auVar169._4_4_);
            bVar163 = (bool)((byte)(uVar144 >> 2) & 1);
            in_ZmmResult._8_4_ =
                 (float)((uint)bVar163 * auVar166._8_4_ |
                        (uint)!bVar163 * (uint)((byte)(uVar141 >> 2) & 1) * auVar169._8_4_);
            bVar163 = SUB81(uVar144 >> 3,0);
            in_ZmmResult._12_4_ =
                 (float)((uint)bVar163 * auVar166._12_4_ |
                        (uint)!bVar163 * (uint)(byte)(uVar141 >> 3) * auVar169._12_4_);
            auVar169 = vmovlhps_avx(auVar241._0_16_,auVar304._0_16_);
            auVar216._0_4_ = (float)local_708._0_4_ * auVar169._0_4_;
            auVar216._4_4_ = (float)local_708._0_4_ * auVar169._4_4_;
            auVar216._8_4_ = (float)local_708._0_4_ * auVar169._8_4_;
            auVar216._12_4_ = (float)local_708._0_4_ * auVar169._12_4_;
            auVar169 = vmovshdup_avx(auVar172);
            fVar192 = local_768._0_4_ + (float)local_7c8._0_4_ * auVar172._0_4_;
            auVar166 = vmovshdup_avx(_local_768);
            fVar251 = auVar166._0_4_ + (float)local_7c8._0_4_ * auVar169._0_4_;
            fVar252 = (float)local_7c8._0_4_ * fVar368 + (float)local_758._0_4_;
            auVar344._0_8_ = auVar172._0_8_ ^ 0x8000000080000000;
            auVar344._8_4_ = auVar172._8_4_ ^ 0x80000000;
            auVar344._12_4_ = auVar172._12_4_ ^ 0x80000000;
            local_538._36_4_ = -fVar368;
            local_538._108_4_ = fStack_774;
            local_538._104_4_ = local_778;
            local_538._112_4_ = fStack_770;
            local_538._116_4_ = fStack_76c;
            local_538._72_8_ = &this_01[0x66666666666].values.ptr;
            local_538._84_4_ = (uint)((ulong)&this_01[3].values >> 0x20) | 0x10000;
            auVar284._4_4_ = fVar192;
            auVar284._0_4_ = fVar192;
            auVar284._8_4_ = fVar192;
            auVar284._12_4_ = fVar192;
            auVar365._4_4_ = fVar251;
            auVar365._0_4_ = fVar251;
            auVar365._8_4_ = fVar251;
            auVar365._12_4_ = fVar251;
            auVar172 = vmovlhps_avx(auVar284,auVar365);
            auVar366._4_4_ = fVar252;
            auVar366._0_4_ = fVar252;
            auVar366._8_4_ = fVar252;
            auVar366._12_4_ = fVar252;
            local_538._40_4_ = 0.0;
            local_538._44_4_ = 0.0;
            local_538._48_4_ = 0.0;
            local_538._52_4_ = 0.0;
            local_538._56_4_ = 0.0;
            local_538._0_4_ = auVar172._0_4_;
            local_538._4_4_ = auVar172._4_4_;
            local_538._8_4_ = auVar172._8_4_;
            local_538._12_4_ = auVar172._12_4_;
            uVar253 = vmovlps_avx(auVar366);
            local_538._16_4_ = (undefined4)uVar253;
            local_538._20_4_ = (undefined4)((ulong)uVar253 >> 0x20);
            local_538._24_4_ = vextractps_avx(_local_828,1);
            uVar253 = vmovlps_avx(auVar344);
            local_538._28_4_ = (undefined4)uVar253;
            local_538._32_4_ = (undefined4)((ulong)uVar253 >> 0x20);
            local_538._64_4_ = (anon_struct_4_0_00000001_for___align)0x0;
            local_538._68_4_ = 0.0;
            local_538._80_4_ = SUB84(&this_01[3].values,0);
            auVar172 = vunpcklpd_avx(_local_748,auVar168);
            local_538._88_4_ = auVar172._0_4_;
            local_538._92_8_ = auVar172._4_8_;
            local_538._100_4_ = auVar172._12_4_;
            auVar293._16_16_ = auVar216;
            auVar293._0_16_ = auVar173;
            auVar330._16_16_ = auVar201;
            auVar330._0_16_ = auVar216;
            auVar232 = vperm2f128_avx(auVar330,ZEXT1632(auVar216),0x21);
            auVar232 = vshufpd_avx(auVar293,auVar232,8);
            local_538._120_8_ = auVar232._0_8_;
            local_4b8.bits._0_4_ = auVar232._8_4_;
            local_4b8.bits._4_4_ = auVar232._12_4_;
            uStack_4b0 = auVar232._16_4_;
            uStack_4ac._0_4_ = auVar232._20_4_;
            stack0xfffffffffffffb58 = auVar232._24_8_;
            in_ZMM8 = ZEXT1264(ZEXT812(0));
            in_ZMM9 = ZEXT1664(local_538._104_16_);
            in_ZMM10 = ZEXT1664(_local_828);
            in_ZMM12 = ZEXT1664(_local_748);
            in_ZMM13 = ZEXT1664(auVar174);
            auStack_4a0[0]._0_4_ = in_ZmmResult._0_4_;
            auStack_4a0[0]._4_4_ = in_ZmmResult._4_4_;
            auStack_4a0[1]._0_4_ = in_ZmmResult._8_4_;
            auStack_4a0[1]._4_4_ = in_ZmmResult._12_4_;
            Li::anon_class_120_15_cd2b6fed::operator()(&local_668,(MediumSample *)local_538);
            auVar201._8_4_ = 0x3f800000;
            auVar201._0_8_ = 0x3f8000003f800000;
            auVar201._12_4_ = 0x3f800000;
          }
          else {
            auVar197._4_4_ = uVar157;
            auVar197._0_4_ = uVar157;
            auVar197._8_4_ = uVar157;
            auVar197._12_4_ = uVar157;
            auVar45._8_4_ = 0x80000000;
            auVar45._0_8_ = 0x8000000080000000;
            auVar45._12_4_ = 0x80000000;
            auVar165 = vxorps_avx512vl(auVar197,auVar45);
LAB_003d6d12:
            auVar217._0_4_ = auVar313._0_4_ * auVar165._0_4_;
            auVar217._4_4_ = auVar313._4_4_ * auVar165._4_4_;
            auVar217._8_4_ = auVar313._8_4_ * auVar165._8_4_;
            auVar217._12_4_ = auVar313._12_4_ * auVar165._12_4_;
            auVar46._8_4_ = 0x3fb8aa3b;
            auVar46._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar46._12_4_ = 0x3fb8aa3b;
            auVar169 = vmulps_avx512vl(auVar217,auVar46);
            auVar172 = vroundps_avx(auVar169,9);
            auVar169 = vsubps_avx(auVar169,auVar172);
            auVar285._0_4_ = (int)auVar172._0_4_;
            auVar285._4_4_ = (int)auVar172._4_4_;
            auVar285._8_4_ = (int)auVar172._8_4_;
            auVar285._12_4_ = (int)auVar172._12_4_;
            auVar325._8_4_ = 0x3da00ac9;
            auVar325._0_8_ = 0x3da00ac93da00ac9;
            auVar325._12_4_ = 0x3da00ac9;
            auVar47._8_4_ = 0x3e679a0b;
            auVar47._0_8_ = 0x3e679a0b3e679a0b;
            auVar47._12_4_ = 0x3e679a0b;
            auVar172 = vfmadd213ps_avx512vl(auVar325,auVar169,auVar47);
            auVar48._8_4_ = 0x3f321004;
            auVar48._0_8_ = 0x3f3210043f321004;
            auVar48._12_4_ = 0x3f321004;
            auVar172 = vfmadd213ps_avx512vl(auVar172,auVar169,auVar48);
            auVar49._8_4_ = 0x3f800000;
            auVar49._0_8_ = 0x3f8000003f800000;
            auVar49._12_4_ = 0x3f800000;
            auVar169 = vfmadd213ps_avx512vl(auVar172,auVar169,auVar49);
            auVar166 = vpsrld_avx(auVar169,0x17);
            auVar345._8_4_ = 0xffffff81;
            auVar345._0_8_ = 0xffffff81ffffff81;
            auVar345._12_4_ = 0xffffff81;
            auVar172 = vpaddd_avx(auVar285,auVar345);
            auVar172 = vpaddd_avx(auVar172,auVar166);
            uVar141 = vpcmpgtd_avx512vl(auVar172,auVar345);
            uVar141 = uVar141 & 0xf;
            auVar50._8_4_ = 0x7f;
            auVar50._0_8_ = 0x7f0000007f;
            auVar50._12_4_ = 0x7f;
            uVar144 = vpcmpgtd_avx512vl(auVar172,auVar50);
            uVar144 = uVar144 & 0xf;
            auVar51._8_4_ = 0x807fffff;
            auVar51._0_8_ = 0x807fffff807fffff;
            auVar51._12_4_ = 0x807fffff;
            auVar169 = vpandd_avx512vl(auVar169,auVar51);
            auVar172 = vpslld_avx(auVar172,0x17);
            auVar52._8_4_ = 0x3f800000;
            auVar52._0_8_ = 0x3f8000003f800000;
            auVar52._12_4_ = 0x3f800000;
            auVar172 = vpaddd_avx512vl(auVar172,auVar52);
            auVar172 = vpord_avx512vl(auVar172,auVar169);
            auVar169 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            bVar163 = (bool)((byte)uVar144 & 1);
            auVar201._0_4_ =
                 (uint)bVar163 * auVar169._0_4_ |
                 (uint)!bVar163 * (uint)((byte)uVar141 & 1) * auVar172._0_4_;
            bVar163 = (bool)((byte)(uVar144 >> 1) & 1);
            auVar201._4_4_ =
                 (uint)bVar163 * auVar169._4_4_ |
                 (uint)!bVar163 * (uint)((byte)(uVar141 >> 1) & 1) * auVar172._4_4_;
            bVar163 = (bool)((byte)(uVar144 >> 2) & 1);
            auVar201._8_4_ =
                 (uint)bVar163 * auVar169._8_4_ |
                 (uint)!bVar163 * (uint)((byte)(uVar141 >> 2) & 1) * auVar172._8_4_;
            bVar163 = SUB81(uVar144 >> 3,0);
            auVar201._12_4_ =
                 (uint)bVar163 * auVar169._12_4_ |
                 (uint)!bVar163 * (uint)(byte)(uVar141 >> 3) * auVar172._12_4_;
            in_ZmmResult._0_16_ = auVar201;
          }
          auVar172 = vshufpd_avx(auVar201,auVar201,1);
        }
      }
      else if (sVar108 == 3) {
        local_418._0_8_ = vmovlps_avx(_local_768);
        local_418._8_4_ = local_758._0_4_;
        unique0x00106900 = vunpcklpd_avx(stack0xfffffffffffff818,_local_828);
        local_668.T_hat = &local_788;
        local_668.terminated = &local_82a;
        local_668.uniPathPDF = &local_7a8;
        local_668.lightPathPDF = &local_6f8;
        local_668.depth = (int *)(local_808 + 0x1c);
        local_668.this = local_7b0;
        local_668.L = &local_738;
        local_668.lambda = local_790;
        local_668.rng = (RNG *)local_278;
        local_668.sampler = local_7d8;
        local_668.ray = (RayDifferential *)local_808._16_8_;
        local_668.prevIntrContext = &local_5b8;
        local_668.scattered = &local_829;
        local_668.specularBounce = &local_82c;
        local_668.anyNonSpecularBounces = &local_82b;
        local_7d0 = (float)local_7c8._0_4_;
        uVar141 = uVar141 & 0xffffffffffff;
        local_3f8.
        super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
        .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                 )(TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                   )TVar8.bits;
        Transform::ApplyInverse
                  ((Ray *)local_6d8,(Transform *)(uVar141 + 0x78),(Ray *)local_418,&local_7d0);
        auVar258._0_4_ = (float)auStack_6d0._8_4_ * (float)auStack_6d0._8_4_;
        auVar258._4_4_ = (float)auStack_6d0._12_4_ * (float)auStack_6d0._12_4_;
        auVar258._8_8_ = 0;
        auVar172 = vmovshdup_avx(auVar258);
        fVar192 = (float)auStack_6d0._4_4_ * (float)auStack_6d0._4_4_ + auVar258._0_4_ +
                  auVar172._0_4_;
        if (fVar192 < 0.0) {
          fVar192 = sqrtf(fVar192);
        }
        else {
          auVar172 = vsqrtss_avx(ZEXT416((uint)fVar192),ZEXT416((uint)fVar192));
          fVar192 = auVar172._0_4_;
        }
        local_7d0 = fVar192 * local_7d0;
        auVar260._0_4_ = (float)auStack_6d0._8_4_ * (float)auStack_6d0._8_4_;
        auVar260._4_4_ = (float)auStack_6d0._12_4_ * (float)auStack_6d0._12_4_;
        auVar260._8_8_ = 0;
        auVar172 = vmovshdup_avx(auVar260);
        fVar192 = (float)auStack_6d0._4_4_ * (float)auStack_6d0._4_4_ + auVar260._0_4_ +
                  auVar172._0_4_;
        if (fVar192 < 0.0) {
          fVar192 = sqrtf(fVar192);
        }
        else {
          auVar172 = vsqrtss_avx(ZEXT416((uint)fVar192),ZEXT416((uint)fVar192));
          fVar192 = auVar172._0_4_;
        }
        auVar269._4_4_ = auStack_6d0._8_4_;
        auVar269._0_4_ = auStack_6d0._4_4_;
        auVar269._8_8_ = 0;
        auVar318._4_4_ = fVar192;
        auVar318._0_4_ = fVar192;
        auVar318._8_4_ = fVar192;
        auVar318._12_4_ = fVar192;
        auVar172 = vdivps_avx(auVar269,auVar318);
        uVar253 = vmovlps_avx(auVar172);
        auStack_6d0._4_4_ = (undefined4)uVar253;
        auStack_6d0._8_4_ = (undefined4)((ulong)uVar253 >> 0x20);
        auStack_6d0._12_4_ = (float)auStack_6d0._12_4_ / fVar192;
        auVar346 = ZEXT464((uint)local_7d0);
        auVar172 = ZEXT816(0) << 0x40;
        bVar163 = false;
        uVar157 = 0;
        do {
          pfVar153 = (float *)(auStack_6d0 + 4);
          if ((uVar157 != 0) && (pfVar153 = (float *)(auStack_6d0 + 8), uVar157 != 1)) {
            pfVar153 = (float *)(auStack_6d0 + 0xc);
          }
          pfVar158 = (float *)(uVar141 + 8);
          if ((uVar157 != 0) && (pfVar158 = (float *)(uVar141 + 0xc), uVar157 != 1)) {
            pfVar158 = (float *)(uVar141 + 0x10);
          }
          pRVar159 = (Ray *)local_6d8;
          if ((uVar157 != 0) && (pRVar159 = (Ray *)(local_6d8 + 4), uVar157 != 1)) {
            pRVar159 = (Ray *)auStack_6d0;
          }
          pfVar160 = (float *)(uVar141 + 0x14);
          if ((uVar157 != 0) && (pfVar160 = (float *)(uVar141 + 0x18), uVar157 != 1)) {
            pfVar160 = (float *)(uVar141 + 0x1c);
          }
          pRVar161 = (Ray *)local_6d8;
          if ((uVar157 != 0) && (pRVar161 = (Ray *)(local_6d8 + 4), uVar157 != 1)) {
            pRVar161 = (Ray *)auStack_6d0;
          }
          auVar312 = (undefined1  [56])0x0;
          auVar166 = ZEXT416((uint)((1.0 / *pfVar153) *
                                   (*pfVar160 - (pRVar161->o).super_Tuple3<pbrt::Point3,_float>.x)))
          ;
          auVar168 = ZEXT416((uint)((1.0 / *pfVar153) *
                                   (*pfVar158 - (pRVar159->o).super_Tuple3<pbrt::Point3,_float>.x)))
          ;
          auVar169 = vminss_avx(auVar166,auVar168);
          auVar172 = vmaxss_avx(auVar169,auVar172);
          auVar169 = vmaxss_avx(auVar168,auVar166);
          auVar169 = vminss_avx(ZEXT416((uint)(auVar169._0_4_ * 1.0000004)),auVar346._0_16_);
          auVar346 = ZEXT1664(auVar169);
          if (auVar169._0_4_ < auVar172._0_4_) break;
          bVar163 = 1 < uVar157;
          uVar157 = uVar157 + 1;
        } while (uVar157 != 3);
        auVar201._8_4_ = 0x3f800000;
        auVar201._0_8_ = 0x3f8000003f800000;
        auVar201._12_4_ = 0x3f800000;
        if (bVar163) {
          uVar253 = 0;
          register0x00001200 = ZEXT416(*(uint *)(uVar141 + 0x70));
          _local_828 = auVar172;
          local_778 = auVar169._0_4_;
          SVar382 = DenselySampledSpectrum::Sample
                              ((DenselySampledSpectrum *)(uVar141 + 0x20),lambda);
          auVar299._0_8_ = SVar382.values.values._8_8_;
          auVar299._8_56_ = auVar312;
          local_7c8._8_8_ = uVar253;
          local_7c8._0_8_ = SVar382.values.values._0_8_;
          local_758 = auVar299._0_16_;
          auVar255 = (undefined1  [56])0x0;
          _local_768 = ZEXT416(*(uint *)(uVar141 + 0x70));
          SVar382 = DenselySampledSpectrum::Sample
                              ((DenselySampledSpectrum *)(uVar141 + 0x48),lambda);
          auVar300._0_8_ = SVar382.values.values._8_8_;
          auVar300._8_56_ = auVar312;
          auVar237._0_8_ = SVar382.values.values._0_8_;
          auVar237._8_56_ = auVar255;
          auVar172 = vunpcklpd_avx(local_7c8,local_758);
          local_288 = (float)local_808._32_4_ * auVar172._0_4_;
          fStack_284 = (float)local_808._32_4_ * auVar172._4_4_;
          fStack_280 = (float)local_808._32_4_ * auVar172._8_4_;
          fStack_27c = (float)local_808._32_4_ * auVar172._12_4_;
          auVar172 = vmovlhps_avx(auVar237._0_16_,auVar300._0_16_);
          fVar192 = (float)local_768._0_4_ * auVar172._0_4_;
          fVar251 = (float)local_768._0_4_ * auVar172._4_4_;
          fStack_290 = (float)local_768._0_4_ * auVar172._8_4_;
          fStack_28c = (float)local_768._0_4_ * auVar172._12_4_;
          local_298 = CONCAT44(fVar251,fVar192);
          local_388._0_4_ = fVar192 + local_288;
          local_388._4_4_ = fVar251 + fStack_284;
          local_388._8_4_ = fStack_290 + fStack_280;
          local_388._12_4_ = fStack_28c + fStack_27c;
          auVar346 = ZEXT1664(local_388);
          fVar192 = *(float *)(uVar141 + 0x10);
          fVar368 = *(float *)(uVar141 + 0x1c) - fVar192;
          uVar253 = vcmpss_avx512f(ZEXT416((uint)fVar192),ZEXT416((uint)*(float *)(uVar141 + 0x1c)),
                                   1);
          bVar15 = (bool)((byte)uVar253 & 1);
          auVar205._8_8_ = 0;
          auVar205._0_8_ = *(ulong *)(uVar141 + 8);
          auVar270._8_8_ = 0;
          auVar270._0_8_ = *(ulong *)(uVar141 + 0x14);
          auVar172 = vsubps_avx(auVar270,auVar205);
          auVar359._4_4_ = local_6d8._4_4_;
          auVar359._0_4_ = local_6d8._0_4_;
          auVar359._8_8_ = 0;
          auVar169 = vsubps_avx(auVar359,auVar205);
          uVar144 = vcmpps_avx512vl(auVar205,auVar270,1);
          auVar166 = vdivps_avx512vl(auVar169,auVar172);
          bVar163 = (bool)((byte)uVar144 & 1);
          auVar171._0_4_ = (float)((uint)bVar163 * auVar166._0_4_ | (uint)!bVar163 * auVar169._0_4_)
          ;
          bVar163 = (bool)((byte)(uVar144 >> 1) & 1);
          auVar171._4_4_ = (uint)bVar163 * auVar166._4_4_ | (uint)!bVar163 * auVar169._4_4_;
          bVar163 = (bool)((byte)(uVar144 >> 2) & 1);
          auVar171._8_4_ = (uint)bVar163 * auVar166._8_4_ | (uint)!bVar163 * auVar169._8_4_;
          bVar163 = (bool)((byte)(uVar144 >> 3) & 1);
          auVar171._12_4_ = (uint)bVar163 * auVar166._12_4_ | (uint)!bVar163 * auVar169._12_4_;
          in_ZmmResult._0_16_ = auVar171;
          auVar169 = vmovshdup_avx(auVar171);
          auVar206._4_4_ = auStack_6d0._8_4_;
          auVar206._0_4_ = auStack_6d0._4_4_;
          auVar206._8_8_ = 0;
          auVar172 = vdivps_avx(auVar206,auVar172);
          local_80c = (float)auStack_6d0._12_4_ / fVar368;
          uVar253 = vmovlps_avx(auVar172);
          local_808._0_4_ = (undefined4)uVar253;
          local_808._4_4_ = (undefined4)((ulong)uVar253 >> 0x20);
          fVar193 = local_828._0_4_;
          fVar251 = fVar193 * (float)local_808._0_4_ + auVar171._0_4_;
          fVar252 = fVar193 * (float)local_808._4_4_ + auVar169._0_4_;
          fVar192 = (float)((uint)bVar15 * (int)(((float)auStack_6d0._0_4_ - fVar192) / fVar368) +
                           (uint)!bVar15 * (int)((float)auStack_6d0._0_4_ - fVar192)) +
                    fVar193 * local_80c;
          piVar3 = (int *)(uVar141 + 0x118);
          piVar2 = (int *)(uVar141 + 0x11c);
          piVar146 = (int *)(uVar141 + 0x120);
          lVar151 = 0;
          do {
            iVar139 = (int)lVar151;
            fVar368 = fVar251;
            if ((iVar139 != 0) && (fVar368 = fVar252, iVar139 != 1)) {
              fVar368 = fVar192;
            }
            piVar154 = piVar3;
            if ((iVar139 != 0) && (piVar154 = piVar2, iVar139 != 1)) {
              piVar154 = piVar146;
            }
            piVar156 = piVar3;
            if ((iVar139 != 0) && (piVar156 = piVar2, iVar139 != 1)) {
              piVar156 = piVar146;
            }
            auVar352._0_4_ = (float)(*piVar156 + -1);
            auVar352._4_12_ = in_ZMM8._4_12_;
            auVar172 = vminss_avx(auVar352,ZEXT416((uint)(fVar368 * (float)*piVar154)));
            uVar253 = vcmpss_avx512f(ZEXT416((uint)(fVar368 * (float)*piVar154)),ZEXT816(0) << 0x40,
                                     1);
            auVar179._16_48_ = in_ZmmResult._16_48_;
            auVar179._0_16_ = auVar172;
            fVar368 = (float)((uint)!(bool)((byte)uVar253 & 1) * auVar172._0_4_);
            in_ZmmResult._4_60_ = auVar179._4_60_;
            in_ZmmResult._0_4_ = fVar368;
            iVar152 = (int)fVar368;
            *(int *)(local_728 + lVar151 * 4) = iVar152;
            pfVar153 = (float *)local_808;
            if ((iVar139 != 0) && (pfVar153 = (float *)(local_808 + 4), iVar139 != 1)) {
              pfVar153 = &local_80c;
            }
            if ((*pfVar153 == 0.0) && (!NAN(*pfVar153))) {
              pfVar153 = (float *)local_808;
              if ((iVar139 != 0) && (pfVar153 = (float *)(local_808 + 4), iVar139 != 1)) {
                pfVar153 = &local_80c;
              }
              *pfVar153 = 0.0;
            }
            pfVar153 = (float *)local_808;
            if ((iVar139 != 0) && (pfVar153 = (float *)(local_808 + 4), iVar139 != 1)) {
              pfVar153 = &local_80c;
            }
            if (0.0 <= *pfVar153) {
              piVar154 = piVar3;
              if ((iVar139 != 0) && (piVar154 = piVar2, iVar139 != 1)) {
                piVar154 = piVar146;
              }
              fVar368 = fVar251;
              if ((iVar139 != 0) && (fVar368 = fVar252, iVar139 != 1)) {
                fVar368 = fVar192;
              }
              pfVar153 = (float *)local_808;
              if ((iVar139 != 0) && (pfVar153 = (float *)(local_808 + 4), iVar139 != 1)) {
                pfVar153 = &local_80c;
              }
              *(float *)(local_368 + lVar151 * 4) =
                   fVar193 + ((float)(iVar152 + 1) / (float)*piVar154 - fVar368) / *pfVar153;
              pfVar153 = (float *)local_808;
              if ((iVar139 != 0) && (pfVar153 = (float *)(local_808 + 4), iVar139 != 1)) {
                pfVar153 = &local_80c;
              }
              piVar154 = piVar3;
              if ((iVar139 != 0) && (piVar154 = piVar2, iVar139 != 1)) {
                piVar154 = piVar146;
              }
              *(float *)((long)&local_1c0.bxdf.
                                super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
                                .bits + lVar151 * 4) = 1.0 / ((float)*piVar154 * *pfVar153);
              *(undefined4 *)((long)&local_588 + lVar151 * 4) = 1;
              piVar154 = piVar3;
              if ((iVar139 != 0) && (piVar154 = piVar2, iVar139 != 1)) {
                piVar154 = piVar146;
              }
              iVar139 = *piVar154;
            }
            else {
              piVar154 = piVar3;
              if ((iVar139 != 0) && (piVar154 = piVar2, iVar139 != 1)) {
                piVar154 = piVar146;
              }
              fVar368 = fVar251;
              if ((iVar139 != 0) && (fVar368 = fVar252, iVar139 != 1)) {
                fVar368 = fVar192;
              }
              pfVar153 = (float *)local_808;
              if ((iVar139 != 0) && (pfVar153 = (float *)(local_808 + 4), iVar139 != 1)) {
                pfVar153 = &local_80c;
              }
              *(float *)(local_368 + lVar151 * 4) =
                   fVar193 + ((float)iVar152 / (float)*piVar154 - fVar368) / *pfVar153;
              pfVar153 = (float *)local_808;
              if ((iVar139 != 0) && (pfVar153 = (float *)(local_808 + 4), iVar139 != 1)) {
                pfVar153 = &local_80c;
              }
              piVar154 = piVar3;
              if ((iVar139 != 0) && (piVar154 = piVar2, iVar139 != 1)) {
                piVar154 = piVar146;
              }
              *(float *)((long)&local_1c0.bxdf.
                                super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
                                .bits + lVar151 * 4) = -1.0 / ((float)*piVar154 * *pfVar153);
              *(undefined4 *)((long)&local_588 + lVar151 * 4) = 0xffffffff;
              iVar139 = -1;
            }
            *(int *)(local_318 + lVar151 * 4) = iVar139;
            lVar151 = lVar151 + 1;
          } while (lVar151 != 3);
          local_708._0_8_ = uVar141;
          local_5c0 = uVar141 + 0x74 | 0x1000000000000;
          fStack_7e0 = 1.0;
          stack0xfffffffffffff818 = 0x3f8000003f800000;
          fStack_7dc = 1.0;
          auVar347 = ZEXT464((uint)local_558._0_4_);
          auVar367 = ZEXT464((uint)local_778);
          auVar172 = _local_828;
          do {
            lVar151 = (long)*(int *)(&DAT_0287a500 +
                                    (ulong)((uint)((float)local_368._4_4_ < fStack_360) |
                                           (uint)((float)local_368._0_4_ < (float)local_368._4_4_) *
                                           4 + (uint)((float)local_368._0_4_ < fStack_360) * 2) * 4)
            ;
            uVar194 = *(undefined4 *)
                       (*(long *)(local_708._0_8_ + 0x100) +
                       (((long)(int)local_728._8_4_ * (long)*(int *)(local_708._0_8_ + 0x11c) +
                        (long)(int)local_728._4_4_) * (long)*(int *)(local_708._0_8_ + 0x118) +
                       (long)(int)local_728._0_4_) * 4);
            auVar60._4_4_ = uVar194;
            auVar60._0_4_ = uVar194;
            auVar60._8_4_ = uVar194;
            auVar60._12_4_ = uVar194;
            auVar166 = vmulps_avx512vl(auVar346._0_16_,auVar60);
            auVar169 = vminss_avx(ZEXT416(*(uint *)(local_368 + lVar151 * 4)),auVar367._0_16_);
            if ((auVar166._0_4_ != 0.0) || (NAN(auVar166._0_4_))) {
              local_758._0_4_ = auVar169._0_4_;
              auVar69._8_4_ = 0x80000000;
              auVar69._0_8_ = 0x8000000080000000;
              auVar69._12_4_ = 0x80000000;
              in_ZmmResult._0_16_ = vxorps_avx512vl(auVar166,auVar69);
              _local_828 = auVar172;
              local_7c8 = auVar166;
              _local_768 = in_ZmmResult._0_16_;
              do {
                fVar192 = logf(1.0 - auVar347._0_4_);
                uVar253 = local_278._0_8_;
                auVar166 = in_ZMM13._0_16_;
                fVar192 = (float)local_828._0_4_ - fVar192 / (float)local_7c8._0_4_;
                local_278._0_8_ = local_278._0_8_ * 0x5851f42d4c957f2d + local_278._8_8_;
                uVar157 = SUB84(uVar253,4) >> 0xd ^ (uint)((ulong)uVar253 >> 0x1b);
                bVar143 = SUB81(uVar253,7) >> 3;
                auVar169 = in_ZMM12._0_16_;
                auVar172 = vcvtusi2ss_avx512f(auVar169,uVar157 >> bVar143 |
                                                       uVar157 << 0x20 - bVar143);
                auVar172 = vminss_avx(ZEXT416((uint)(auVar172._0_4_ * 2.3283064e-10)),
                                      ZEXT416(0x3f7fffff));
                auVar347 = ZEXT1664(auVar172);
                if ((float)local_758._0_4_ <= fVar192) {
                  fVar192 = (float)local_758._0_4_ - (float)local_828._0_4_;
                  auVar209._0_4_ = fVar192 * (float)local_768._0_4_;
                  auVar209._4_4_ = fVar192 * (float)local_768._4_4_;
                  auVar209._8_4_ = fVar192 * fStack_760;
                  auVar209._12_4_ = fVar192 * fStack_75c;
                  auVar77._8_4_ = 0x3fb8aa3b;
                  auVar77._0_8_ = 0x3fb8aa3b3fb8aa3b;
                  auVar77._12_4_ = 0x3fb8aa3b;
                  auVar169 = vmulps_avx512vl(auVar209,auVar77);
                  auVar172 = vroundps_avx(auVar169,9);
                  auVar169 = vsubps_avx(auVar169,auVar172);
                  auVar274._0_4_ = (int)auVar172._0_4_;
                  auVar274._4_4_ = (int)auVar172._4_4_;
                  auVar274._8_4_ = (int)auVar172._8_4_;
                  auVar274._12_4_ = (int)auVar172._12_4_;
                  auVar320._8_4_ = 0x3da00ac9;
                  auVar320._0_8_ = 0x3da00ac93da00ac9;
                  auVar320._12_4_ = 0x3da00ac9;
                  auVar78._8_4_ = 0x3e679a0b;
                  auVar78._0_8_ = 0x3e679a0b3e679a0b;
                  auVar78._12_4_ = 0x3e679a0b;
                  auVar172 = vfmadd213ps_avx512vl(auVar320,auVar169,auVar78);
                  auVar79._8_4_ = 0x3f321004;
                  auVar79._0_8_ = 0x3f3210043f321004;
                  auVar79._12_4_ = 0x3f321004;
                  auVar172 = vfmadd213ps_avx512vl(auVar172,auVar169,auVar79);
                  auVar80._8_4_ = 0x3f800000;
                  auVar80._0_8_ = 0x3f8000003f800000;
                  auVar80._12_4_ = 0x3f800000;
                  auVar169 = vfmadd213ps_avx512vl(auVar172,auVar169,auVar80);
                  auVar166 = vpsrld_avx(auVar169,0x17);
                  auVar336._8_4_ = 0xffffff81;
                  auVar336._0_8_ = 0xffffff81ffffff81;
                  auVar336._12_4_ = 0xffffff81;
                  auVar172 = vpaddd_avx(auVar274,auVar336);
                  auVar172 = vpaddd_avx(auVar172,auVar166);
                  uVar141 = vpcmpgtd_avx512vl(auVar172,auVar336);
                  uVar141 = uVar141 & 0xf;
                  auVar81._8_4_ = 0x7f;
                  auVar81._0_8_ = 0x7f0000007f;
                  auVar81._12_4_ = 0x7f;
                  uVar144 = vpcmpgtd_avx512vl(auVar172,auVar81);
                  uVar144 = uVar144 & 0xf;
                  auVar82._8_4_ = 0x807fffff;
                  auVar82._0_8_ = 0x807fffff807fffff;
                  auVar82._12_4_ = 0x807fffff;
                  auVar169 = vpandd_avx512vl(auVar169,auVar82);
                  auVar172 = vpslld_avx(auVar172,0x17);
                  auVar83._8_4_ = 0x3f800000;
                  auVar83._0_8_ = 0x3f8000003f800000;
                  auVar83._12_4_ = 0x3f800000;
                  auVar172 = vpaddd_avx512vl(auVar172,auVar83);
                  auVar172 = vpord_avx512vl(auVar172,auVar169);
                  auVar169 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                  bVar163 = (bool)((byte)uVar144 & 1);
                  in_ZmmResult._0_4_ =
                       (float)((uint)bVar163 * auVar169._0_4_ |
                              (uint)!bVar163 * (uint)((byte)uVar141 & 1) * auVar172._0_4_);
                  bVar163 = (bool)((byte)(uVar144 >> 1) & 1);
                  in_ZmmResult._4_4_ =
                       (float)((uint)bVar163 * auVar169._4_4_ |
                              (uint)!bVar163 * (uint)((byte)(uVar141 >> 1) & 1) * auVar172._4_4_);
                  bVar163 = (bool)((byte)(uVar144 >> 2) & 1);
                  in_ZmmResult._8_4_ =
                       (float)((uint)bVar163 * auVar169._8_4_ |
                              (uint)!bVar163 * (uint)((byte)(uVar141 >> 2) & 1) * auVar172._8_4_);
                  bVar163 = SUB81(uVar144 >> 3,0);
                  in_ZmmResult._12_4_ =
                       (float)((uint)bVar163 * auVar169._12_4_ |
                              (uint)!bVar163 * (uint)(byte)(uVar141 >> 3) * auVar172._12_4_);
                  fStack_7e4 = in_ZmmResult._4_4_ * fStack_7e4;
                  local_808._32_4_ = in_ZmmResult._0_4_ * (float)local_808._32_4_;
                  fStack_7e0 = in_ZmmResult._8_4_ * fStack_7e0;
                  fStack_7dc = in_ZmmResult._12_4_ * fStack_7dc;
                  cVar164 = '\n';
                  auVar168 = _local_828;
                }
                else {
                  cVar164 = '\0';
                  auVar168 = ZEXT416((uint)fVar192);
                  if (fVar192 < local_778) {
                    local_558._0_4_ = auVar172._0_4_;
                    fVar251 = fVar192 - (float)local_828._0_4_;
                    auVar208._0_4_ = fVar251 * (float)local_768._0_4_;
                    auVar208._4_4_ = fVar251 * (float)local_768._4_4_;
                    auVar208._8_4_ = fVar251 * fStack_760;
                    auVar208._12_4_ = fVar251 * fStack_75c;
                    auVar70._8_4_ = 0x3fb8aa3b;
                    auVar70._0_8_ = 0x3fb8aa3b3fb8aa3b;
                    auVar70._12_4_ = 0x3fb8aa3b;
                    auVar172 = vmulps_avx512vl(auVar208,auVar70);
                    _local_5e8 = vroundps_avx(auVar172,9);
                    auVar172 = vsubps_avx(auVar172,_local_5e8);
                    auVar272._8_4_ = 0x3da00ac9;
                    auVar272._0_8_ = 0x3da00ac93da00ac9;
                    auVar272._12_4_ = 0x3da00ac9;
                    auVar71._8_4_ = 0x3e679a0b;
                    auVar71._0_8_ = 0x3e679a0b3e679a0b;
                    auVar71._12_4_ = 0x3e679a0b;
                    auVar168 = vfmadd213ps_avx512vl(auVar272,auVar172,auVar71);
                    auVar72._8_4_ = 0x3f321004;
                    auVar72._0_8_ = 0x3f3210043f321004;
                    auVar72._12_4_ = 0x3f321004;
                    auVar168 = vfmadd213ps_avx512vl(auVar168,auVar172,auVar72);
                    auVar73._8_4_ = 0x3f800000;
                    auVar73._0_8_ = 0x3f8000003f800000;
                    auVar73._12_4_ = 0x3f800000;
                    _local_5d8 = vfmadd213ps_avx512vl(auVar168,auVar172,auVar73);
                    fVar252 = fVar192 * (float)auStack_6d0._4_4_ + (float)local_6d8._0_4_;
                    fVar368 = fVar192 * (float)auStack_6d0._8_4_ + (float)local_6d8._4_4_;
                    local_428 = CONCAT412(fVar192 * 0.0 + 0.0,
                                          CONCAT48(fVar192 * 0.0 + 0.0,CONCAT44(fVar368,fVar252)));
                    fVar251 = fVar192 * (float)auStack_6d0._12_4_ + (float)auStack_6d0._0_4_;
                    local_678._0_4_ = fVar251;
                    p_00.super_Tuple3<pbrt::Point3,_float>.z = fVar251;
                    p_00.super_Tuple3<pbrt::Point3,_float>.x = fVar252;
                    p_00.super_Tuple3<pbrt::Point3,_float>.y = fVar368;
                    auVar255 = SUB6456(ZEXT6064((undefined1  [60])0x0),4);
                    auVar312 = ZEXT856(local_428._8_8_);
                    _local_378 = ZEXT416((uint)fVar192);
                    SVar382 = CloudMediumProvider::Density
                                        (*(CloudMediumProvider **)local_708._0_8_,p_00,lambda);
                    auVar301._0_8_ = SVar382.values.values._8_8_;
                    auVar301._8_56_ = auVar255;
                    auVar238._0_8_ = SVar382.values.values._0_8_;
                    auVar238._8_56_ = auVar312;
                    auVar172 = vmovshdup_avx(local_428);
                    fVar252 = auVar172._0_4_;
                    auVar172 = vfmadd231ss_fma(ZEXT416((uint)(fVar252 *
                                                             *(float *)(local_708._0_8_ + 0x7c))),
                                               local_428,ZEXT416(*(uint *)(local_708._0_8_ + 0x78)))
                    ;
                    auVar172 = vfmadd231ss_fma(auVar172,ZEXT416((uint)local_678._0_4_),
                                               ZEXT416(*(uint *)(local_708._0_8_ + 0x80)));
                    fVar192 = auVar172._0_4_ + *(float *)(local_708._0_8_ + 0x84);
                    auVar172 = vfmadd231ss_fma(ZEXT416((uint)(fVar252 *
                                                             *(float *)(local_708._0_8_ + 0x8c))),
                                               local_428,ZEXT416(*(uint *)(local_708._0_8_ + 0x88)))
                    ;
                    auVar172 = vfmadd231ss_fma(auVar172,ZEXT416((uint)local_678._0_4_),
                                               ZEXT416(*(uint *)(local_708._0_8_ + 0x90)));
                    fVar251 = auVar172._0_4_ + *(float *)(local_708._0_8_ + 0x94);
                    auVar172 = vfmadd231ss_fma(ZEXT416((uint)(fVar252 *
                                                             *(float *)(local_708._0_8_ + 0x9c))),
                                               local_428,ZEXT416(*(uint *)(local_708._0_8_ + 0x98)))
                    ;
                    auVar172 = vfmadd231ss_fma(auVar172,ZEXT416((uint)local_678._0_4_),
                                               ZEXT416(*(uint *)(local_708._0_8_ + 0xa0)));
                    auVar168 = vfmadd231ss_fma(ZEXT416((uint)(fVar252 *
                                                             *(float *)(local_708._0_8_ + 0xac))),
                                               local_428,ZEXT416(*(uint *)(local_708._0_8_ + 0xa8)))
                    ;
                    auVar168 = vfmadd231ss_fma(auVar168,ZEXT416((uint)local_678._0_4_),
                                               ZEXT416(*(uint *)(local_708._0_8_ + 0xb0)));
                    fVar252 = auVar168._0_4_ + *(float *)(local_708._0_8_ + 0xb4);
                    bVar163 = fVar252 == 1.0;
                    fVar368 = auVar172._0_4_ + *(float *)(local_708._0_8_ + 0xa4);
                    auVar273._0_4_ = local_418._16_4_ * local_418._16_4_;
                    auVar273._4_4_ = local_418._20_4_ * local_418._20_4_;
                    auVar273._8_8_ = 0;
                    auVar172 = vmovshdup_avx(auVar273);
                    fVar193 = (float)local_418._12_4_ * (float)local_418._12_4_ + auVar273._0_4_ +
                              auVar172._0_4_;
                    if (fVar193 < 0.0) {
                      local_678 = ZEXT416((uint)fVar192);
                      local_2b8 = ZEXT416((uint)fVar251);
                      local_2c8 = ZEXT416((uint)fVar368);
                      local_2d8._0_4_ = fVar252;
                      local_428 = auVar238._0_16_;
                      local_2a8 = auVar301._0_16_;
                      fVar193 = sqrtf(fVar193);
                      fVar252 = (float)local_2d8._0_4_;
                      auVar168 = local_428;
                      auVar172 = local_2a8;
                      auVar201 = local_678;
                      fVar251 = (float)local_2b8._0_4_;
                      fVar368 = (float)local_2c8._0_4_;
                    }
                    else {
                      auVar172 = vsqrtss_avx(ZEXT416((uint)fVar193),ZEXT416((uint)fVar193));
                      fVar193 = auVar172._0_4_;
                      auVar168 = auVar238._0_16_;
                      auVar172 = auVar301._0_16_;
                      auVar201 = ZEXT416((uint)fVar192);
                    }
                    auVar275._0_4_ = (int)(float)local_5e8._0_4_;
                    auVar275._4_4_ = (int)(float)local_5e8._4_4_;
                    auVar275._8_4_ = (int)(float)uStack_5e0;
                    auVar275._12_4_ = (int)uStack_5e0._4_4_;
                    auVar174 = vpsrld_avx(_local_5d8,0x17);
                    auVar337._8_4_ = 0xffffff81;
                    auVar337._0_8_ = 0xffffff81ffffff81;
                    auVar337._12_4_ = 0xffffff81;
                    auVar173 = vpaddd_avx(auVar275,auVar337);
                    auVar173 = vpaddd_avx(auVar173,auVar174);
                    uVar141 = vpcmpgtd_avx512vl(auVar173,auVar337);
                    uVar141 = uVar141 & 0xf;
                    auVar74._8_4_ = 0x7f;
                    auVar74._0_8_ = 0x7f0000007f;
                    auVar74._12_4_ = 0x7f;
                    uVar144 = vpcmpgtd_avx512vl(auVar173,auVar74);
                    uVar144 = uVar144 & 0xf;
                    auVar75._8_4_ = 0x807fffff;
                    auVar75._0_8_ = 0x807fffff807fffff;
                    auVar75._12_4_ = 0x807fffff;
                    auVar174 = vpandd_avx512vl(_local_5d8,auVar75);
                    auVar173 = vpslld_avx(auVar173,0x17);
                    auVar76._8_4_ = 0x3f800000;
                    auVar76._0_8_ = 0x3f8000003f800000;
                    auVar76._12_4_ = 0x3f800000;
                    auVar173 = vpaddd_avx512vl(auVar173,auVar76);
                    auVar174 = vpord_avx512vl(auVar173,auVar174);
                    auVar170 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                    bVar15 = (bool)((byte)uVar144 & 1);
                    bVar12 = (bool)((byte)(uVar144 >> 1) & 1);
                    bVar13 = (bool)((byte)(uVar144 >> 2) & 1);
                    bVar14 = SUB81(uVar144 >> 3,0);
                    auVar172 = vmovlhps_avx(auVar168,auVar172);
                    auVar338._0_4_ = auVar172._0_4_ * local_288;
                    auVar338._4_4_ = auVar172._4_4_ * fStack_284;
                    auVar338._8_4_ = auVar172._8_4_ * fStack_280;
                    auVar338._12_4_ = auVar172._12_4_ * fStack_27c;
                    auVar168 = vshufpd_avx(auVar338,auVar338,1);
                    auVar321._0_4_ = auVar172._0_4_ * (float)local_298;
                    auVar321._4_4_ = auVar172._4_4_ * local_298._4_4_;
                    auVar321._8_4_ = auVar172._8_4_ * fStack_290;
                    auVar321._12_4_ = auVar172._12_4_ * fStack_28c;
                    auVar173 = vshufpd_avx(auVar321,auVar321,1);
                    auStack_4a0[0]._0_4_ =
                         (float)((uint)bVar15 * auVar170._0_4_ |
                                (uint)!bVar15 * (uint)((byte)uVar141 & 1) * auVar174._0_4_) *
                         (float)local_808._32_4_;
                    auStack_4a0[0]._4_4_ =
                         (float)((uint)bVar12 * auVar170._4_4_ |
                                (uint)!bVar12 * (uint)((byte)(uVar141 >> 1) & 1) * auVar174._4_4_) *
                         fStack_7e4;
                    auStack_4a0[1]._0_4_ =
                         (float)((uint)bVar13 * auVar170._8_4_ |
                                (uint)!bVar13 * (uint)((byte)(uVar141 >> 2) & 1) * auVar174._8_4_) *
                         fStack_7e0;
                    auStack_4a0[1]._4_4_ =
                         (float)((uint)bVar14 * auVar170._12_4_ |
                                (uint)!bVar14 * (uint)(byte)(uVar141 >> 3) * auVar174._12_4_) *
                         fStack_7dc;
                    fVar192 = auVar201._0_4_ / fVar252;
                    auVar181._4_12_ = auVar201._4_12_;
                    auVar181._0_4_ = fVar192;
                    auVar181._16_48_ = in_ZmmResult._16_48_;
                    auVar180._4_60_ = auVar181._4_60_;
                    auVar180._0_4_ =
                         (uint)bVar163 * (int)auVar201._0_4_ + (uint)!bVar163 * (int)fVar192;
                    iVar139 = (uint)bVar163 * (int)fVar251 +
                              (uint)!bVar163 * (int)(fVar251 / fVar252);
                    iVar152 = (uint)bVar163 * (int)fVar368 +
                              (uint)!bVar163 * (int)(fVar368 / fVar252);
                    auVar374._0_8_ = local_418._12_8_ ^ 0x8000000080000000;
                    auVar374._8_4_ = 0x80000000;
                    auVar374._12_4_ = 0x80000000;
                    auVar378._4_4_ = fVar193;
                    auVar378._0_4_ = fVar193;
                    auVar378._8_4_ = fVar193;
                    auVar378._12_4_ = fVar193;
                    auVar172 = vdivps_avx(auVar374,auVar378);
                    auVar379._0_4_ = -(float)local_418._20_4_;
                    auVar379._4_4_ = 0x80000000;
                    auVar379._8_4_ = 0x80000000;
                    auVar379._12_4_ = 0x80000000;
                    auVar210._0_4_ = auVar379._0_4_ / fVar193;
                    auVar210._4_12_ = auVar379._4_12_;
                    local_538._120_8_ = local_7c8._0_8_;
                    local_4b8.bits._0_4_ = local_7c8._8_4_;
                    local_4b8.bits._4_4_ = local_7c8._12_4_;
                    auVar363._4_4_ = iVar139;
                    auVar363._0_4_ = iVar139;
                    auVar363._8_4_ = iVar139;
                    auVar363._12_4_ = iVar139;
                    auVar370._4_4_ = iVar152;
                    auVar370._0_4_ = iVar152;
                    auVar370._8_4_ = iVar152;
                    auVar370._12_4_ = iVar152;
                    local_538._40_4_ = 0.0;
                    local_538._44_4_ = 0.0;
                    local_538._48_4_ = 0.0;
                    local_538._52_4_ = 0.0;
                    local_538._56_4_ = 0.0;
                    auVar201 = vshufps_avx(auVar180._0_16_,auVar363,0x40);
                    local_538._0_4_ = auVar201._0_4_;
                    local_538._4_4_ = auVar201._4_4_;
                    local_538._8_4_ = auVar201._8_4_;
                    local_538._12_4_ = auVar201._12_4_;
                    uVar253 = vmovlps_avx(auVar370);
                    local_538._16_4_ = (undefined4)uVar253;
                    local_538._20_4_ = (undefined4)((ulong)uVar253 >> 0x20);
                    local_538._24_4_ = afStack_400[0];
                    uVar253 = vmovlps_avx(auVar172);
                    local_538._28_4_ = (undefined4)uVar253;
                    local_538._32_4_ = (undefined4)((ulong)uVar253 >> 0x20);
                    local_538._64_4_ = (anon_struct_4_0_00000001_for___align)0x0;
                    local_538._68_4_ = 0.0;
                    local_538._72_4_ = local_748._0_4_;
                    local_538._76_4_ = local_748._4_4_;
                    local_538._80_4_ = (undefined4)local_5c0;
                    local_538._84_4_ = (undefined4)(local_5c0 >> 0x20);
                    auVar231._16_16_ = auVar173;
                    auVar231._0_16_ = auVar210;
                    auVar355._16_16_ = auVar168;
                    auVar355._0_16_ = auVar210;
                    auVar232 = vperm2f128_avx(auVar355,auVar231,0x31);
                    auVar328._16_16_ = auVar321;
                    auVar328._0_16_ = auVar338;
                    auVar232 = vunpcklpd_avx(auVar328,auVar232);
                    local_538._88_4_ = auVar232._0_4_;
                    local_538._92_8_ = auVar232._4_8_;
                    local_538._100_4_ = auVar232._12_4_;
                    local_538._104_16_ = auVar232._16_16_;
                    uStack_4b0 = 0.0;
                    uStack_4ac._0_4_ = 0.0;
                    uStack_4ac._4_4_ = 0.0;
                    uStack_4a4 = 0.0;
                    in_ZMM8 = ZEXT1664(auVar370);
                    in_ZMM9 = ZEXT1664(auVar172);
                    in_ZMM10 = ZEXT464((uint)afStack_400[0]);
                    in_ZMM12 = ZEXT1664(auVar169);
                    in_ZMM13 = ZEXT1664(auVar166);
                    local_538._36_4_ = auVar210._0_4_;
                    bVar163 = Li::anon_class_120_15_cd2b6fed::operator()
                                        (&local_668,(MediumSample *)local_538);
                    if (!bVar163) {
                      local_148._8_4_ = 0x3f800000;
                      local_148._0_8_ = 0x3f8000003f800000;
                      local_148._12_4_ = 0x3f800000;
                    }
                    auVar182._16_48_ = in_ZmmResult._16_48_;
                    auVar182._0_16_ = _local_828;
                    in_ZmmResult._4_60_ = auVar182._4_60_;
                    in_ZmmResult._0_4_ =
                         (float)((uint)bVar163 * local_378._0_4_ + (uint)!bVar163 * local_828._0_4_)
                    ;
                    cVar164 = !bVar163;
                    fStack_7e0 = 1.0;
                    stack0xfffffffffffff818 = 0x3f8000003f800000;
                    fStack_7dc = 1.0;
                    auVar347 = ZEXT464((uint)local_558._0_4_);
                    lambda = local_790;
                    auVar168 = in_ZmmResult._0_16_;
                  }
                }
                _local_828 = auVar168;
              } while (cVar164 == '\0');
              auVar172 = _local_828;
              if (cVar164 == '\n') {
                auVar346 = ZEXT1664(local_388);
                auVar169 = ZEXT416((uint)local_758._0_4_);
                goto LAB_003d5b76;
              }
              auVar367 = ZEXT464((uint)local_778);
              auVar346 = ZEXT1664(local_388);
            }
            else {
              auVar61._8_4_ = 0x80000000;
              auVar61._0_8_ = 0x8000000080000000;
              auVar61._12_4_ = 0x80000000;
              auVar166 = vxorps_avx512vl(auVar166,auVar61);
              fVar192 = auVar169._0_4_ - auVar172._0_4_;
              auVar207._0_4_ = fVar192 * auVar166._0_4_;
              auVar207._4_4_ = fVar192 * auVar166._4_4_;
              auVar207._8_4_ = fVar192 * auVar166._8_4_;
              auVar207._12_4_ = fVar192 * auVar166._12_4_;
              auVar62._8_4_ = 0x3fb8aa3b;
              auVar62._0_8_ = 0x3fb8aa3b3fb8aa3b;
              auVar62._12_4_ = 0x3fb8aa3b;
              auVar168 = vmulps_avx512vl(auVar207,auVar62);
              auVar166 = vroundps_avx(auVar168,9);
              auVar168 = vsubps_avx(auVar168,auVar166);
              auVar271._0_4_ = (int)auVar166._0_4_;
              auVar271._4_4_ = (int)auVar166._4_4_;
              auVar271._8_4_ = (int)auVar166._8_4_;
              auVar271._12_4_ = (int)auVar166._12_4_;
              auVar319._8_4_ = 0x3da00ac9;
              auVar319._0_8_ = 0x3da00ac93da00ac9;
              auVar319._12_4_ = 0x3da00ac9;
              auVar63._8_4_ = 0x3e679a0b;
              auVar63._0_8_ = 0x3e679a0b3e679a0b;
              auVar63._12_4_ = 0x3e679a0b;
              auVar166 = vfmadd213ps_avx512vl(auVar319,auVar168,auVar63);
              auVar64._8_4_ = 0x3f321004;
              auVar64._0_8_ = 0x3f3210043f321004;
              auVar64._12_4_ = 0x3f321004;
              auVar166 = vfmadd213ps_avx512vl(auVar166,auVar168,auVar64);
              auVar65._8_4_ = 0x3f800000;
              auVar65._0_8_ = 0x3f8000003f800000;
              auVar65._12_4_ = 0x3f800000;
              auVar168 = vfmadd213ps_avx512vl(auVar166,auVar168,auVar65);
              auVar201 = vpsrld_avx(auVar168,0x17);
              auVar335._8_4_ = 0xffffff81;
              auVar335._0_8_ = 0xffffff81ffffff81;
              auVar335._12_4_ = 0xffffff81;
              auVar166 = vpaddd_avx(auVar271,auVar335);
              auVar166 = vpaddd_avx(auVar166,auVar201);
              uVar141 = vpcmpgtd_avx512vl(auVar166,auVar335);
              uVar141 = uVar141 & 0xf;
              auVar66._8_4_ = 0x7f;
              auVar66._0_8_ = 0x7f0000007f;
              auVar66._12_4_ = 0x7f;
              uVar144 = vpcmpgtd_avx512vl(auVar166,auVar66);
              uVar144 = uVar144 & 0xf;
              auVar67._8_4_ = 0x807fffff;
              auVar67._0_8_ = 0x807fffff807fffff;
              auVar67._12_4_ = 0x807fffff;
              auVar168 = vpandd_avx512vl(auVar168,auVar67);
              auVar166 = vpslld_avx(auVar166,0x17);
              auVar68._8_4_ = 0x3f800000;
              auVar68._0_8_ = 0x3f8000003f800000;
              auVar68._12_4_ = 0x3f800000;
              auVar166 = vpaddd_avx512vl(auVar166,auVar68);
              auVar166 = vpord_avx512vl(auVar166,auVar168);
              auVar168 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              bVar163 = (bool)((byte)uVar144 & 1);
              in_ZmmResult._0_4_ =
                   (float)((uint)bVar163 * auVar168._0_4_ |
                          (uint)!bVar163 * (uint)((byte)uVar141 & 1) * auVar166._0_4_);
              bVar163 = (bool)((byte)(uVar144 >> 1) & 1);
              in_ZmmResult._4_4_ =
                   (float)((uint)bVar163 * auVar168._4_4_ |
                          (uint)!bVar163 * (uint)((byte)(uVar141 >> 1) & 1) * auVar166._4_4_);
              bVar163 = (bool)((byte)(uVar144 >> 2) & 1);
              in_ZmmResult._8_4_ =
                   (float)((uint)bVar163 * auVar168._8_4_ |
                          (uint)!bVar163 * (uint)((byte)(uVar141 >> 2) & 1) * auVar166._8_4_);
              bVar163 = SUB81(uVar144 >> 3,0);
              in_ZmmResult._12_4_ =
                   (float)((uint)bVar163 * auVar168._12_4_ |
                          (uint)!bVar163 * (uint)(byte)(uVar141 >> 3) * auVar166._12_4_);
              fStack_7e4 = in_ZmmResult._4_4_ * fStack_7e4;
              local_808._32_4_ = in_ZmmResult._0_4_ * (float)local_808._32_4_;
              fStack_7e0 = in_ZmmResult._8_4_ * fStack_7e0;
              fStack_7dc = in_ZmmResult._12_4_ * fStack_7dc;
LAB_003d5b76:
              auVar367 = ZEXT464((uint)local_778);
              cVar164 = '\b';
              if ((*(float *)(local_368 + lVar151 * 4) <= local_778) &&
                 (iVar139 = *(int *)(local_728 + lVar151 * 4) +
                            *(int *)((long)&local_588 + lVar151 * 4),
                 *(int *)(local_728 + lVar151 * 4) = iVar139,
                 iVar139 != *(int *)(local_318 + lVar151 * 4))) {
                *(float *)(local_368 + lVar151 * 4) =
                     *(float *)(local_368 + lVar151 * 4) +
                     *(float *)((long)&local_1c0.bxdf.
                                       super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
                                       .bits + lVar151 * 4);
                cVar164 = '\0';
                auVar172 = auVar169;
              }
            }
          } while (cVar164 == '\0');
          auVar201 = local_148;
          if (cVar164 == '\b') {
            auVar201 = stack0xfffffffffffff818;
          }
        }
        auVar172 = vshufpd_avx(auVar201,auVar201,1);
        local_148 = auVar201;
      }
      else {
        local_418._0_8_ = vmovlps_avx(_local_768);
        local_418._8_4_ = local_758._0_4_;
        unique0x00106900 = vunpcklpd_avx(stack0xfffffffffffff818,_local_828);
        local_668.T_hat = &local_788;
        local_668.terminated = &local_82a;
        local_668.uniPathPDF = &local_7a8;
        local_668.lightPathPDF = &local_6f8;
        local_668.depth = (int *)(local_808 + 0x1c);
        local_668.this = local_7b0;
        local_668.L = &local_738;
        local_668.lambda = local_790;
        local_668.rng = (RNG *)local_278;
        local_668.sampler = local_7d8;
        local_668.ray = (RayDifferential *)local_808._16_8_;
        local_668.prevIntrContext = &local_5b8;
        local_668.scattered = &local_829;
        local_668.specularBounce = &local_82c;
        local_668.anyNonSpecularBounces = &local_82b;
        local_80c = (float)local_7c8._0_4_;
        local_748 = (undefined1  [8])(uVar141 & 0xffffffffffff);
        local_3f8.
        super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
        .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                 )(TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                   )TVar8.bits;
        Transform::ApplyInverse
                  ((Ray *)local_6d8,(Transform *)((uVar141 & 0xffffffffffff) + 0x78),
                   (Ray *)local_418,&local_80c);
        auVar169._0_4_ = (float)auStack_6d0._8_4_ * (float)auStack_6d0._8_4_;
        auVar169._4_4_ = (float)auStack_6d0._12_4_ * (float)auStack_6d0._12_4_;
        auVar169._8_8_ = 0;
        auVar172 = vmovshdup_avx(auVar169);
        fVar192 = (float)auStack_6d0._4_4_ * (float)auStack_6d0._4_4_ + auVar169._0_4_ +
                  auVar172._0_4_;
        if (fVar192 < 0.0) {
          fVar192 = sqrtf(fVar192);
        }
        else {
          auVar172 = vsqrtss_avx(ZEXT416((uint)fVar192),ZEXT416((uint)fVar192));
          fVar192 = auVar172._0_4_;
        }
        auVar147 = local_748;
        local_80c = fVar192 * local_80c;
        auVar166._0_4_ = (float)auStack_6d0._8_4_ * (float)auStack_6d0._8_4_;
        auVar166._4_4_ = (float)auStack_6d0._12_4_ * (float)auStack_6d0._12_4_;
        auVar166._8_8_ = 0;
        auVar172 = vmovshdup_avx(auVar166);
        fVar192 = (float)auStack_6d0._4_4_ * (float)auStack_6d0._4_4_ + auVar166._0_4_ +
                  auVar172._0_4_;
        if (fVar192 < 0.0) {
          fVar192 = sqrtf(fVar192);
        }
        else {
          auVar172 = vsqrtss_avx(ZEXT416((uint)fVar192),ZEXT416((uint)fVar192));
          fVar192 = auVar172._0_4_;
        }
        auVar172._4_4_ = auStack_6d0._8_4_;
        auVar172._0_4_ = auStack_6d0._4_4_;
        auVar172._8_8_ = 0;
        auVar168._4_4_ = fVar192;
        auVar168._0_4_ = fVar192;
        auVar168._8_4_ = fVar192;
        auVar168._12_4_ = fVar192;
        auVar172 = vdivps_avx(auVar172,auVar168);
        uVar253 = vmovlps_avx(auVar172);
        auStack_6d0._4_4_ = (undefined4)uVar253;
        auStack_6d0._8_4_ = (undefined4)((ulong)uVar253 >> 0x20);
        auStack_6d0._12_4_ = (float)auStack_6d0._12_4_ / fVar192;
        auVar346 = ZEXT464((uint)local_80c);
        auVar172 = ZEXT816(0) << 0x40;
        bVar163 = false;
        uVar157 = 0;
        do {
          pfVar153 = (float *)(auStack_6d0 + 4);
          if ((uVar157 != 0) && (pfVar153 = (float *)(auStack_6d0 + 8), uVar157 != 1)) {
            pfVar153 = (float *)(auStack_6d0 + 0xc);
          }
          pfVar158 = (float *)((long)auVar147 + 8);
          if ((uVar157 != 0) && (pfVar158 = (float *)((long)auVar147 + 0xc), uVar157 != 1)) {
            pfVar158 = (float *)((long)auVar147 + 0x10);
          }
          pRVar159 = (Ray *)local_6d8;
          if ((uVar157 != 0) && (pRVar159 = (Ray *)(local_6d8 + 4), uVar157 != 1)) {
            pRVar159 = (Ray *)auStack_6d0;
          }
          pfVar160 = (float *)((long)auVar147 + 0x14);
          if ((uVar157 != 0) && (pfVar160 = (float *)((long)auVar147 + 0x18), uVar157 != 1)) {
            pfVar160 = (float *)((long)auVar147 + 0x1c);
          }
          pRVar161 = (Ray *)local_6d8;
          if ((uVar157 != 0) && (pRVar161 = (Ray *)(local_6d8 + 4), uVar157 != 1)) {
            pRVar161 = (Ray *)auStack_6d0;
          }
          auVar312 = (undefined1  [56])0x0;
          auVar166 = ZEXT416((uint)((1.0 / *pfVar153) *
                                   (*pfVar160 - (pRVar161->o).super_Tuple3<pbrt::Point3,_float>.x)))
          ;
          auVar168 = ZEXT416((uint)((1.0 / *pfVar153) *
                                   (*pfVar158 - (pRVar159->o).super_Tuple3<pbrt::Point3,_float>.x)))
          ;
          auVar169 = vminss_avx(auVar166,auVar168);
          auVar172 = vmaxss_avx(auVar169,auVar172);
          auVar169 = vmaxss_avx(auVar168,auVar166);
          auVar169 = vminss_avx(ZEXT416((uint)(auVar169._0_4_ * 1.0000004)),auVar346._0_16_);
          auVar346 = ZEXT1664(auVar169);
          if (auVar169._0_4_ < auVar172._0_4_) break;
          bVar163 = 1 < uVar157;
          uVar157 = uVar157 + 1;
        } while (uVar157 != 3);
        auVar201._8_4_ = 0x3f800000;
        auVar201._0_8_ = 0x3f8000003f800000;
        auVar201._12_4_ = 0x3f800000;
        if (bVar163) {
          local_808._32_4_ = auVar172._0_4_;
          uVar253 = 0;
          _local_828 = ZEXT416(*(uint *)((long)auVar147 + 0x70));
          local_778 = auVar169._0_4_;
          SVar382 = DenselySampledSpectrum::Sample
                              ((DenselySampledSpectrum *)((long)auVar147 + 0x20),lambda);
          auVar367._0_8_ = SVar382.values.values._8_8_;
          auVar367._8_56_ = auVar312;
          local_7c8._8_8_ = uVar253;
          local_7c8._0_8_ = SVar382.values.values._0_8_;
          local_758 = auVar367._0_16_;
          auVar255 = (undefined1  [56])0x0;
          _local_768 = ZEXT416(*(uint *)((long)local_748 + 0x70));
          SVar382 = DenselySampledSpectrum::Sample
                              ((DenselySampledSpectrum *)((long)local_748 + 0x48),lambda);
          auVar347._0_8_ = SVar382.values.values._8_8_;
          auVar347._8_56_ = auVar312;
          auVar346._0_8_ = SVar382.values.values._0_8_;
          auVar346._8_56_ = auVar255;
          auVar172 = vunpcklpd_avx(local_7c8,local_758);
          local_378._0_4_ = (float)local_828._0_4_ * auVar172._0_4_;
          local_378._4_4_ = (float)local_828._0_4_ * auVar172._4_4_;
          fStack_370 = (float)local_828._0_4_ * auVar172._8_4_;
          fStack_36c = (float)local_828._0_4_ * auVar172._12_4_;
          auVar172 = vmovlhps_avx(auVar346._0_16_,auVar347._0_16_);
          local_288 = (float)local_768._0_4_ * auVar172._0_4_;
          fStack_284 = (float)local_768._0_4_ * auVar172._4_4_;
          fStack_280 = (float)local_768._0_4_ * auVar172._8_4_;
          fStack_27c = (float)local_768._0_4_ * auVar172._12_4_;
          local_2e8._0_4_ = local_288 + (float)local_378._0_4_;
          local_2e8._4_4_ = fStack_284 + (float)local_378._4_4_;
          local_2e8._8_4_ = fStack_280 + fStack_370;
          local_2e8._12_4_ = fStack_27c + fStack_36c;
          auVar367 = ZEXT1664(local_2e8);
          fVar192 = *(float *)((long)local_748 + 0x10);
          fVar368 = *(float *)((long)local_748 + 0x1c) - fVar192;
          uVar253 = vcmpss_avx512f(ZEXT416((uint)fVar192),
                                   ZEXT416((uint)*(float *)((long)local_748 + 0x1c)),1);
          bVar15 = (bool)((byte)uVar253 & 1);
          auVar174._8_8_ = 0;
          auVar174._0_8_ = *(ulong *)((long)local_748 + 8);
          auVar276._8_8_ = 0;
          auVar276._0_8_ = *(ulong *)((long)local_748 + 0x14);
          auVar172 = vsubps_avx(auVar276,auVar174);
          auVar360._4_4_ = local_6d8._4_4_;
          auVar360._0_4_ = local_6d8._0_4_;
          auVar360._8_8_ = 0;
          auVar169 = vsubps_avx(auVar360,auVar174);
          uVar141 = vcmpps_avx512vl(auVar174,auVar276,1);
          auVar166 = vdivps_avx512vl(auVar169,auVar172);
          bVar163 = (bool)((byte)uVar141 & 1);
          auVar173._0_4_ = (float)((uint)bVar163 * auVar166._0_4_ | (uint)!bVar163 * auVar169._0_4_)
          ;
          bVar163 = (bool)((byte)(uVar141 >> 1) & 1);
          auVar173._4_4_ = (uint)bVar163 * auVar166._4_4_ | (uint)!bVar163 * auVar169._4_4_;
          bVar163 = (bool)((byte)(uVar141 >> 2) & 1);
          auVar173._8_4_ = (uint)bVar163 * auVar166._8_4_ | (uint)!bVar163 * auVar169._8_4_;
          bVar163 = (bool)((byte)(uVar141 >> 3) & 1);
          auVar173._12_4_ = (uint)bVar163 * auVar166._12_4_ | (uint)!bVar163 * auVar169._12_4_;
          in_ZmmResult._0_16_ = auVar173;
          auVar169 = vmovshdup_avx(auVar173);
          auVar170._4_4_ = auStack_6d0._8_4_;
          auVar170._0_4_ = auStack_6d0._4_4_;
          auVar170._8_8_ = 0;
          auVar172 = vdivps_avx(auVar170,auVar172);
          local_6dc = (float)auStack_6d0._12_4_ / fVar368;
          uVar253 = vmovlps_avx(auVar172);
          local_7d0 = (float)uVar253;
          fStack_7cc = (float)SUB84(uVar253,4);
          uVar311 = _local_7d0;
          auVar346 = ZEXT464((uint)local_808._32_4_);
          local_7d0 = (float)uVar253;
          fStack_7cc = SUB84(uVar253,4);
          fVar251 = (float)local_808._32_4_ * local_7d0 + auVar173._0_4_;
          fVar252 = (float)local_808._32_4_ * fStack_7cc + auVar169._0_4_;
          fVar192 = (float)((uint)bVar15 * (int)(((float)auStack_6d0._0_4_ - fVar192) / fVar368) +
                           (uint)!bVar15 * (int)((float)auStack_6d0._0_4_ - fVar192)) +
                    (float)local_808._32_4_ * local_6dc;
          piVar3 = (int *)((long)local_748 + 0x118);
          piVar2 = (int *)((long)local_748 + 0x11c);
          piVar146 = (int *)((long)local_748 + 0x120);
          lVar151 = 0;
          _local_7d0 = uVar311;
          do {
            iVar139 = (int)lVar151;
            fVar368 = fVar251;
            if ((iVar139 != 0) && (fVar368 = fVar252, iVar139 != 1)) {
              fVar368 = fVar192;
            }
            piVar154 = piVar3;
            if ((iVar139 != 0) && (piVar154 = piVar2, iVar139 != 1)) {
              piVar154 = piVar146;
            }
            piVar156 = piVar3;
            if ((iVar139 != 0) && (piVar156 = piVar2, iVar139 != 1)) {
              piVar156 = piVar146;
            }
            auVar353._0_4_ = (float)(*piVar156 + -1);
            auVar353._4_12_ = in_ZMM8._4_12_;
            auVar172 = vminss_avx(auVar353,ZEXT416((uint)(fVar368 * (float)*piVar154)));
            uVar253 = vcmpss_avx512f(ZEXT416((uint)(fVar368 * (float)*piVar154)),ZEXT816(0) << 0x40,
                                     1);
            auVar357._16_48_ = in_ZmmResult._16_48_;
            auVar357._0_16_ = auVar172;
            fVar368 = (float)((uint)!(bool)((byte)uVar253 & 1) * auVar172._0_4_);
            in_ZmmResult._4_60_ = auVar357._4_60_;
            in_ZmmResult._0_4_ = fVar368;
            iVar152 = (int)fVar368;
            *(int *)(local_728 + lVar151 * 4) = iVar152;
            pfVar153 = &local_7d0;
            if ((iVar139 != 0) && (pfVar153 = &fStack_7cc, iVar139 != 1)) {
              pfVar153 = &local_6dc;
            }
            if ((*pfVar153 == 0.0) && (!NAN(*pfVar153))) {
              pfVar153 = &local_7d0;
              if ((iVar139 != 0) && (pfVar153 = &fStack_7cc, iVar139 != 1)) {
                pfVar153 = &local_6dc;
              }
              *pfVar153 = 0.0;
            }
            pfVar153 = &local_7d0;
            if ((iVar139 != 0) && (pfVar153 = &fStack_7cc, iVar139 != 1)) {
              pfVar153 = &local_6dc;
            }
            if (0.0 <= *pfVar153) {
              piVar154 = piVar3;
              if ((iVar139 != 0) && (piVar154 = piVar2, iVar139 != 1)) {
                piVar154 = piVar146;
              }
              fVar368 = fVar251;
              if ((iVar139 != 0) && (fVar368 = fVar252, iVar139 != 1)) {
                fVar368 = fVar192;
              }
              pfVar153 = &local_7d0;
              if ((iVar139 != 0) && (pfVar153 = &fStack_7cc, iVar139 != 1)) {
                pfVar153 = &local_6dc;
              }
              *(float *)(local_368 + lVar151 * 4) =
                   (float)local_808._32_4_ +
                   ((float)(iVar152 + 1) / (float)*piVar154 - fVar368) / *pfVar153;
              pfVar153 = &local_7d0;
              if ((iVar139 != 0) && (pfVar153 = &fStack_7cc, iVar139 != 1)) {
                pfVar153 = &local_6dc;
              }
              piVar154 = piVar3;
              if ((iVar139 != 0) && (piVar154 = piVar2, iVar139 != 1)) {
                piVar154 = piVar146;
              }
              *(float *)((long)&local_1c0.bxdf.
                                super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
                                .bits + lVar151 * 4) = 1.0 / ((float)*piVar154 * *pfVar153);
              *(undefined4 *)((long)&local_588 + lVar151 * 4) = 1;
              piVar154 = piVar3;
              if ((iVar139 != 0) && (piVar154 = piVar2, iVar139 != 1)) {
                piVar154 = piVar146;
              }
              iVar139 = *piVar154;
            }
            else {
              piVar154 = piVar3;
              if ((iVar139 != 0) && (piVar154 = piVar2, iVar139 != 1)) {
                piVar154 = piVar146;
              }
              fVar368 = fVar251;
              if ((iVar139 != 0) && (fVar368 = fVar252, iVar139 != 1)) {
                fVar368 = fVar192;
              }
              pfVar153 = &local_7d0;
              if ((iVar139 != 0) && (pfVar153 = &fStack_7cc, iVar139 != 1)) {
                pfVar153 = &local_6dc;
              }
              *(float *)(local_368 + lVar151 * 4) =
                   (float)local_808._32_4_ +
                   ((float)iVar152 / (float)*piVar154 - fVar368) / *pfVar153;
              pfVar153 = &local_7d0;
              if ((iVar139 != 0) && (pfVar153 = &fStack_7cc, iVar139 != 1)) {
                pfVar153 = &local_6dc;
              }
              piVar154 = piVar3;
              if ((iVar139 != 0) && (piVar154 = piVar2, iVar139 != 1)) {
                piVar154 = piVar146;
              }
              *(float *)((long)&local_1c0.bxdf.
                                super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
                                .bits + lVar151 * 4) = -1.0 / ((float)*piVar154 * *pfVar153);
              *(undefined4 *)((long)&local_588 + lVar151 * 4) = 0xffffffff;
              iVar139 = -1;
            }
            *(int *)(local_318 + lVar151 * 4) = iVar139;
            lVar151 = lVar151 + 1;
          } while (lVar151 != 3);
          local_298 = (ulong)local_748 | 0x4000000000000;
          local_5c0 = (long)local_748 + 0x74U | 0x1000000000000;
          fStack_820 = 1.0;
          local_828 = (undefined1  [8])0x3f8000003f800000;
          fStack_81c = 1.0;
          auVar357 = ZEXT464((uint)local_558._0_4_);
          auVar347 = ZEXT464((uint)local_778);
          TVar148.bits = (uintptr_t)local_748;
          do {
            auVar169 = auVar346._0_16_;
            lVar151 = (long)*(int *)(&DAT_0287a500 +
                                    (ulong)((uint)((float)local_368._4_4_ < fStack_360) |
                                           (uint)((float)local_368._0_4_ < (float)local_368._4_4_) *
                                           4 + (uint)((float)local_368._0_4_ < fStack_360) * 2) * 4)
            ;
            uVar194 = *(undefined4 *)
                       (*(long *)(TVar148.bits + 0x100) +
                       (((long)(int)local_728._8_4_ * (long)*(int *)(TVar148.bits + 0x11c) +
                        (long)(int)local_728._4_4_) * (long)*(int *)(TVar148.bits + 0x118) +
                       (long)(int)local_728._0_4_) * 4);
            auVar84._4_4_ = uVar194;
            auVar84._0_4_ = uVar194;
            auVar84._8_4_ = uVar194;
            auVar84._12_4_ = uVar194;
            auVar166 = vmulps_avx512vl(auVar367._0_16_,auVar84);
            auVar172 = vminss_avx(ZEXT416(*(uint *)(local_368 + lVar151 * 4)),auVar347._0_16_);
            if ((auVar166._0_4_ != 0.0) || (NAN(auVar166._0_4_))) {
              local_758._0_4_ = auVar172._0_4_;
              local_808._32_4_ = auVar346._0_4_;
              auVar93._8_4_ = 0x80000000;
              auVar93._0_8_ = 0x8000000080000000;
              auVar93._12_4_ = 0x80000000;
              in_ZmmResult._0_16_ = vxorps_avx512vl(auVar166,auVar93);
              local_7c8 = auVar166;
              _local_768 = in_ZmmResult._0_16_;
              local_3a0 = lVar151;
              do {
                fVar192 = logf(1.0 - auVar357._0_4_);
                uVar253 = local_278._0_8_;
                fVar192 = (float)local_808._32_4_ - fVar192 / (float)local_7c8._0_4_;
                local_278._0_8_ = local_278._0_8_ * 0x5851f42d4c957f2d + local_278._8_8_;
                uVar157 = SUB84(uVar253,4) >> 0xd ^ (uint)((ulong)uVar253 >> 0x1b);
                bVar143 = SUB81(uVar253,7) >> 3;
                auVar172 = vcvtusi2ss_avx512f(in_XMM14,uVar157 >> bVar143 |
                                                       uVar157 << 0x20 - bVar143);
                auVar172 = vminss_avx(ZEXT416((uint)(auVar172._0_4_ * 2.3283064e-10)),
                                      ZEXT416(0x3f7fffff));
                auVar357 = ZEXT1664(auVar172);
                if ((float)local_758._0_4_ <= fVar192) {
                  fVar192 = (float)local_758._0_4_ - (float)local_808._32_4_;
                  auVar213._0_4_ = fVar192 * (float)local_768._0_4_;
                  auVar213._4_4_ = fVar192 * (float)local_768._4_4_;
                  auVar213._8_4_ = fVar192 * fStack_760;
                  auVar213._12_4_ = fVar192 * fStack_75c;
                  auVar101._8_4_ = 0x3fb8aa3b;
                  auVar101._0_8_ = 0x3fb8aa3b3fb8aa3b;
                  auVar101._12_4_ = 0x3fb8aa3b;
                  auVar169 = vmulps_avx512vl(auVar213,auVar101);
                  auVar172 = vroundps_avx(auVar169,9);
                  auVar169 = vsubps_avx(auVar169,auVar172);
                  auVar281._0_4_ = (int)auVar172._0_4_;
                  auVar281._4_4_ = (int)auVar172._4_4_;
                  auVar281._8_4_ = (int)auVar172._8_4_;
                  auVar281._12_4_ = (int)auVar172._12_4_;
                  auVar323._8_4_ = 0x3da00ac9;
                  auVar323._0_8_ = 0x3da00ac93da00ac9;
                  auVar323._12_4_ = 0x3da00ac9;
                  auVar102._8_4_ = 0x3e679a0b;
                  auVar102._0_8_ = 0x3e679a0b3e679a0b;
                  auVar102._12_4_ = 0x3e679a0b;
                  auVar172 = vfmadd213ps_avx512vl(auVar323,auVar169,auVar102);
                  auVar103._8_4_ = 0x3f321004;
                  auVar103._0_8_ = 0x3f3210043f321004;
                  auVar103._12_4_ = 0x3f321004;
                  auVar172 = vfmadd213ps_avx512vl(auVar172,auVar169,auVar103);
                  auVar104._8_4_ = 0x3f800000;
                  auVar104._0_8_ = 0x3f8000003f800000;
                  auVar104._12_4_ = 0x3f800000;
                  auVar169 = vfmadd213ps_avx512vl(auVar172,auVar169,auVar104);
                  auVar166 = vpsrld_avx(auVar169,0x17);
                  auVar340._8_4_ = 0xffffff81;
                  auVar340._0_8_ = 0xffffff81ffffff81;
                  auVar340._12_4_ = 0xffffff81;
                  auVar172 = vpaddd_avx(auVar281,auVar340);
                  auVar172 = vpaddd_avx(auVar172,auVar166);
                  uVar141 = vpcmpgtd_avx512vl(auVar172,auVar340);
                  uVar141 = uVar141 & 0xf;
                  auVar105._8_4_ = 0x7f;
                  auVar105._0_8_ = 0x7f0000007f;
                  auVar105._12_4_ = 0x7f;
                  uVar144 = vpcmpgtd_avx512vl(auVar172,auVar105);
                  uVar144 = uVar144 & 0xf;
                  auVar106._8_4_ = 0x807fffff;
                  auVar106._0_8_ = 0x807fffff807fffff;
                  auVar106._12_4_ = 0x807fffff;
                  auVar169 = vpandd_avx512vl(auVar169,auVar106);
                  auVar172 = vpslld_avx(auVar172,0x17);
                  auVar107._8_4_ = 0x3f800000;
                  auVar107._0_8_ = 0x3f8000003f800000;
                  auVar107._12_4_ = 0x3f800000;
                  auVar172 = vpaddd_avx512vl(auVar172,auVar107);
                  auVar172 = vpord_avx512vl(auVar172,auVar169);
                  auVar169 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                  bVar163 = (bool)((byte)uVar144 & 1);
                  in_ZmmResult._0_4_ =
                       (float)((uint)bVar163 * auVar169._0_4_ |
                              (uint)!bVar163 * (uint)((byte)uVar141 & 1) * auVar172._0_4_);
                  bVar163 = (bool)((byte)(uVar144 >> 1) & 1);
                  in_ZmmResult._4_4_ =
                       (float)((uint)bVar163 * auVar169._4_4_ |
                              (uint)!bVar163 * (uint)((byte)(uVar141 >> 1) & 1) * auVar172._4_4_);
                  bVar163 = (bool)((byte)(uVar144 >> 2) & 1);
                  in_ZmmResult._8_4_ =
                       (float)((uint)bVar163 * auVar169._8_4_ |
                              (uint)!bVar163 * (uint)((byte)(uVar141 >> 2) & 1) * auVar172._8_4_);
                  bVar163 = SUB81(uVar144 >> 3,0);
                  in_ZmmResult._12_4_ =
                       (float)((uint)bVar163 * auVar169._12_4_ |
                              (uint)!bVar163 * (uint)(byte)(uVar141 >> 3) * auVar172._12_4_);
                  local_828._4_4_ = in_ZmmResult._4_4_ * (float)local_828._4_4_;
                  local_828._0_4_ = in_ZmmResult._0_4_ * (float)local_828._0_4_;
                  fStack_820 = in_ZmmResult._8_4_ * fStack_820;
                  fStack_81c = in_ZmmResult._12_4_ * fStack_81c;
                  cVar164 = '\n';
                }
                else {
                  cVar164 = '\0';
                  if (local_778 <= fVar192) {
                    local_808._32_4_ = fVar192;
                  }
                  else {
                    local_558._0_4_ = auVar172._0_4_;
                    fVar251 = fVar192 - (float)local_808._32_4_;
                    auVar212._0_4_ = fVar251 * (float)local_768._0_4_;
                    auVar212._4_4_ = fVar251 * (float)local_768._4_4_;
                    auVar212._8_4_ = fVar251 * fStack_760;
                    auVar212._12_4_ = fVar251 * fStack_75c;
                    auVar94._8_4_ = 0x3fb8aa3b;
                    auVar94._0_8_ = 0x3fb8aa3b3fb8aa3b;
                    auVar94._12_4_ = 0x3fb8aa3b;
                    auVar172 = vmulps_avx512vl(auVar212,auVar94);
                    _local_5d8 = vroundps_avx(auVar172,9);
                    auVar172 = vsubps_avx(auVar172,_local_5d8);
                    auVar278._8_4_ = 0x3da00ac9;
                    auVar278._0_8_ = 0x3da00ac93da00ac9;
                    auVar278._12_4_ = 0x3da00ac9;
                    auVar95._8_4_ = 0x3e679a0b;
                    auVar95._0_8_ = 0x3e679a0b3e679a0b;
                    auVar95._12_4_ = 0x3e679a0b;
                    auVar169 = vfmadd213ps_avx512vl(auVar278,auVar172,auVar95);
                    auVar96._8_4_ = 0x3f321004;
                    auVar96._0_8_ = 0x3f3210043f321004;
                    auVar96._12_4_ = 0x3f321004;
                    auVar169 = vfmadd213ps_avx512vl(auVar169,auVar172,auVar96);
                    auVar97._8_4_ = 0x3f800000;
                    auVar97._0_8_ = 0x3f8000003f800000;
                    auVar97._12_4_ = 0x3f800000;
                    local_708 = vfmadd213ps_avx512vl(auVar169,auVar172,auVar97);
                    local_428 = ZEXT416((uint)fVar192);
                    auVar279._0_4_ = fVar192 * (float)auStack_6d0._4_4_ + (float)local_6d8._0_4_;
                    auVar279._4_4_ = fVar192 * (float)auStack_6d0._8_4_ + (float)local_6d8._4_4_;
                    auVar279._8_4_ = fVar192 * 0.0 + 0.0;
                    auVar279._12_4_ = fVar192 * 0.0 + 0.0;
                    auVar255 = ZEXT856(auVar279._8_8_);
                    local_808._8_4_ = fVar192 * (float)auStack_6d0._12_4_ + (float)auStack_6d0._0_4_
                    ;
                    auVar312 = (undefined1  [56])0x0;
                    uVar253 = vmovlps_avx(auVar279);
                    local_808._0_4_ = (undefined4)uVar253;
                    local_808._4_4_ = (undefined4)((ulong)uVar253 >> 0x20);
                    SVar382 = NanoVDBMediumProvider::Density
                                        (*(NanoVDBMediumProvider **)TVar148.bits,
                                         (Point3f *)local_808,lambda);
                    auVar302._0_8_ = SVar382.values.values._8_8_;
                    auVar302._8_56_ = auVar255;
                    auVar239._0_8_ = SVar382.values.values._0_8_;
                    auVar239._8_56_ = auVar312;
                    _local_5e8 = auVar239._0_16_;
                    local_678 = auVar302._0_16_;
                    SVar382 = NanoVDBMediumProvider::Le
                                        (*(NanoVDBMediumProvider **)TVar148.bits,
                                         (Point3f *)local_808,lambda);
                    auVar303._0_8_ = SVar382.values.values._8_8_;
                    auVar303._8_56_ = auVar255;
                    auVar240._0_8_ = SVar382.values.values._0_8_;
                    auVar240._8_56_ = auVar312;
                    auVar172 = vfmadd231ss_fma(ZEXT416((uint)((float)local_808._4_4_ *
                                                             *(float *)(TVar148.bits + 0x7c))),
                                               ZEXT416((uint)local_808._0_4_),
                                               ZEXT416(*(uint *)(TVar148.bits + 0x78)));
                    auVar172 = vfmadd231ss_fma(auVar172,ZEXT416((uint)local_808._8_4_),
                                               ZEXT416(*(uint *)(TVar148.bits + 0x80)));
                    fVar192 = auVar172._0_4_ + *(float *)(TVar148.bits + 0x84);
                    auVar172 = vfmadd231ss_fma(ZEXT416((uint)((float)local_808._4_4_ *
                                                             *(float *)(TVar148.bits + 0x8c))),
                                               ZEXT416((uint)local_808._0_4_),
                                               ZEXT416(*(uint *)(TVar148.bits + 0x88)));
                    auVar172 = vfmadd231ss_fma(auVar172,ZEXT416((uint)local_808._8_4_),
                                               ZEXT416(*(uint *)(TVar148.bits + 0x90)));
                    fVar251 = auVar172._0_4_ + *(float *)(TVar148.bits + 0x94);
                    auVar172 = vfmadd231ss_fma(ZEXT416((uint)((float)local_808._4_4_ *
                                                             *(float *)(TVar148.bits + 0x9c))),
                                               ZEXT416((uint)local_808._0_4_),
                                               ZEXT416(*(uint *)(TVar148.bits + 0x98)));
                    auVar172 = vfmadd231ss_fma(auVar172,ZEXT416((uint)local_808._8_4_),
                                               ZEXT416(*(uint *)(TVar148.bits + 0xa0)));
                    auVar169 = vfmadd231ss_fma(ZEXT416((uint)((float)local_808._4_4_ *
                                                             *(float *)(TVar148.bits + 0xac))),
                                               ZEXT416((uint)local_808._0_4_),
                                               ZEXT416(*(uint *)(TVar148.bits + 0xa8)));
                    auVar169 = vfmadd231ss_fma(auVar169,ZEXT416((uint)local_808._8_4_),
                                               ZEXT416(*(uint *)(TVar148.bits + 0xb0)));
                    fVar252 = auVar169._0_4_ + *(float *)(TVar148.bits + 0xb4);
                    bVar163 = fVar252 == 1.0;
                    fVar368 = auVar172._0_4_ + *(float *)(TVar148.bits + 0xa4);
                    auVar280._0_4_ = local_418._16_4_ * local_418._16_4_;
                    auVar280._4_4_ = local_418._20_4_ * local_418._20_4_;
                    auVar280._8_8_ = 0;
                    auVar172 = vmovshdup_avx(auVar280);
                    fVar193 = (float)local_418._12_4_ * (float)local_418._12_4_ + auVar280._0_4_ +
                              auVar172._0_4_;
                    if (fVar193 < 0.0) {
                      local_2c8 = ZEXT416((uint)fVar192);
                      local_2d8 = ZEXT416((uint)fVar251);
                      local_388 = ZEXT416((uint)fVar368);
                      local_6e0 = fVar252;
                      local_2b8 = auVar303._0_16_;
                      local_2a8 = auVar240._0_16_;
                      fVar193 = sqrtf(fVar193);
                      fVar252 = local_6e0;
                      auVar172 = local_2a8;
                      auVar169 = local_2b8;
                      auVar166 = local_2c8;
                      auVar168 = local_388;
                      fVar251 = (float)local_2d8._0_4_;
                    }
                    else {
                      auVar172 = vsqrtss_avx(ZEXT416((uint)fVar193),ZEXT416((uint)fVar193));
                      fVar193 = auVar172._0_4_;
                      auVar172 = auVar240._0_16_;
                      auVar169 = auVar303._0_16_;
                      auVar166 = ZEXT416((uint)fVar192);
                      auVar168 = ZEXT416((uint)fVar368);
                    }
                    auVar282._0_4_ = (int)(float)local_5d8._0_4_;
                    auVar282._4_4_ = (int)(float)local_5d8._4_4_;
                    auVar282._8_4_ = (int)fStack_5d0;
                    auVar282._12_4_ = (int)fStack_5cc;
                    auVar173 = vpsrld_avx(local_708,0x17);
                    auVar341._8_4_ = 0xffffff81;
                    auVar341._0_8_ = 0xffffff81ffffff81;
                    auVar341._12_4_ = 0xffffff81;
                    auVar201 = vpaddd_avx(auVar282,auVar341);
                    auVar201 = vpaddd_avx(auVar201,auVar173);
                    uVar141 = vpcmpgtd_avx512vl(auVar201,auVar341);
                    uVar141 = uVar141 & 0xf;
                    auVar98._8_4_ = 0x7f;
                    auVar98._0_8_ = 0x7f0000007f;
                    auVar98._12_4_ = 0x7f;
                    uVar144 = vpcmpgtd_avx512vl(auVar201,auVar98);
                    uVar144 = uVar144 & 0xf;
                    auVar99._8_4_ = 0x807fffff;
                    auVar99._0_8_ = 0x807fffff807fffff;
                    auVar99._12_4_ = 0x807fffff;
                    auVar173 = vpandd_avx512vl(local_708,auVar99);
                    auVar201 = vpslld_avx(auVar201,0x17);
                    auVar100._8_4_ = 0x3f800000;
                    auVar100._0_8_ = 0x3f8000003f800000;
                    auVar100._12_4_ = 0x3f800000;
                    auVar201 = vpaddd_avx512vl(auVar201,auVar100);
                    auVar174 = vpord_avx512vl(auVar201,auVar173);
                    auVar170 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                    bVar15 = (bool)((byte)uVar144 & 1);
                    bVar12 = (bool)((byte)(uVar144 >> 1) & 1);
                    bVar13 = (bool)((byte)(uVar144 >> 2) & 1);
                    bVar14 = SUB81(uVar144 >> 3,0);
                    auVar201 = vmovlhps_avx(_local_5e8,local_678);
                    auVar342._0_4_ = auVar201._0_4_ * (float)local_378._0_4_;
                    auVar342._4_4_ = auVar201._4_4_ * (float)local_378._4_4_;
                    auVar342._8_4_ = auVar201._8_4_ * fStack_370;
                    auVar342._12_4_ = auVar201._12_4_ * fStack_36c;
                    auVar173 = vshufpd_avx(auVar342,auVar342,1);
                    auVar324._0_4_ = auVar201._0_4_ * local_288;
                    auVar324._4_4_ = auVar201._4_4_ * fStack_284;
                    auVar324._8_4_ = auVar201._8_4_ * fStack_280;
                    auVar324._12_4_ = auVar201._12_4_ * fStack_27c;
                    auVar201 = vshufpd_avx(auVar324,auVar324,1);
                    auStack_4a0[0]._0_4_ =
                         (float)local_828._0_4_ *
                         (float)((uint)bVar15 * auVar170._0_4_ |
                                (uint)!bVar15 * (uint)((byte)uVar141 & 1) * auVar174._0_4_);
                    auStack_4a0[0]._4_4_ =
                         (float)local_828._4_4_ *
                         (float)((uint)bVar12 * auVar170._4_4_ |
                                (uint)!bVar12 * (uint)((byte)(uVar141 >> 1) & 1) * auVar174._4_4_);
                    auStack_4a0[1]._0_4_ =
                         fStack_820 *
                         (float)((uint)bVar13 * auVar170._8_4_ |
                                (uint)!bVar13 * (uint)((byte)(uVar141 >> 2) & 1) * auVar174._8_4_);
                    auStack_4a0[1]._4_4_ =
                         fStack_81c *
                         (float)((uint)bVar14 * auVar170._12_4_ |
                                (uint)!bVar14 * (uint)(byte)(uVar141 >> 3) * auVar174._12_4_);
                    fVar192 = auVar166._0_4_ / fVar252;
                    auVar184._4_12_ = auVar166._4_12_;
                    auVar184._0_4_ = fVar192;
                    fVar368 = auVar168._0_4_ / fVar252;
                    auVar185._4_12_ = auVar168._4_12_;
                    auVar185._0_4_ = fVar368;
                    auVar184._16_48_ = in_ZmmResult._16_48_;
                    auVar183._4_60_ = auVar184._4_60_;
                    auVar183._0_4_ =
                         (uint)bVar163 * (int)auVar166._0_4_ + (uint)!bVar163 * (int)fVar192;
                    iVar139 = (uint)bVar163 * (int)fVar251 +
                              (uint)!bVar163 * (int)(fVar251 / fVar252);
                    auVar185._16_48_ = in_ZmmResult._16_48_;
                    in_ZmmResult._4_60_ = auVar185._4_60_;
                    in_ZmmResult._0_4_ =
                         (float)((uint)bVar163 * (int)auVar168._0_4_ + (uint)!bVar163 * (int)fVar368
                                );
                    auVar375._0_8_ = local_418._12_8_ ^ 0x8000000080000000;
                    auVar375._8_4_ = 0x80000000;
                    auVar375._12_4_ = 0x80000000;
                    auVar380._4_4_ = fVar193;
                    auVar380._0_4_ = fVar193;
                    auVar380._8_4_ = fVar193;
                    auVar380._12_4_ = fVar193;
                    auVar166 = vdivps_avx(auVar375,auVar380);
                    auVar381._0_4_ = -(float)local_418._20_4_;
                    auVar381._4_4_ = 0x80000000;
                    auVar381._8_4_ = 0x80000000;
                    auVar381._12_4_ = 0x80000000;
                    auVar214._0_4_ = auVar381._0_4_ / fVar193;
                    auVar214._4_12_ = auVar381._4_12_;
                    local_538._120_8_ = local_7c8._0_8_;
                    local_4b8.bits._0_4_ = local_7c8._8_4_;
                    local_4b8.bits._4_4_ = local_7c8._12_4_;
                    auVar364._4_4_ = iVar139;
                    auVar364._0_4_ = iVar139;
                    auVar364._8_4_ = iVar139;
                    auVar364._12_4_ = iVar139;
                    auVar371._4_4_ = in_ZmmResult._0_4_;
                    auVar371._0_4_ = in_ZmmResult._0_4_;
                    auVar371._8_4_ = in_ZmmResult._0_4_;
                    auVar371._12_4_ = in_ZmmResult._0_4_;
                    local_538._40_4_ = 0.0;
                    local_538._44_4_ = 0.0;
                    local_538._48_4_ = 0.0;
                    local_538._52_4_ = 0.0;
                    local_538._56_4_ = 0.0;
                    auVar168 = vshufps_avx(auVar183._0_16_,auVar364,0x40);
                    local_538._0_4_ = auVar168._0_4_;
                    local_538._4_4_ = auVar168._4_4_;
                    local_538._8_4_ = auVar168._8_4_;
                    local_538._12_4_ = auVar168._12_4_;
                    uVar253 = vmovlps_avx(auVar371);
                    local_538._16_4_ = (undefined4)uVar253;
                    local_538._20_4_ = (undefined4)((ulong)uVar253 >> 0x20);
                    local_538._24_4_ = afStack_400[0];
                    uVar253 = vmovlps_avx(auVar166);
                    local_538._28_4_ = (undefined4)uVar253;
                    local_538._32_4_ = (undefined4)((ulong)uVar253 >> 0x20);
                    local_538._64_4_ = (anon_struct_4_0_00000001_for___align)0x0;
                    local_538._68_4_ = 0.0;
                    local_538._72_4_ = (undefined4)local_298;
                    local_538._76_4_ = (undefined4)(local_298 >> 0x20);
                    local_538._80_4_ = (undefined4)local_5c0;
                    local_538._84_4_ = (undefined4)(local_5c0 >> 0x20);
                    auVar232._16_16_ = auVar201;
                    auVar232._0_16_ = auVar214;
                    auVar356._16_16_ = auVar173;
                    auVar356._0_16_ = auVar214;
                    auVar232 = vperm2f128_avx(auVar356,auVar232,0x31);
                    auVar329._16_16_ = auVar324;
                    auVar329._0_16_ = auVar342;
                    auVar232 = vunpcklpd_avx(auVar329,auVar232);
                    local_538._88_4_ = auVar232._0_4_;
                    local_538._92_8_ = auVar232._4_8_;
                    local_538._100_4_ = auVar232._12_4_;
                    local_538._104_16_ = auVar232._16_16_;
                    auVar168 = vmovlhps_avx(auVar172,auVar169);
                    uStack_4b0 = auVar168._0_4_;
                    uStack_4ac._0_4_ = auVar168._4_4_;
                    stack0xfffffffffffffb58 = auVar168._8_8_;
                    in_ZMM8 = ZEXT1664(auVar371);
                    in_ZMM9 = ZEXT1664(auVar166);
                    in_ZMM10 = ZEXT464((uint)afStack_400[0]);
                    in_ZMM12 = ZEXT1664(auVar172);
                    in_ZMM13 = ZEXT1664(auVar169);
                    local_538._36_4_ = auVar214._0_4_;
                    bVar163 = Li::anon_class_120_15_cd2b6fed::operator()
                                        (&local_668,(MediumSample *)local_538);
                    cVar164 = !bVar163;
                    if ((bool)cVar164) {
                      local_158._8_4_ = 0x3f800000;
                      local_158._0_8_ = 0x3f8000003f800000;
                      local_158._12_4_ = 0x3f800000;
                    }
                    else {
                      local_808._32_4_ = local_428._0_4_;
                    }
                    fStack_820 = 1.0;
                    local_828 = (undefined1  [8])0x3f8000003f800000;
                    fStack_81c = 1.0;
                    auVar357 = ZEXT464((uint)local_558._0_4_);
                    TVar148.bits = (uintptr_t)local_748;
                    lambda = local_790;
                  }
                }
              } while (cVar164 == '\0');
              if (cVar164 == '\n') {
                auVar169 = ZEXT416((uint)local_808._32_4_);
                auVar367 = ZEXT1664(local_2e8);
                auVar172 = ZEXT416((uint)local_758._0_4_);
                lVar151 = local_3a0;
                goto LAB_003d6976;
              }
              auVar169 = ZEXT416((uint)local_808._32_4_);
              auVar347 = ZEXT464((uint)local_778);
              auVar367 = ZEXT1664(local_2e8);
            }
            else {
              auVar85._8_4_ = 0x80000000;
              auVar85._0_8_ = 0x8000000080000000;
              auVar85._12_4_ = 0x80000000;
              auVar166 = vxorps_avx512vl(auVar166,auVar85);
              fVar192 = auVar172._0_4_ - auVar346._0_4_;
              auVar211._0_4_ = fVar192 * auVar166._0_4_;
              auVar211._4_4_ = fVar192 * auVar166._4_4_;
              auVar211._8_4_ = fVar192 * auVar166._8_4_;
              auVar211._12_4_ = fVar192 * auVar166._12_4_;
              auVar86._8_4_ = 0x3fb8aa3b;
              auVar86._0_8_ = 0x3fb8aa3b3fb8aa3b;
              auVar86._12_4_ = 0x3fb8aa3b;
              auVar168 = vmulps_avx512vl(auVar211,auVar86);
              auVar166 = vroundps_avx(auVar168,9);
              auVar168 = vsubps_avx(auVar168,auVar166);
              auVar277._0_4_ = (int)auVar166._0_4_;
              auVar277._4_4_ = (int)auVar166._4_4_;
              auVar277._8_4_ = (int)auVar166._8_4_;
              auVar277._12_4_ = (int)auVar166._12_4_;
              auVar322._8_4_ = 0x3da00ac9;
              auVar322._0_8_ = 0x3da00ac93da00ac9;
              auVar322._12_4_ = 0x3da00ac9;
              auVar87._8_4_ = 0x3e679a0b;
              auVar87._0_8_ = 0x3e679a0b3e679a0b;
              auVar87._12_4_ = 0x3e679a0b;
              auVar166 = vfmadd213ps_avx512vl(auVar322,auVar168,auVar87);
              auVar88._8_4_ = 0x3f321004;
              auVar88._0_8_ = 0x3f3210043f321004;
              auVar88._12_4_ = 0x3f321004;
              auVar166 = vfmadd213ps_avx512vl(auVar166,auVar168,auVar88);
              auVar89._8_4_ = 0x3f800000;
              auVar89._0_8_ = 0x3f8000003f800000;
              auVar89._12_4_ = 0x3f800000;
              auVar168 = vfmadd213ps_avx512vl(auVar166,auVar168,auVar89);
              auVar201 = vpsrld_avx(auVar168,0x17);
              auVar339._8_4_ = 0xffffff81;
              auVar339._0_8_ = 0xffffff81ffffff81;
              auVar339._12_4_ = 0xffffff81;
              auVar166 = vpaddd_avx(auVar277,auVar339);
              auVar166 = vpaddd_avx(auVar166,auVar201);
              uVar141 = vpcmpgtd_avx512vl(auVar166,auVar339);
              uVar141 = uVar141 & 0xf;
              auVar90._8_4_ = 0x7f;
              auVar90._0_8_ = 0x7f0000007f;
              auVar90._12_4_ = 0x7f;
              uVar144 = vpcmpgtd_avx512vl(auVar166,auVar90);
              uVar144 = uVar144 & 0xf;
              auVar91._8_4_ = 0x807fffff;
              auVar91._0_8_ = 0x807fffff807fffff;
              auVar91._12_4_ = 0x807fffff;
              auVar168 = vpandd_avx512vl(auVar168,auVar91);
              auVar166 = vpslld_avx(auVar166,0x17);
              auVar92._8_4_ = 0x3f800000;
              auVar92._0_8_ = 0x3f8000003f800000;
              auVar92._12_4_ = 0x3f800000;
              auVar166 = vpaddd_avx512vl(auVar166,auVar92);
              auVar166 = vpord_avx512vl(auVar166,auVar168);
              auVar168 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              bVar163 = (bool)((byte)uVar144 & 1);
              in_ZmmResult._0_4_ =
                   (float)((uint)bVar163 * auVar168._0_4_ |
                          (uint)!bVar163 * (uint)((byte)uVar141 & 1) * auVar166._0_4_);
              bVar163 = (bool)((byte)(uVar144 >> 1) & 1);
              in_ZmmResult._4_4_ =
                   (float)((uint)bVar163 * auVar168._4_4_ |
                          (uint)!bVar163 * (uint)((byte)(uVar141 >> 1) & 1) * auVar166._4_4_);
              bVar163 = (bool)((byte)(uVar144 >> 2) & 1);
              in_ZmmResult._8_4_ =
                   (float)((uint)bVar163 * auVar168._8_4_ |
                          (uint)!bVar163 * (uint)((byte)(uVar141 >> 2) & 1) * auVar166._8_4_);
              bVar163 = SUB81(uVar144 >> 3,0);
              in_ZmmResult._12_4_ =
                   (float)((uint)bVar163 * auVar168._12_4_ |
                          (uint)!bVar163 * (uint)(byte)(uVar141 >> 3) * auVar166._12_4_);
              local_828._4_4_ = in_ZmmResult._4_4_ * (float)local_828._4_4_;
              local_828._0_4_ = in_ZmmResult._0_4_ * (float)local_828._0_4_;
              fStack_820 = in_ZmmResult._8_4_ * fStack_820;
              fStack_81c = in_ZmmResult._12_4_ * fStack_81c;
LAB_003d6976:
              auVar347 = ZEXT464((uint)local_778);
              cVar164 = '\b';
              if ((*(float *)(local_368 + lVar151 * 4) <= local_778) &&
                 (iVar139 = *(int *)(local_728 + lVar151 * 4) +
                            *(int *)((long)&local_588 + lVar151 * 4),
                 *(int *)(local_728 + lVar151 * 4) = iVar139,
                 iVar139 != *(int *)(local_318 + lVar151 * 4))) {
                *(float *)(local_368 + lVar151 * 4) =
                     *(float *)(local_368 + lVar151 * 4) +
                     *(float *)((long)&local_1c0.bxdf.
                                       super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
                                       .bits + lVar151 * 4);
                cVar164 = '\0';
                auVar169 = auVar172;
              }
            }
            auVar346 = ZEXT1664(auVar169);
          } while (cVar164 == '\0');
          auVar201 = local_158;
          if (cVar164 == '\b') {
            auVar201 = _local_828;
          }
        }
        auVar172 = vshufpd_avx(auVar201,auVar201,1);
        local_158 = auVar201;
      }
      if (local_82a == false) {
        uVar157 = 0;
        if (local_829 != false) {
          uVar157 = 0;
          goto LAB_003d6dcd;
        }
        auVar172 = vunpcklpd_avx(auVar201,auVar172);
        fVar192 = auVar172._0_4_;
        fVar251 = auVar172._4_4_;
        fVar252 = auVar172._8_4_;
        fVar368 = auVar172._12_4_;
        local_788.values.values[0] = fVar192 * local_788.values.values[0];
        local_788.values.values[1] = fVar251 * local_788.values.values[1];
        local_788.values.values[2] = fVar252 * local_788.values.values[2];
        local_788.values.values[3] = fVar368 * local_788.values.values[3];
        local_7a8.values.values[0] = fVar192 * local_7a8.values.values[0];
        local_7a8.values.values[1] = fVar251 * local_7a8.values.values[1];
        local_7a8.values.values[2] = fVar252 * local_7a8.values.values[2];
        local_7a8.values.values[3] = fVar368 * local_7a8.values.values[3];
        local_6f8.values.values[1] = fVar251 * local_6f8.values.values[1];
        local_6f8.values.values[0] = fVar192 * local_6f8.values.values[0];
        local_6f8.values.values[2] = fVar252 * local_6f8.values.values[2];
        local_6f8.values.values[3] = fVar368 * local_6f8.values.values[3];
        bVar163 = true;
      }
      else {
        uVar157 = 1;
LAB_003d6dcd:
        bVar163 = false;
      }
      sampler = local_7d8;
      if (bVar163) goto LAB_003d6e15;
    }
    if ((byte)local_38 == '\x01') {
      local_38 = local_38 & 0xffffffffffffff00;
    }
    if ((uVar157 & 1) != 0) {
      return (array<float,_4>)(array<float,_4>)local_738;
    }
  } while( true );
}

Assistant:

SampledSpectrum VolPathIntegrator::Li(RayDifferential ray, SampledWavelengths &lambda,
                                      SamplerHandle sampler, ScratchBuffer &scratchBuffer,
                                      VisibleSurface *visibleSurf) const {
    // Declare state variables for volumetric path
    SampledSpectrum L(0.f), T_hat(1.f), uniPathPDF(1.f), lightPathPDF(1.f);
    bool specularBounce = false, anyNonSpecularBounces = false;
    int depth = 0;

    LightSampleContext prevIntrContext;

    Float etaScale = 1;

    while (true) {
        // Sample segment of volumetric scattering path
        PBRT_DBG("%s\n",
                 StringPrintf("Path tracer depth %d, current L = %s, T_hat = %s\n", depth,
                              L, T_hat)
                     .c_str());
        pstd::optional<ShapeIntersection> si = Intersect(ray);
        if (ray.medium) {
            // Sample the participating medium
            bool scattered = false, terminated = false;
            Float tMax = si ? si->tHit : Infinity;
            uint64_t hash0 = Hash(sampler.Get1D());
            uint64_t hash1 = Hash(sampler.Get1D());
            RNG rng(hash0, hash1);
            SampledSpectrum Tmaj = ray.medium.SampleTmaj(
                ray, tMax, sampler.Get1D(), rng, lambda,
                [&](const MediumSample &mediumSample) {
                    // Handle medium scattering event for ray
                    if (!T_hat) {
                        terminated = true;
                        return false;
                    }
                    ++volumeInteractions;
                    const MediumInteraction &intr = mediumSample.intr;
                    const SampledSpectrum &sigma_a = intr.sigma_a,
                                          &sigma_s = intr.sigma_s;
                    const SampledSpectrum &Tmaj = mediumSample.Tmaj;
                    // Rescale path throughput and PDFs if necessary
                    Rescale(T_hat, uniPathPDF, lightPathPDF);

                    // Add emission from medium scattering event
                    if (depth < maxDepth && intr.Le) {
                        // Compute $\hat{P}$ at new path vertex
                        SampledSpectrum P_hat = T_hat * Tmaj * sigma_a * intr.Le;

                        // Compute PDF for absorption event at path vertex
                        SampledSpectrum emitPDF = uniPathPDF * intr.sigma_maj * Tmaj;

                        // Update _L_ for medium emission
                        L += SafeDiv(P_hat, emitPDF.Average() * lambda.PDF());
                    }

                    // Compute medium event probabilities for interaction
                    Float pAbsorb = intr.sigma_a[0] / intr.sigma_maj[0];
                    Float pScatter = intr.sigma_s[0] / intr.sigma_maj[0];
                    Float pNull = std::max<Float>(0, 1 - pAbsorb - pScatter);

                    CHECK_GE(1 - pAbsorb - pScatter, -1e-6);
                    // Sample medium scattering event type and update path
                    Float um = rng.Uniform<Float>();
                    int mode = SampleDiscrete({pAbsorb, pScatter, pNull}, um);
                    if (mode == 0) {
                        // Handle absorption along ray path
                        terminated = true;
                        return false;

                    } else if (mode == 1) {
                        // Handle scattering along ray path
                        if (depth++ >= maxDepth) {
                            terminated = true;
                            return false;
                        }
                        T_hat *= Tmaj * sigma_s;
                        uniPathPDF *= Tmaj * sigma_s;
                        // Sample direct lighting at volume scattering event
                        L += SafeDiv(
                            SampleLd(intr, nullptr, lambda, sampler, T_hat, uniPathPDF),
                            lambda.PDF());

                        // Sample new direction at real scattering event
                        Point2f u = sampler.Get2D();
                        pstd::optional<PhaseFunctionSample> ps =
                            intr.phase.Sample_p(-ray.d, u);
                        if (!ps || ps->pdf == 0) {
                            terminated = true;
                            return false;
                        }
                        // Update ray path state for indirect volume scattering
                        T_hat *= ps->p;
                        lightPathPDF = uniPathPDF;
                        uniPathPDF *= ps->pdf;
                        prevIntrContext = LightSampleContext(intr);
                        scattered = true;
                        ray = intr.SpawnRay(ps->wi);
                        specularBounce = false;
                        anyNonSpecularBounces = true;

                        return false;

                    } else {
                        // Handle null scattering along ray path
                        SampledSpectrum sigma_n = intr.sigma_n();
                        T_hat *= Tmaj * sigma_n;
                        uniPathPDF *= Tmaj * sigma_n;
                        lightPathPDF *= Tmaj * intr.sigma_maj;
                        Rescale(T_hat, uniPathPDF, lightPathPDF);
                        return true;
                    }
                });
            // Handle terminated, scattered, and unscattered rays after medium sampling
            if (terminated)
                return L;
            if (scattered)
                continue;
            T_hat *= Tmaj;
            uniPathPDF *= Tmaj;
            lightPathPDF *= Tmaj;
        }
        // Handle surviving unscattered rays
        // Add emitted light at volume path vertex or from the environment
        if (!si) {
            // Accumulate contributions from infinite light sources
            for (const auto &light : infiniteLights) {
                if (SampledSpectrum Le = light.Le(ray, lambda); Le) {
                    if (depth == 0 || specularBounce)
                        L += SafeDiv(T_hat * Le, uniPathPDF.Average() * lambda.PDF());
                    else {
                        // Add infinite light contribution using both PDFs with MIS
                        Float lightPDF = lightSampler.PDF(prevIntrContext, light) *
                                         light.PDF_Li(prevIntrContext, ray.d,
                                                      LightSamplingMode::WithMIS);
                        lightPathPDF *= lightPDF;
                        L += SafeDiv(T_hat * Le, (uniPathPDF + lightPathPDF).Average() *
                                                     lambda.PDF());
                    }
                }
            }

            break;
        }
        SurfaceInteraction &isect = si->intr;
        if (SampledSpectrum Le = isect.Le(-ray.d, lambda); Le) {
            // Add contribution of emission from intersected surface
            if (depth == 0 || specularBounce)
                L += SafeDiv(T_hat * Le, uniPathPDF.Average() * lambda.PDF());
            else {
                // Add surface light contribution using both PDFs with MIS
                LightHandle areaLight(isect.areaLight);
                Float lightPDF =
                    lightSampler.PDF(prevIntrContext, areaLight) *
                    areaLight.PDF_Li(prevIntrContext, ray.d, LightSamplingMode::WithMIS);
                lightPathPDF *= lightPDF;
                L += SafeDiv(T_hat * Le,
                             (uniPathPDF + lightPathPDF).Average() * lambda.PDF());
            }
        }

        // Get BSDF and skip over medium boundaries
        BSDF bsdf = isect.GetBSDF(ray, lambda, camera, scratchBuffer, sampler);
        if (!bsdf) {
            isect.SkipIntersection(&ray, si->tHit);
            continue;
        }

        // Initialize _visibleSurf_ at first intersection
        if (depth == 0 && visibleSurf != nullptr) {
            // Estimate BSDF's albedo
            constexpr int nRhoSamples = 16;
            SampledSpectrum rho(0.f);
            for (int i = 0; i < nRhoSamples; ++i) {
                // Generate sample for hemispherical-directional reflectance
                Float uc = RadicalInverse(0, i + 1);
                Point2f u(RadicalInverse(1, i + 1), RadicalInverse(2, i + 1));

                // Estimate one term of $\rho_\roman{hd}$
                pstd::optional<BSDFSample> bs = bsdf.Sample_f(si->intr.wo, uc, u);
                if (bs)
                    rho += bs->f * AbsDot(bs->wi, si->intr.shading.n) / bs->pdf;
            }
            SampledSpectrum albedo = rho / nRhoSamples;

            *visibleSurf =
                VisibleSurface(si->intr, camera.GetCameraTransform(), albedo, lambda);
        }

        // Terminate path if maximum depth reached
        if (depth++ >= maxDepth)
            return L;

        ++surfaceInteractions;
        // Possibly regularize the BSDF
        if (regularize && anyNonSpecularBounces) {
            ++regularizedBSDFs;
            bsdf.Regularize();
        }

        // Sample illumination from lights to find attenuated path contribution
        if (bsdf.IsNonSpecular()) {
            L += SafeDiv(SampleLd(isect, &bsdf, lambda, sampler, T_hat, uniPathPDF),
                         lambda.PDF());
            DCHECK(IsInf(L.y(lambda)) == false);
        }
        prevIntrContext = LightSampleContext(isect);

        // Sample BSDF to get new volumetric path direction
        Vector3f wo = -ray.d;
        Float u = sampler.Get1D();
        pstd::optional<BSDFSample> bs = bsdf.Sample_f(wo, u, sampler.Get2D());
        if (!bs)
            break;
        // Update _T_hat_ and PDFs for BSDF scattering
        T_hat *= bs->f * AbsDot(bs->wi, isect.shading.n);
        lightPathPDF = uniPathPDF;
        if (bs->pdfIsProportional) {
            Float pdf = bsdf.PDF(wo, bs->wi);
            T_hat *= pdf / bs->pdf;
            uniPathPDF *= pdf;
        } else
            uniPathPDF *= bs->pdf;
        Rescale(T_hat, uniPathPDF, lightPathPDF);

        PBRT_DBG("%s\n", StringPrintf("Sampled BSDF, f = %s, pdf = %f -> T_hat = %s",
                                      bs->f, bs->pdf, T_hat)
                             .c_str());
        DCHECK(IsInf(T_hat.y(lambda)) == false);
        specularBounce = bs->IsSpecular();
        anyNonSpecularBounces |= !bs->IsSpecular();
        if (bs->IsTransmission())
            etaScale *= Sqr(bs->eta);
        ray = isect.SpawnRay(ray, bsdf, bs->wi, bs->flags, bs->eta);

        // Account for attenuated subsurface scattering, if applicable
        BSSRDFHandle bssrdf = isect.GetBSSRDF(ray, lambda, camera, scratchBuffer);
        if (bssrdf && bs->IsTransmission()) {
            // Sample BSSRDF probe segment to find exit point
            Float uc = sampler.Get1D();
            Point2f up = sampler.Get2D();
            pstd::optional<BSSRDFProbeSegment> probeSeg = bssrdf.SampleSp(uc, up);
            if (!probeSeg)
                break;

            // Sample random intersection along BSSRDF probe segment
            uint64_t seed = MixBits(FloatToBits(sampler.Get1D()));
            WeightedReservoirSampler<SubsurfaceInteraction> interactionSampler(seed);
            // Intersect BSSRDF sampling ray against the scene geometry
            Interaction base(probeSeg->p0, ray.time, (MediumHandle) nullptr);
            while (true) {
                Ray r = base.SpawnRayTo(probeSeg->p1);
                if (r.d == Vector3f(0, 0, 0))
                    break;
                pstd::optional<ShapeIntersection> si = Intersect(r, 1);
                if (!si)
                    break;
                base = si->intr;
                if (si->intr.material == isect.material)
                    interactionSampler.Add(SubsurfaceInteraction(si->intr), 1.f);
            }

            if (!interactionSampler.HasSample())
                break;

            // Convert probe intersection to _BSSRDFSample_ and update _beta_
            SubsurfaceInteraction ssi = interactionSampler.GetSample();
            BSSRDFSample bssrdfSample =
                bssrdf.ProbeIntersectionToSample(ssi, scratchBuffer);
            if (!bssrdfSample.Sp || bssrdfSample.pdf == 0)
                break;
            T_hat *= bssrdfSample.Sp * interactionSampler.WeightSum() / bssrdfSample.pdf;
            SurfaceInteraction pi = ssi;
            BSDF &Sw = bssrdfSample.Sw;
            pi.wo = bssrdfSample.wo;

            // Possibly regularize subsurface BSDF and update _prevIntrContext_
            anyNonSpecularBounces = true;
            if (regularize) {
                ++regularizedBSDFs;
                Sw.Regularize();
            } else
                ++totalBSDFs;
            prevIntrContext = LightSampleContext(pi);

            // Account for attenuated direct subsurface scattering
            L += SafeDiv(SampleLd(pi, &Sw, lambda, sampler, T_hat, uniPathPDF),
                         lambda.PDF());

            // Sample ray for indirect subsurface scattering
            Float u = sampler.Get1D();
            pstd::optional<BSDFSample> bs = Sw.Sample_f(pi.wo, u, sampler.Get2D());
            if (!bs)
                break;
            T_hat *= bs->f * AbsDot(bs->wi, pi.shading.n);
            lightPathPDF = uniPathPDF;
            uniPathPDF *= bs->pdf;
            // Don't increment depth this time...
            DCHECK(!IsInf(T_hat.y(lambda)));
            specularBounce = bs->IsSpecular();
            ray = RayDifferential(pi.SpawnRay(bs->wi));
        }

        // Possibly terminate volumetric path with Russian roulette
        if (!T_hat)
            break;
        SampledSpectrum rrBeta = T_hat * etaScale / uniPathPDF.Average();
        PBRT_DBG("%s\n",
                 StringPrintf("etaScale %f -> rrBeta %s", etaScale, rrBeta).c_str());
        if (rrBeta.MaxComponentValue() < 1 && depth > 1) {
            Float q = std::max<Float>(0, 1 - rrBeta.MaxComponentValue());
            if (sampler.Get1D() < q)
                break;
            uniPathPDF *= 1 - q;
            lightPathPDF *= 1 - q;
        }
    }
    return L;
}